

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_tagliatelle_2021.h
# Opt level: O2

void __thiscall Tagliatelle<TTA>::PerformLabeling(Tagliatelle<TTA> *this)

{
  undefined8 uVar1;
  char cVar2;
  uint uVar3;
  Mat1b *pMVar4;
  Mat1i *pMVar5;
  uint uVar6;
  uint uVar7;
  undefined4 uVar8;
  char *pcVar9;
  uint *puVar10;
  long lVar11;
  long lVar12;
  uint *puVar13;
  char cVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  ulong uVar19;
  uint uVar20;
  char *pcVar21;
  long lVar22;
  int iVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  uint uVar29;
  long lVar30;
  long lVar31;
  undefined4 *puVar32;
  long lVar33;
  ulong uVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  int iVar39;
  long lVar40;
  int iVar41;
  ulong uVar42;
  long lVar43;
  long lVar44;
  long lVar45;
  long lVar46;
  long lVar47;
  long lVar48;
  uint *puVar49;
  long lVar50;
  long lVar51;
  long lVar52;
  uint *puVar53;
  ulong uVar54;
  bool bVar55;
  ulong local_138;
  int local_a8;
  Size local_98;
  Mat local_90 [96];
  
  pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  uVar20 = *(uint *)&pMVar4->field_0x8;
  uVar3 = *(uint *)&pMVar4->field_0xc;
  uVar42 = (ulong)(int)uVar3;
  local_98.height = (int)**(undefined8 **)&pMVar4->field_0x40;
  local_98.width = (int)((ulong)**(undefined8 **)&pMVar4->field_0x40 >> 0x20);
  cv::Mat_<int>::Mat_((Mat_<int> *)local_90,&local_98);
  cv::Mat::operator=(&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat,
                     local_90);
  cv::Mat::~Mat(local_90);
  uVar1 = *(undefined8 *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x8;
  TTA::Alloc((((int)((ulong)uVar1 >> 0x20) + 1) / 2) * (((int)uVar1 + 1) / 2) + 1);
  *TTA::rtable_ = 0;
  TTA::length_ = 1;
  pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  lVar38 = *(long *)&pMVar4->field_0x10;
  if (uVar20 != 1) {
    uVar54 = 0xfffffffffffffffe;
    lVar47 = **(long **)&pMVar4->field_0x48;
    lVar44 = lVar38 + lVar47;
    lVar40 = *(long *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x10;
    lVar35 = uVar42 - 2;
    lVar46 = lVar38 + 1 + lVar47;
    while( true ) {
      lVar51 = (long)(int)uVar54;
      uVar34 = lVar51 + 2;
      iVar39 = (int)lVar35;
      if (iVar39 <= (int)uVar34) break;
      if ((*(char *)(lVar38 + uVar34) != '\0') || (*(char *)(lVar44 + uVar34) != '\0')) {
        cVar14 = *(char *)(lVar38 + 3 + lVar51);
        uVar6 = TTA::NewLabel();
        *(uint *)(lVar40 + 8 + lVar51 * 4) = uVar6;
        if (cVar14 != '\0') goto LAB_002a475e;
        goto LAB_002a4814;
      }
      if ((*(char *)(lVar51 + 3 + lVar38) != '\0') || (*(char *)(lVar44 + 3 + lVar51) != '\0')) {
        uVar6 = TTA::NewLabel();
        uVar54 = uVar34 & 0xffffffff;
LAB_002a4756:
        *(uint *)(lVar40 + uVar34 * 4) = uVar6;
        uVar34 = uVar54 & 0xffffffff;
LAB_002a475e:
        iVar41 = (int)uVar34;
        lVar15 = (long)iVar41;
        lVar48 = lVar15 * 4 + lVar40;
        lVar52 = lVar15 << 0x20;
        lVar51 = lVar38 + 3 + lVar15;
        lVar33 = lVar38 + 3 + lVar47 + lVar15;
        lVar27 = 0;
        do {
          iVar23 = (int)lVar27;
          if (lVar35 <= lVar27 + lVar15 + 2) {
            uVar34 = lVar52 + 0x200000000 >> 0x20;
            if (iVar39 < iVar41 + iVar23 + 2) {
              if ((*(char *)(lVar38 + uVar34) == '\0') && (*(char *)(lVar44 + uVar34) == '\0'))
              goto LAB_002a4c4d;
            }
            else if ((*(char *)(lVar38 + uVar34) == '\0') && (*(char *)(lVar44 + uVar34) == '\0'))
            goto LAB_002a4bd0;
            uVar6 = *(uint *)(lVar40 + (lVar52 >> 0x1e));
            goto LAB_002a4c9c;
          }
          if ((*(char *)(lVar51 + -1 + lVar27) == '\0') && (*(char *)(lVar33 + -1 + lVar27) == '\0')
             ) {
            if ((*(char *)(lVar51 + lVar27) == '\0') && (*(char *)(lVar33 + lVar27) == '\0')) {
              uVar54 = (ulong)(iVar41 + iVar23 + 2);
              uVar34 = lVar15 + 2 + lVar27;
              goto LAB_002a4a2c;
            }
            uVar6 = TTA::NewLabel();
          }
          else {
            if (*(char *)(lVar51 + lVar27) == '\0') goto LAB_002a47fa;
            uVar6 = *(uint *)(lVar48 + lVar27 * 4);
          }
          *(uint *)(lVar48 + 8 + lVar27 * 4) = uVar6;
          lVar27 = lVar27 + 2;
          lVar52 = lVar52 + 0x200000000;
        } while( true );
      }
      uVar54 = uVar34 & 0xffffffff;
LAB_002a4a2c:
      *(undefined4 *)(lVar40 + uVar34 * 4) = 0;
    }
    if (iVar39 < (int)uVar34) {
      if (*(char *)(lVar38 + uVar34) == '\0') {
        cVar14 = *(char *)(lVar44 + uVar34);
joined_r0x002a4c4b:
        if (cVar14 == '\0') {
LAB_002a4c4d:
          uVar6 = 0;
        }
        else {
LAB_002a4bf4:
          uVar6 = TTA::NewLabel();
        }
      }
      else {
LAB_002a4c7e:
        uVar6 = TTA::NewLabel();
      }
    }
    else {
      if ((((*(char *)(lVar38 + uVar34) != '\0') || (*(char *)(lVar44 + uVar34) != '\0')) ||
          (*(char *)(lVar51 + 3 + lVar38) != '\0')) || (*(char *)(lVar44 + 3 + lVar51) != '\0'))
      goto LAB_002a4c7e;
      uVar6 = 0;
    }
LAB_002a4c9c:
    lVar46 = 1;
    *(uint *)(lVar40 + uVar34 * 4) = uVar6;
    lVar44 = 3;
    lVar47 = 0;
    for (lVar38 = 2; lVar38 < (long)((long)(int)uVar20 & 0xfffffffffffffffeU); lVar38 = lVar38 + 2)
    {
      pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
      pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
      lVar51 = *(long *)&pMVar4->field_0x10;
      lVar33 = **(long **)&pMVar4->field_0x48;
      lVar52 = lVar33 * lVar38;
      lVar40 = lVar51 + lVar52;
      pcVar21 = (char *)(lVar40 - lVar33);
      pcVar9 = (char *)(lVar40 + lVar33);
      lVar15 = *(long *)&pMVar5->field_0x10;
      lVar27 = **(long **)&pMVar5->field_0x48;
      lVar48 = lVar27 * lVar38;
      puVar53 = (uint *)(lVar15 + lVar48);
      puVar10 = (uint *)((long)puVar53 + lVar27 * -2);
      cVar14 = *(char *)(lVar51 + lVar52);
      if (2 < (int)uVar3) {
        if (cVar14 == '\0') {
          if (*pcVar9 != '\0') {
            if (*(char *)(lVar40 + 1) == '\0') {
              uVar6 = TTA::NewLabel();
              *puVar53 = uVar6;
              uVar54 = 0;
              goto LAB_002a79e2;
            }
            if (pcVar21[1] != '\0') {
              *puVar53 = *puVar10;
              uVar54 = 0;
              goto LAB_002a771f;
            }
            cVar14 = *pcVar21;
            if (pcVar21[2] != '\0') goto joined_r0x002a4e61;
            if (cVar14 != '\0') {
              *puVar53 = *puVar10;
              local_138 = 0;
              goto LAB_002a7264;
            }
            uVar6 = TTA::NewLabel();
            *puVar53 = uVar6;
            local_138 = 0;
            goto LAB_002a6775;
          }
          if (*(char *)(lVar40 + 1) == '\0') {
            if (pcVar9[1] == '\0') {
              uVar54 = 0;
              puVar13 = puVar53;
              goto LAB_002a50e1;
            }
            uVar6 = TTA::NewLabel();
            *puVar53 = uVar6;
            uVar54 = 0;
            goto LAB_002a5a15;
          }
          if (pcVar21[1] != '\0') {
            *puVar53 = *puVar10;
            uVar54 = 0;
            goto LAB_002a771f;
          }
        }
        else {
          if (pcVar21[1] != '\0') {
            *puVar53 = *puVar10;
            local_138 = 0;
            goto LAB_002aab14;
          }
          if (*(char *)(lVar40 + 1) == '\0') {
            if (*pcVar21 != '\0') {
              *puVar53 = *puVar10;
              local_138 = 0;
              goto LAB_002aa418;
            }
            uVar6 = TTA::NewLabel();
            *puVar53 = uVar6;
            uVar54 = 0;
            goto LAB_002ad553;
          }
        }
        cVar14 = *pcVar21;
        if (pcVar21[2] != '\0') {
joined_r0x002a4e61:
          if (cVar14 != '\0') {
            if (pcVar21[1 - lVar33] == '\0') {
              uVar6 = TTA::Merge(*puVar10,puVar10[2]);
              *puVar53 = uVar6;
            }
            else {
              *puVar53 = *puVar10;
            }
            uVar54 = 0;
            goto LAB_002a6e39;
          }
          *puVar53 = puVar10[2];
          uVar54 = 0;
          goto LAB_002a6e39;
        }
        if (cVar14 != '\0') {
          *puVar53 = *puVar10;
          local_138 = 0;
          goto LAB_002a7264;
        }
        uVar6 = TTA::NewLabel();
        *puVar53 = uVar6;
        local_138 = 0;
LAB_002a6775:
        iVar41 = (int)local_138;
        lVar12 = (long)iVar41;
        lVar24 = lVar12 << 0x20;
        lVar26 = lVar51 + lVar33 * lVar46 + lVar12;
        lVar36 = lVar33 * lVar44 + lVar12;
        lVar30 = lVar51 + 3 + lVar52 + lVar12;
        lVar31 = lVar12 * 4;
        lVar11 = lVar48 + lVar12 * 4;
        puVar49 = (uint *)(lVar15 + lVar11 + 8);
        lVar43 = 0;
        puVar13 = puVar49;
        do {
          uVar34 = lVar12 + lVar43 + 2;
          iVar23 = (int)lVar43;
          if (lVar35 <= (long)uVar34) {
            uVar6 = iVar41 + 2 + iVar23;
            if (iVar39 < (int)uVar6) {
LAB_002a7022:
              uVar54 = (ulong)uVar6;
LAB_002a78fe:
              uVar34 = uVar54 & 0xffffffff;
              if ((*(char *)(lVar40 + uVar34) == '\0') && (pcVar9[uVar34] == '\0')) {
                puVar53[uVar34] = 0;
              }
              else {
                puVar53[uVar34] = puVar53[(long)(int)uVar54 + -2];
              }
            }
            else {
              uVar34 = uVar34 & 0xffffffff;
              if (*(char *)(lVar40 + uVar34) == '\0') {
                uVar54 = (ulong)(uint)(iVar41 + 3 + iVar23);
                if (pcVar9[uVar34] != '\0') {
                  if ((*(char *)(lVar40 + uVar54) == '\0') || (pcVar21[uVar54] == '\0')) {
LAB_002a8681:
                    uVar6 = *(uint *)((long)puVar53 + (lVar24 >> 0x1e));
                  }
                  else {
LAB_002a6d38:
                    uVar6 = puVar10[uVar34];
                    uVar7 = *(uint *)((long)puVar53 + (lVar24 >> 0x1e));
LAB_002a96da:
                    uVar6 = TTA::Merge(uVar6,uVar7);
                  }
                  goto LAB_002a96fe;
                }
                if (*(char *)(lVar40 + uVar54) != '\0') {
                  cVar14 = pcVar21[uVar54];
joined_r0x002a6dd5:
                  if (cVar14 != '\0') {
LAB_002a7e20:
                    uVar6 = puVar10[uVar34];
                    goto LAB_002a96fe;
                  }
                  goto LAB_002a928b;
                }
LAB_002a9279:
                cVar14 = pcVar9[uVar54];
joined_r0x002a7259:
                if (cVar14 == '\0') {
                  puVar53[uVar34] = 0;
                }
                else {
LAB_002a928b:
                  uVar6 = TTA::NewLabel();
LAB_002a96fe:
                  puVar53[uVar34] = uVar6;
                }
              }
              else {
                lVar24 = lVar24 >> 0x20;
                if (pcVar21[lVar24 + 3] == '\0') {
LAB_002a8310:
                  uVar6 = puVar53[lVar24];
LAB_002a8319:
                  puVar53[uVar34] = uVar6;
                }
                else {
                  uVar6 = TTA::Merge(puVar10[uVar34],puVar53[lVar24]);
                  puVar53[uVar34] = uVar6;
                }
              }
            }
            goto LAB_002a4ee3;
          }
          lVar16 = lVar24 >> 0x1e;
          if (*(char *)(lVar30 + -1 + lVar43) != '\0') {
            local_138 = (ulong)(iVar41 + 2) + lVar43;
            iVar41 = (int)local_138;
            lVar26 = lVar24 + 0x300000000 >> 0x20;
            if (pcVar21[lVar26] != '\0') {
              uVar6 = TTA::Merge(*(uint *)(lVar27 * lVar47 + lVar12 * 4 + lVar15 + 8 + lVar43 * 4),
                                 *(uint *)((long)puVar53 + lVar16));
              *(uint *)(lVar31 + lVar48 + lVar15 + 8 + lVar43 * 4) = uVar6;
              local_138 = local_138 & 0xffffffff;
              goto LAB_002aab14;
            }
            if (*(char *)(lVar40 + lVar26) == '\0') {
              uVar6 = *(uint *)((long)puVar53 + lVar16);
              goto LAB_002ab0db;
            }
            lVar11 = lVar24 + 0x400000000 >> 0x20;
            if (pcVar21[lVar11] == '\0') {
              uVar6 = *(uint *)((long)puVar53 + lVar16);
              goto LAB_002a86fa;
            }
            if (pcVar21[lVar26 - lVar33] == '\0') {
              uVar6 = puVar10[lVar11];
            }
            else {
              uVar6 = *(uint *)(lVar27 * lVar47 + lVar12 * 4 + lVar15 + 8 + lVar43 * 4);
            }
            uVar6 = TTA::Merge(uVar6,*(uint *)((long)puVar53 + lVar16));
            *(uint *)(lVar15 + 8 + lVar31 + lVar48 + lVar43 * 4) = uVar6;
            uVar54 = local_138;
            goto LAB_002a6e39;
          }
          if (*(char *)(lVar51 + lVar36 + 2 + lVar43) != '\0') {
            local_138 = (ulong)(iVar41 + 2) + lVar43;
            lVar26 = lVar24 + 0x300000000 >> 0x20;
            if (*(char *)(lVar40 + lVar26) == '\0') {
              *(undefined4 *)(lVar31 + lVar48 + lVar15 + 8 + lVar43 * 4) =
                   *(undefined4 *)((long)puVar53 + lVar16);
              uVar54 = local_138 & 0xffffffff;
              goto LAB_002a79e2;
            }
            uVar54 = local_138;
            if (pcVar21[lVar26] != '\0') {
              uVar6 = TTA::Merge(*(uint *)(lVar27 * lVar47 + lVar12 * 4 + lVar15 + 8 + lVar43 * 4),
                                 *(uint *)((long)puVar53 + lVar16));
              *(uint *)(lVar31 + lVar48 + lVar15 + 8 + lVar43 * 4) = uVar6;
              goto LAB_002a771f;
            }
            lVar11 = lVar24 + 0x400000000 >> 0x20;
            if (pcVar21[lVar11] == '\0') {
              uVar6 = *(uint *)((long)puVar53 + lVar16);
              goto LAB_002a86fa;
            }
            if (pcVar21[lVar26 - lVar33] == '\0') {
              uVar6 = puVar10[lVar11];
            }
            else {
              uVar6 = *(uint *)(lVar27 * lVar47 + lVar12 * 4 + lVar15 + 8 + lVar43 * 4);
            }
            uVar6 = TTA::Merge(uVar6,*(uint *)((long)puVar53 + lVar16));
            *(uint *)(lVar15 + 8 + lVar31 + lVar48 + lVar43 * 4) = uVar6;
            goto LAB_002a6e39;
          }
          if (*(char *)(lVar30 + lVar43) == '\0') {
            uVar54 = (ulong)(iVar41 + 2) + lVar43;
            if (*(char *)(lVar43 + 3 + lVar36 + lVar51) != '\0') {
              uVar6 = TTA::NewLabel();
              *(uint *)(lVar11 + lVar15 + 8 + lVar43 * 4) = uVar6;
              goto LAB_002a5a15;
            }
            uVar54 = uVar54 & 0xffffffff;
            goto LAB_002a50e1;
          }
          if (*(char *)(lVar26 + 3 + lVar43) != '\0') {
            *(undefined4 *)(lVar31 + lVar48 + lVar15 + 8 + lVar43 * 4) =
                 *(undefined4 *)(lVar27 * lVar47 + lVar12 * 4 + lVar15 + 8 + lVar43 * 4);
            uVar54 = (ulong)(iVar41 + iVar23 + 2);
            goto LAB_002a771f;
          }
          if (*(char *)(lVar26 + 4 + lVar43) != '\0') {
            *(undefined4 *)(lVar31 + lVar48 + lVar15 + 8 + lVar43 * 4) =
                 *(undefined4 *)(lVar27 * lVar47 + lVar12 * 4 + lVar15 + 0x10 + lVar43 * 4);
            uVar54 = (ulong)(iVar41 + iVar23 + 2);
LAB_002a6e39:
            iVar41 = (int)uVar54;
            lVar18 = (long)iVar41;
            lVar24 = lVar18 << 0x20;
            lVar26 = lVar51 + lVar33 * lVar46 + lVar18;
            lVar11 = lVar15 + lVar27 * lVar47 + lVar18 * 4;
            lVar17 = lVar11 + 8;
            lVar31 = lVar51 + lVar52 + lVar18;
            lVar25 = lVar31 + 3;
            lVar16 = lVar51 + lVar33 * lVar47 + lVar18 + 3;
            lVar36 = lVar33 * lVar44 + lVar18;
            lVar30 = lVar48 + lVar18 * 4;
            lVar43 = lVar15 + lVar30 + 8;
            lVar12 = 0;
            lVar22 = 0;
            do {
              uVar34 = lVar22 + lVar18 + 2;
              lVar28 = lVar24 >> 0x1e;
              iVar23 = (int)lVar22;
              if (lVar35 <= (long)uVar34) {
                uVar6 = iVar41 + 2 + iVar23;
                if (iVar39 < (int)uVar6) goto LAB_002a7022;
                uVar34 = uVar34 & 0xffffffff;
                if (*(char *)(lVar40 + uVar34) != '\0') {
                  if (pcVar21[(lVar24 >> 0x20) + 3] == '\0') {
                    uVar6 = puVar53[lVar24 >> 0x20];
                  }
                  else {
                    uVar6 = puVar10[uVar34];
                  }
                  puVar53[uVar34] = uVar6;
                  goto LAB_002a4ee3;
                }
                uVar54 = (ulong)(uint)(iVar41 + 3 + iVar23);
                if (pcVar9[uVar34] == '\0') {
                  if (*(char *)(lVar40 + uVar54) == '\0') {
                    cVar14 = pcVar9[uVar54];
                    goto joined_r0x002a7259;
                  }
                }
                else if ((*(char *)(lVar40 + uVar54) == '\0') || (pcVar21[uVar54] == '\0')) {
                  uVar6 = *(uint *)((long)puVar53 + lVar28);
                  goto LAB_002a8319;
                }
                uVar6 = puVar10[uVar34];
                goto LAB_002a8319;
              }
              if (*(char *)(lVar31 + 2 + lVar22) == '\0') {
                cVar14 = *(char *)(lVar25 + lVar22);
                if (*(char *)(lVar51 + lVar36 + 2 + lVar22) != '\0') {
                  if (cVar14 == '\0') {
                    uVar54 = (ulong)(iVar41 + iVar23 + 2);
                    *(undefined4 *)(lVar30 + lVar15 + 8 + lVar22 * 4) =
                         *(undefined4 *)((long)puVar53 + lVar28);
                    goto LAB_002a79e2;
                  }
                  if (*(char *)(lVar26 + 3 + lVar22) != '\0') goto LAB_002a70e2;
                  goto LAB_002a6f50;
                }
                if (cVar14 == '\0') {
                  local_138 = (ulong)(iVar41 + 2) + lVar22;
                  if (*(char *)(lVar22 + 3 + lVar36 + lVar51) != '\0') {
                    uVar6 = TTA::NewLabel();
                    *(uint *)(lVar30 + lVar15 + 8 + lVar22 * 4) = uVar6;
                    uVar54 = local_138 & 0xffffffff;
                    goto LAB_002a5a15;
                  }
                  lVar12 = lVar12 + lVar30 + lVar15;
LAB_002a85b5:
                  uVar54 = local_138;
                  puVar13 = (uint *)(lVar12 + 8);
                  goto LAB_002a50e1;
                }
                if (*(char *)(lVar26 + 3 + lVar22) != '\0') {
LAB_002a70e2:
                  uVar54 = (ulong)(iVar41 + iVar23 + 2);
                  *(undefined4 *)(lVar43 + lVar22 * 4) = *(undefined4 *)(lVar17 + lVar22 * 4);
                  goto LAB_002a771f;
                }
                if (*(char *)(lVar26 + 4 + lVar22) == '\0') {
                  *(undefined4 *)(lVar43 + lVar22 * 4) = *(undefined4 *)(lVar17 + lVar22 * 4);
                  local_138 = (ulong)(iVar41 + iVar23 + 2);
                  goto LAB_002a7264;
                }
                uVar6 = *(uint *)(lVar17 + lVar22 * 4);
                if (*(char *)(lVar16 + lVar22) == '\0') {
                  uVar7 = *(uint *)(lVar11 + 0x10 + lVar22 * 4);
                  goto LAB_002a6f78;
                }
              }
              else {
                if (*(char *)(lVar26 + 3 + lVar22) != '\0') {
                  local_138 = (ulong)(iVar41 + iVar23 + 2);
                  *(undefined4 *)(lVar43 + lVar22 * 4) = *(undefined4 *)(lVar17 + lVar22 * 4);
                  goto LAB_002aab14;
                }
                if (*(char *)(lVar25 + lVar22) == '\0') {
                  iVar41 = iVar41 + iVar23 + 2;
                  uVar6 = *(uint *)((long)puVar53 + lVar28);
                  uVar34 = lVar22 + lVar18 + 2;
                  goto LAB_002ab0db;
                }
LAB_002a6f50:
                if (*(char *)(lVar26 + 4 + lVar22) == '\0') goto LAB_002a703e;
                if (*(char *)(lVar16 + lVar22) == '\0') {
                  uVar6 = *(uint *)(lVar11 + 0x10 + lVar22 * 4);
                  uVar7 = *(uint *)(lVar15 + lVar30 + lVar22 * 4);
LAB_002a6f78:
                  uVar6 = TTA::Merge(uVar6,uVar7);
                }
                else {
                  uVar6 = *(uint *)(lVar17 + lVar22 * 4);
                }
              }
              *(uint *)(lVar43 + lVar22 * 4) = uVar6;
              lVar24 = lVar24 + 0x200000000;
              lVar22 = lVar22 + 2;
              lVar12 = lVar12 + 8;
            } while( true );
          }
          uVar6 = TTA::NewLabel();
          puVar49[lVar43] = uVar6;
          lVar24 = lVar24 + 0x200000000;
          lVar43 = lVar43 + 2;
          puVar13 = puVar13 + 2;
        } while( true );
      }
      if (uVar3 == 2) {
        if (cVar14 == '\0') {
          if (*pcVar9 == '\0') {
            if (*(char *)(lVar40 + 1) != '\0') goto LAB_002a4d59;
            if (pcVar9[1] == '\0') goto LAB_002a4f8c;
          }
          else if (*(char *)(lVar40 + 1) != '\0') goto LAB_002a4d59;
LAB_002a4ebf:
          uVar6 = TTA::NewLabel();
        }
        else {
LAB_002a4d59:
          if (pcVar21[1] == '\0') goto LAB_002a4dd3;
LAB_002a4ddc:
          uVar6 = *puVar10;
        }
        *puVar53 = uVar6;
      }
      else {
        if (cVar14 != '\0') {
LAB_002a4dd3:
          if (*pcVar21 == '\0') goto LAB_002a4ebf;
          goto LAB_002a4ddc;
        }
        if (*pcVar9 != '\0') goto LAB_002a4ebf;
LAB_002a4f8c:
        *puVar53 = 0;
      }
LAB_002a4ee3:
      lVar47 = lVar47 + 2;
      lVar46 = lVar46 + 2;
      lVar44 = lVar44 + 2;
    }
    if ((uVar20 & 0x80000001) != 1) goto LAB_002af766;
    uVar54 = (ulong)(uVar20 - 1);
    pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
    pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
    lVar27 = *(long *)&pMVar4->field_0x10;
    lVar15 = **(long **)&pMVar4->field_0x48;
    lVar44 = lVar27 + lVar15 * uVar54;
    lVar31 = lVar44 - lVar15;
    lVar52 = lVar31 - lVar15;
    lVar51 = *(long *)&pMVar5->field_0x10;
    lVar33 = **(long **)&pMVar5->field_0x48;
    lVar46 = lVar51 + lVar33 * uVar54;
    lVar11 = lVar46 + lVar33 * -2;
    lVar38 = lVar31 + 1;
    lVar48 = (uVar54 - 1) * lVar15;
    lVar26 = lVar52 + 1;
    lVar47 = lVar15 * (uVar54 - 2) + 3 + lVar27;
    lVar40 = lVar51 + 8 + lVar33 * uVar54;
    lVar51 = lVar33 * (uVar54 - 2) + 8 + lVar51;
    lVar33 = lVar48 + 2 + lVar27;
    lVar15 = lVar27 + 3 + lVar15 * uVar54;
    lVar27 = lVar48 + 4 + lVar27;
    uVar54 = 0xfffffffffffffffe;
    while( true ) {
      lVar48 = (long)(int)uVar54;
      uVar34 = lVar48 + 2;
      if (iVar39 <= (int)uVar34) break;
      if (*(char *)(lVar44 + 2 + lVar48) == '\0') {
        if (*(char *)(lVar44 + 3 + lVar48) == '\0') {
LAB_002ade8d:
          iVar41 = (int)uVar34;
          goto LAB_002ade90;
        }
        if (*(char *)(lVar31 + 3 + lVar48) != '\0') {
LAB_002ae5a3:
          uVar54 = uVar34 & 0xffffffff;
          goto LAB_002ae6b2;
        }
LAB_002ade00:
        cVar14 = *(char *)(lVar48 + 2 + lVar31);
        if (*(char *)(lVar48 + 4 + lVar31) == '\0') {
          if (cVar14 == '\0') goto LAB_002ae642;
          uVar54 = uVar34 & 0xffffffff;
          goto LAB_002ae523;
        }
        if (cVar14 == '\0') goto LAB_002ae629;
        uVar6 = *(uint *)(lVar11 + 8 + lVar48 * 4);
        uVar54 = uVar34;
        if (*(char *)(lVar52 + 3 + lVar48) == '\0') {
          uVar6 = TTA::Merge(uVar6,*(uint *)(lVar11 + 0x10 + lVar48 * 4));
          *(uint *)(lVar46 + 8 + lVar48 * 4) = uVar6;
        }
        else {
          *(uint *)(lVar46 + 8 + lVar48 * 4) = uVar6;
        }
LAB_002ae344:
        iVar41 = (int)uVar54;
        lVar16 = (long)iVar41;
        lVar24 = lVar16 << 0x20;
        lVar48 = lVar27 + lVar16;
        lVar30 = lVar51 + lVar16 * 4;
        lVar12 = lVar15 + lVar16;
        lVar36 = lVar40 + lVar16 * 4;
        for (lVar43 = 0; uVar34 = lVar16 + lVar43 + 2, (long)uVar34 < lVar35; lVar43 = lVar43 + 2) {
          iVar23 = (int)lVar43;
          if (*(char *)(lVar12 + -1 + lVar43) == '\0') {
            if (*(char *)(lVar12 + lVar43) == '\0') {
              iVar41 = iVar41 + iVar23;
LAB_002ae4cd:
              iVar41 = iVar41 + 2;
              uVar34 = lVar16 + lVar43 + 2;
              goto LAB_002ade90;
            }
            if (*(char *)(lVar48 + -1 + lVar43) != '\0') {
              iVar41 = iVar41 + iVar23;
              goto LAB_002ae4e2;
            }
            if (*(char *)(lVar48 + lVar43) == '\0') {
              uVar54 = (ulong)(iVar41 + iVar23 + 2);
              uVar34 = lVar16 + lVar43 + 2;
              goto LAB_002ae523;
            }
            uVar6 = *(uint *)(lVar30 + lVar43 * 4);
            if (*(char *)(lVar47 + lVar16 + lVar43) == '\0') {
              uVar7 = *(uint *)(lVar30 + 8 + lVar43 * 4);
LAB_002ae41f:
              uVar6 = TTA::Merge(uVar6,uVar7);
            }
          }
          else {
            if (*(char *)(lVar48 + -1 + lVar43) != '\0') {
              uVar54 = (ulong)(iVar41 + iVar23 + 2);
              uVar6 = *(uint *)(lVar30 + lVar43 * 4);
              goto LAB_002aeaf2;
            }
            if (*(char *)(lVar12 + lVar43) == '\0') {
              uVar54 = (ulong)(iVar41 + iVar23 + 2);
              uVar6 = *(uint *)(lVar46 + (lVar24 >> 0x1e));
              uVar34 = lVar16 + lVar43 + 2;
              goto LAB_002aee67;
            }
            if (*(char *)(lVar48 + lVar43) == '\0') goto LAB_002ae4a1;
            if (*(char *)(lVar47 + lVar16 + lVar43) == '\0') {
              uVar6 = *(uint *)(lVar30 + 8 + lVar43 * 4);
              uVar7 = *(uint *)(lVar36 + -8 + lVar43 * 4);
              goto LAB_002ae41f;
            }
            uVar6 = *(uint *)(lVar30 + lVar43 * 4);
          }
          *(uint *)(lVar36 + lVar43 * 4) = uVar6;
          lVar24 = lVar24 + 0x200000000;
        }
        uVar34 = (ulong)(iVar41 + 2) + lVar43;
        if (iVar39 < (int)uVar34) goto LAB_002af296;
        lVar38 = lVar24 + 0x200000000 >> 0x20;
        lVar24 = lVar24 >> 0x20;
        if (*(char *)(lVar44 + lVar38) == '\0') {
          if (*(char *)(lVar44 + 3 + lVar24) == '\0') goto LAB_002af538;
          goto LAB_002af52f;
        }
        if (*(char *)(lVar31 + 3 + lVar24) == '\0') {
          uVar8 = *(undefined4 *)(lVar46 + lVar24 * 4);
        }
        else {
LAB_002af52f:
          uVar8 = *(undefined4 *)(lVar11 + lVar38 * 4);
        }
LAB_002af607:
        *(undefined4 *)(lVar46 + lVar38 * 4) = uVar8;
        goto LAB_002af766;
      }
      if (*(char *)(lVar31 + 3 + lVar48) != '\0') {
        uVar6 = *(uint *)(lVar11 + 8 + lVar48 * 4);
        uVar54 = uVar34 & 0xffffffff;
        goto LAB_002aeaf2;
      }
      if (*(char *)(lVar44 + 3 + lVar48) != '\0') goto LAB_002ade00;
      if (*(char *)(lVar31 + uVar34) == '\0') {
        uVar6 = TTA::NewLabel();
      }
      else {
        uVar6 = *(uint *)(lVar11 + 8 + lVar48 * 4);
      }
LAB_002ae619:
      uVar54 = uVar34 & 0xffffffff;
LAB_002aee67:
      *(uint *)(lVar46 + uVar34 * 4) = uVar6;
    }
    if (iVar39 < (int)uVar34) {
      if (*(char *)(lVar44 + uVar34) == '\0') {
LAB_002af75b:
        *(undefined4 *)(lVar46 + 8 + lVar48 * 4) = 0;
        goto LAB_002af766;
      }
LAB_002af55a:
      cVar14 = *(char *)(lVar31 + uVar34);
joined_r0x002af55f:
      if (cVar14 != '\0') goto LAB_002af565;
      uVar6 = TTA::NewLabel();
    }
    else {
      if ((*(char *)(lVar44 + uVar34) == '\0') && (*(char *)(lVar48 + 3 + lVar44) == '\0'))
      goto LAB_002af75b;
      if (*(char *)(lVar31 + 3 + lVar48) == '\0') goto LAB_002af55a;
LAB_002af565:
      uVar6 = *(uint *)(lVar11 + 8 + lVar48 * 4);
    }
LAB_002af754:
    *(uint *)(lVar46 + 8 + lVar48 * 4) = uVar6;
    goto LAB_002af766;
  }
  lVar35 = *(long *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x10;
  lVar44 = -2;
LAB_002a4570:
  lVar46 = (long)(int)lVar44;
  lVar44 = lVar46 + 2;
  iVar39 = (int)(uVar42 - 2);
  if ((int)lVar44 < iVar39) {
    cVar14 = *(char *)(lVar38 + 3 + lVar46);
    if (*(char *)(lVar38 + 2 + lVar46) != '\0') goto code_r0x002a458d;
    if (cVar14 != '\0') {
      uVar6 = TTA::NewLabel();
      *(uint *)(lVar35 + 8 + lVar46 * 4) = uVar6;
      goto LAB_002a45d9;
    }
    uVar8 = 0;
    goto LAB_002a464d;
  }
  cVar14 = *(char *)(lVar38 + lVar44);
  if (iVar39 < (int)lVar44) {
joined_r0x002a4c1c:
    if (cVar14 == '\0') {
      *(undefined4 *)(lVar35 + 8 + lVar46 * 4) = 0;
      goto LAB_002af766;
    }
  }
  else if (cVar14 == '\0') {
    cVar14 = *(char *)(lVar38 + 3 + lVar46);
    goto joined_r0x002a4c1c;
  }
  uVar6 = TTA::NewLabel();
  *(uint *)(lVar35 + 8 + lVar46 * 4) = uVar6;
LAB_002af766:
  uVar6 = TTA::Flatten();
  (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar6;
  puVar10 = TTA::rtable_;
  pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  local_a8 = (int)((long)(int)uVar20 & 0xfffffffffffffffeU);
  lVar38 = 1;
  for (lVar44 = 0; puVar53 = TTA::rtable_, lVar44 < local_a8; lVar44 = lVar44 + 2) {
    lVar35 = **(long **)&pMVar5->field_0x48;
    lVar40 = lVar35 * lVar44 + *(long *)&pMVar5->field_0x10;
    lVar47 = lVar35 * lVar38 + *(long *)&pMVar5->field_0x10;
    lVar51 = **(long **)&pMVar4->field_0x48 * lVar38 + *(long *)&pMVar4->field_0x10;
    lVar46 = **(long **)&pMVar4->field_0x48 * lVar44 + *(long *)&pMVar4->field_0x10;
    for (uVar54 = 0; uVar6 = 0, (long)uVar54 < (long)(uVar42 & 0xfffffffffffffffe);
        uVar54 = uVar54 + 2) {
      lVar33 = (long)*(int *)(lVar40 + uVar54 * 4);
      if (lVar33 < 1) {
        *(undefined8 *)(lVar40 + uVar54 * 4) = 0;
        uVar34 = uVar54 | 1;
        *(undefined4 *)(lVar47 + uVar54 * 4) = 0;
        uVar7 = 0;
      }
      else {
        uVar7 = puVar53[lVar33];
        uVar29 = uVar7;
        if (*(char *)(lVar46 + uVar54) == '\0') {
          uVar29 = uVar6;
        }
        *(uint *)(lVar40 + uVar54 * 4) = uVar29;
        uVar29 = uVar7;
        if (*(char *)(lVar46 + 1 + uVar54) == '\0') {
          uVar29 = 0;
        }
        uVar34 = uVar54 + 1;
        *(uint *)(lVar40 + 4 + uVar54 * 4) = uVar29;
        uVar29 = uVar7;
        if (*(char *)(lVar51 + uVar54) == '\0') {
          uVar29 = uVar6;
        }
        *(uint *)(lVar47 + uVar54 * 4) = uVar29;
        if (*(char *)(lVar51 + 1 + uVar54) == '\0') {
          uVar7 = 0;
        }
      }
      *(uint *)(lVar40 + lVar35 + uVar34 * 4) = uVar7;
    }
    if ((uVar3 & 0x80000001) == 1) {
      lVar35 = (long)*(int *)(lVar40 + uVar54 * 4);
      if (lVar35 < 1) {
        *(undefined4 *)(lVar40 + uVar54 * 4) = 0;
        *(undefined4 *)(lVar47 + uVar54 * 4) = 0;
      }
      else {
        uVar7 = puVar10[lVar35];
        uVar29 = uVar7;
        if (*(char *)(uVar54 + lVar46) == '\0') {
          uVar29 = uVar6;
        }
        *(uint *)(lVar40 + uVar54 * 4) = uVar29;
        if (*(char *)(uVar54 + lVar51) == '\0') {
          *(undefined4 *)(lVar47 + uVar54 * 4) = 0;
        }
        else {
          *(uint *)(lVar47 + uVar54 * 4) = uVar7;
        }
      }
    }
    lVar38 = lVar38 + 2;
  }
  if ((uVar20 & 0x80000001) == 1) {
    lVar35 = **(long **)&pMVar4->field_0x48 * lVar44 + *(long *)&pMVar4->field_0x10;
    lVar38 = lVar44 * **(long **)&pMVar5->field_0x48 + *(long *)&pMVar5->field_0x10;
    for (lVar44 = 0; lVar44 < (long)(uVar42 & 0xfffffffffffffffe); lVar44 = lVar44 + 2) {
      lVar46 = (long)*(int *)(lVar38 + lVar44 * 4);
      if (lVar46 < 1) {
        *(undefined8 *)(lVar38 + lVar44 * 4) = 0;
      }
      else {
        uVar20 = puVar53[lVar46];
        uVar6 = uVar20;
        if (*(char *)(lVar35 + lVar44) == '\0') {
          uVar6 = 0;
        }
        *(uint *)(lVar38 + lVar44 * 4) = uVar6;
        if (*(char *)(lVar35 + 1 + lVar44) == '\0') {
          *(undefined4 *)(lVar38 + 4 + lVar44 * 4) = 0;
        }
        else {
          *(uint *)(lVar38 + 4 + lVar44 * 4) = uVar20;
        }
      }
    }
    if ((uVar3 & 0x80000001) == 1) {
      lVar46 = (long)*(int *)(lVar38 + lVar44 * 4);
      uVar20 = 0;
      if ((0 < lVar46) && (uVar20 = 0, *(char *)(lVar44 + lVar35) != '\0')) {
        uVar20 = TTA::rtable_[lVar46];
      }
      *(uint *)(lVar38 + lVar44 * 4) = uVar20;
    }
  }
  TTA::Dealloc();
  return;
LAB_002a47fa:
  uVar34 = (ulong)(iVar41 + iVar23 + 2);
  *(undefined4 *)(lVar48 + 8 + lVar27 * 4) = *(undefined4 *)(lVar48 + lVar27 * 4);
LAB_002a4814:
  iVar41 = (int)uVar34;
  lVar15 = (long)iVar41;
  lVar52 = lVar15 << 0x20;
  lVar27 = lVar15 * 4 + lVar40;
  lVar51 = lVar46 + lVar15;
  lVar33 = lVar38 + 2 + lVar15;
  lVar48 = 0;
  do {
    iVar23 = (int)lVar48;
    if (lVar35 <= lVar15 + 2 + lVar48) {
      uVar34 = lVar52 + 0x200000000 >> 0x20;
      lVar46 = lVar52 >> 0x20;
      if (iVar39 < iVar41 + iVar23 + 2) {
        if ((*(char *)(lVar38 + uVar34) == '\0') && (*(char *)(lVar44 + uVar34) == '\0'))
        goto LAB_002a4c4d;
LAB_002a4b5c:
        cVar14 = *(char *)(lVar44 + 1 + lVar46);
      }
      else {
        if (*(char *)(lVar38 + uVar34) != '\0') goto LAB_002a4b5c;
        if (*(char *)(lVar44 + uVar34) == '\0') break;
        cVar14 = *(char *)(lVar44 + 1 + lVar46);
      }
      if (cVar14 == '\0') goto LAB_002a4bf4;
      uVar6 = *(uint *)(lVar40 + lVar46 * 4);
      goto LAB_002a4c9c;
    }
    if (*(char *)(lVar33 + lVar48) == '\0') {
      if (*(char *)(lVar51 + 1 + lVar48) == '\0') {
        uVar54 = (ulong)(iVar41 + 2) + lVar48;
        lVar51 = lVar52 + 0x300000000 >> 0x20;
        uVar34 = lVar15 + 2 + lVar48;
        if (*(char *)(lVar38 + lVar51) == '\0') {
          if (*(char *)(lVar44 + lVar51) == '\0') goto LAB_002a4a2c;
          uVar6 = TTA::NewLabel();
          goto LAB_002a4756;
        }
      }
      else {
        if (*(char *)(lVar33 + 1 + lVar48) == '\0') {
          if (*(char *)(lVar51 + lVar48) != '\0') goto LAB_002a4891;
          uVar6 = TTA::NewLabel();
          goto LAB_002a48d4;
        }
        uVar54 = (ulong)(iVar41 + 2) + lVar48;
        uVar34 = lVar15 + 2 + lVar48;
        if (*(char *)(lVar46 + lVar15 + lVar48) != '\0') {
          uVar6 = *(uint *)(lVar27 + lVar48 * 4);
          goto LAB_002a4756;
        }
      }
      uVar6 = TTA::NewLabel();
      goto LAB_002a4756;
    }
    cVar14 = *(char *)(lVar33 + 1 + lVar48);
    if (*(char *)(lVar51 + lVar48) == '\0') {
      if (cVar14 != '\0') {
        uVar54 = (ulong)(iVar41 + iVar23 + 2);
        uVar6 = TTA::NewLabel();
        uVar34 = lVar15 + lVar48 + 2;
        goto LAB_002a4756;
      }
      uVar6 = TTA::NewLabel();
    }
    else {
      if (cVar14 != '\0') goto LAB_002a48e5;
LAB_002a4891:
      uVar6 = *(uint *)(lVar27 + lVar48 * 4);
    }
LAB_002a48d4:
    *(uint *)(lVar27 + 8 + lVar48 * 4) = uVar6;
    lVar52 = lVar52 + 0x200000000;
    lVar48 = lVar48 + 2;
  } while( true );
LAB_002a4bd0:
  lVar46 = lVar52 + 0x300000000 >> 0x20;
  if (*(char *)(lVar38 + lVar46) != '\0') goto LAB_002a4bf4;
  cVar14 = *(char *)(lVar44 + lVar46);
  goto joined_r0x002a4c4b;
LAB_002a703e:
  local_138 = (ulong)(iVar41 + iVar23 + 2);
  uVar6 = *(uint *)((long)puVar53 + lVar28);
LAB_002a86fa:
  puVar53[uVar34] = uVar6;
  iVar41 = (int)local_138;
  lVar36 = (long)iVar41;
  lVar12 = lVar36 << 0x20;
  lVar11 = lVar48 + lVar36 * 4;
  lVar16 = lVar15 + lVar11 + 8;
  lVar31 = lVar51 + lVar33 * lVar46 + lVar36;
  lVar30 = lVar51 + lVar52 + lVar36;
  lVar24 = lVar30 + 3;
  lVar26 = 0;
  lVar43 = 0;
LAB_002a8760:
  uVar34 = lVar36 + lVar43 + 2;
  lVar18 = lVar12 >> 0x20;
  lVar17 = lVar12 >> 0x1e;
  iVar23 = (int)lVar43;
  if (lVar35 <= (long)uVar34) {
    uVar54 = (ulong)(iVar41 + 2) + lVar43;
    if (iVar39 < (int)uVar54) {
      uVar54 = uVar54 & 0xffffffff;
      goto LAB_002a78fe;
    }
    uVar34 = uVar34 & 0xffffffff;
    if (*(char *)(lVar40 + uVar34) != '\0') {
      if (pcVar21[lVar18 + 3] == '\0') {
        puVar53[uVar34] = puVar53[lVar18];
        goto LAB_002a4ee3;
      }
      if (pcVar21[uVar34 - lVar33] == '\0') {
        uVar6 = puVar10[uVar34];
        uVar7 = puVar53[lVar18];
LAB_002a9658:
        uVar6 = TTA::Merge(uVar6,uVar7);
        goto LAB_002ad3b6;
      }
      if (pcVar21[lVar18] == '\0') {
        uVar6 = puVar10[uVar34];
        uVar7 = puVar53[lVar18];
      }
      else {
        uVar6 = puVar10[lVar18];
        if (pcVar21[lVar18 + (1 - lVar33)] != '\0') {
          puVar53[uVar34] = uVar6;
          goto LAB_002a4ee3;
        }
        uVar7 = puVar10[uVar34];
      }
      uVar6 = TTA::Merge(uVar6,uVar7);
      puVar53[uVar34] = uVar6;
      goto LAB_002a4ee3;
    }
    uVar54 = (ulong)(uint)(iVar41 + 3 + iVar23);
    if (pcVar9[uVar34] == '\0') {
      if (*(char *)(lVar40 + uVar54) == '\0') {
        cVar14 = pcVar9[uVar54];
joined_r0x002a9b9a:
        if (cVar14 != '\0') {
LAB_002acfd8:
          uVar6 = TTA::NewLabel();
          goto LAB_002ad3b6;
        }
        puVar53[uVar34] = 0;
        goto LAB_002a4ee3;
      }
      cVar14 = pcVar21[uVar54];
joined_r0x002acfa1:
      if (cVar14 == '\0') goto LAB_002acfd8;
LAB_002acfa3:
      uVar6 = puVar10[uVar34];
LAB_002ad3b6:
      puVar53[uVar34] = uVar6;
    }
    else {
      if ((*(char *)(lVar40 + uVar54) == '\0') || (pcVar21[uVar54] == '\0')) {
        uVar6 = *(uint *)((long)puVar53 + lVar17);
        goto LAB_002ad3b6;
      }
      if (pcVar21[uVar34 - lVar33] == '\0') {
        uVar6 = puVar10[uVar34];
        uVar7 = *(uint *)((long)puVar53 + lVar17);
        goto LAB_002a9658;
      }
      if (pcVar21[lVar18] == '\0') {
        uVar6 = puVar10[uVar34];
        uVar7 = puVar53[lVar18];
      }
      else {
        uVar6 = puVar10[lVar18];
        if (pcVar21[lVar18 + (1 - lVar33)] != '\0') {
          puVar53[uVar34] = uVar6;
          goto LAB_002a4ee3;
        }
        uVar7 = puVar10[uVar34];
      }
      uVar6 = TTA::Merge(uVar6,uVar7);
      puVar53[uVar34] = uVar6;
    }
    goto LAB_002a4ee3;
  }
  if (*(char *)(lVar30 + 2 + lVar43) != '\0') {
    if (*(char *)(lVar31 + 3 + lVar43) != '\0') {
      local_138 = (ulong)(iVar41 + 2) + lVar43;
      if (*(char *)(lVar43 + 2 + lVar33 * lVar47 + lVar36 + lVar51) == '\0') {
        uVar6 = TTA::Merge(*(uint *)(lVar27 * lVar47 + lVar36 * 4 + lVar15 + 8 + lVar43 * 4),
                           *(uint *)((long)puVar53 + lVar17));
        *(uint *)(lVar16 + lVar43 * 4) = uVar6;
        local_138 = local_138 & 0xffffffff;
        goto LAB_002aab14;
      }
      if (pcVar21[lVar18] == '\0') {
        uVar6 = *(uint *)(lVar27 * lVar47 + lVar36 * 4 + lVar15 + 8 + lVar43 * 4);
        uVar7 = puVar53[lVar18];
      }
      else {
        uVar6 = puVar10[lVar18];
        if (pcVar21[lVar18 + (1 - lVar33)] != '\0') {
          *(uint *)(lVar11 + lVar15 + 8 + lVar43 * 4) = uVar6;
          goto LAB_002aab14;
        }
        uVar7 = *(uint *)(lVar27 * lVar47 + lVar36 * 4 + lVar15 + 8 + lVar43 * 4);
      }
      uVar6 = TTA::Merge(uVar6,uVar7);
      *(uint *)(lVar16 + lVar43 * 4) = uVar6;
      goto LAB_002aab14;
    }
    if (*(char *)(lVar24 + lVar43) == '\0') {
      iVar41 = iVar23 + iVar41 + 2;
      uVar6 = *(uint *)((long)puVar53 + lVar17);
      goto LAB_002ab0db;
    }
    if (*(char *)(lVar31 + 4 + lVar43) != '\0') {
      uVar54 = (ulong)(iVar41 + 2) + lVar43;
      lVar26 = lVar33 * lVar47 + lVar36 + lVar51;
      if (*(char *)(lVar43 + 3 + lVar26) == '\0') {
LAB_002a8b1b:
        uVar6 = TTA::Merge(*(uint *)(lVar27 * lVar47 + lVar36 * 4 + lVar15 + 0x10 + lVar43 * 4),
                           *(uint *)((long)puVar53 + lVar17));
        *(uint *)(lVar16 + lVar43 * 4) = uVar6;
        uVar54 = uVar54 & 0xffffffff;
      }
      else if (*(char *)(lVar43 + 2 + lVar26) == '\0') {
LAB_002a8bbe:
        uVar6 = TTA::Merge(*(uint *)(lVar27 * lVar47 + lVar36 * 4 + lVar15 + 8 + lVar43 * 4),
                           *(uint *)((long)puVar53 + lVar17));
        *(uint *)(lVar16 + lVar43 * 4) = uVar6;
        uVar54 = uVar54 & 0xffffffff;
      }
      else {
        if (pcVar21[lVar18] == '\0') goto LAB_002a8f68;
        cVar14 = pcVar21[lVar18 + (1 - lVar33)];
LAB_002a8af7:
        if (cVar14 == '\0') {
          uVar6 = TTA::Merge(puVar10[lVar18],
                             *(uint *)(lVar27 * lVar47 + lVar36 * 4 + lVar15 + 8 + lVar43 * 4));
          goto LAB_002a93b7;
        }
        *(uint *)(lVar11 + lVar15 + 8 + lVar43 * 4) = puVar10[lVar18];
LAB_002a93bb:
        uVar54 = uVar54 & 0xffffffff;
      }
      goto LAB_002a6e39;
    }
LAB_002a87ba:
    *(undefined4 *)(lVar16 + lVar43 * 4) = *(undefined4 *)(lVar15 + lVar11 + lVar43 * 4);
    lVar12 = lVar12 + 0x200000000;
    lVar43 = lVar43 + 2;
    lVar26 = lVar26 + 8;
    goto LAB_002a8760;
  }
  if (*(char *)(lVar51 + lVar33 * lVar44 + lVar36 + 2 + lVar43) == '\0') {
    uVar54 = (ulong)(iVar41 + 2) + lVar43;
    lVar31 = lVar12 + 0x300000000 >> 0x20;
    if (*(char *)(lVar40 + lVar31) == '\0') {
      if (pcVar9[lVar31] == '\0') {
        lVar26 = lVar26 + lVar11 + lVar15;
        uVar54 = uVar54 & 0xffffffff;
        goto LAB_002ac0db;
      }
      uVar6 = TTA::NewLabel();
      *(uint *)(lVar11 + lVar15 + 8 + lVar43 * 4) = uVar6;
      goto LAB_002a5a15;
    }
    if (pcVar21[lVar31] != '\0') {
      *(undefined4 *)(lVar16 + lVar43 * 4) =
           *(undefined4 *)(lVar27 * lVar47 + lVar36 * 4 + lVar15 + 8 + lVar43 * 4);
      uVar54 = uVar54 & 0xffffffff;
      goto LAB_002a771f;
    }
    lVar26 = lVar12 + 0x400000000 >> 0x20;
    if (pcVar21[lVar26] == '\0') {
      uVar6 = TTA::NewLabel();
      *(uint *)(lVar11 + lVar15 + 8 + lVar43 * 4) = uVar6;
      local_138 = uVar54;
      goto LAB_002a6775;
    }
    *(uint *)(lVar11 + lVar15 + 8 + lVar43 * 4) = puVar10[lVar26];
    uVar54 = uVar54 & 0xffffffff;
    goto LAB_002a6e39;
  }
  if (*(char *)(lVar24 + lVar43) == '\0') {
    uVar54 = (ulong)(iVar23 + iVar41 + 2);
    *(undefined4 *)(lVar11 + lVar15 + 8 + lVar43 * 4) = *(undefined4 *)((long)puVar53 + lVar17);
    goto LAB_002a79e2;
  }
  if (*(char *)(lVar31 + 3 + lVar43) == '\0') {
    if (*(char *)(lVar31 + 4 + lVar43) != '\0') {
      uVar54 = (ulong)(iVar41 + 2) + lVar43;
      lVar26 = lVar33 * lVar47 + lVar36 + lVar51;
      if (*(char *)(lVar43 + 3 + lVar26) != '\0') {
        if (*(char *)(lVar43 + 2 + lVar26) != '\0') {
          if (pcVar21[lVar18] != '\0') {
            cVar14 = pcVar21[lVar18 + (1 - lVar33)];
            goto LAB_002a8af7;
          }
LAB_002a8f68:
          uVar6 = TTA::Merge(*(uint *)(lVar27 * lVar47 + lVar36 * 4 + lVar15 + 8 + lVar43 * 4),
                             puVar53[lVar18]);
LAB_002a93b7:
          *(uint *)(lVar16 + lVar43 * 4) = uVar6;
          goto LAB_002a93bb;
        }
        goto LAB_002a8bbe;
      }
      goto LAB_002a8b1b;
    }
    goto LAB_002a87ba;
  }
  uVar54 = (ulong)(iVar41 + 2) + lVar43;
  if (*(char *)(lVar43 + 2 + lVar33 * lVar47 + lVar36 + lVar51) == '\0') {
    uVar6 = TTA::Merge(*(uint *)(lVar27 * lVar47 + lVar36 * 4 + lVar15 + 8 + lVar43 * 4),
                       *(uint *)((long)puVar53 + lVar17));
    *(uint *)(lVar16 + lVar43 * 4) = uVar6;
    uVar54 = uVar54 & 0xffffffff;
  }
  else {
    if (pcVar21[lVar18] == '\0') {
      uVar6 = TTA::Merge(*(uint *)(lVar27 * lVar47 + lVar36 * 4 + lVar15 + 8 + lVar43 * 4),
                         puVar53[lVar18]);
    }
    else {
      if (pcVar21[lVar18 + (1 - lVar33)] != '\0') {
        *(uint *)(lVar11 + lVar15 + 8 + lVar43 * 4) = puVar10[lVar18];
        goto LAB_002a771f;
      }
      uVar6 = TTA::Merge(puVar10[lVar18],
                         *(uint *)(lVar27 * lVar47 + lVar36 * 4 + lVar15 + 8 + lVar43 * 4));
    }
    *(uint *)(lVar16 + lVar43 * 4) = uVar6;
  }
LAB_002a771f:
  iVar41 = (int)uVar54;
  lVar28 = (long)iVar41;
  lVar24 = lVar28 << 0x20;
  lVar25 = lVar33 * lVar44 + lVar28;
  lVar36 = lVar33 * lVar47 + lVar28;
  lVar43 = lVar33 * lVar46 + lVar28;
  lVar11 = lVar51 + lVar43;
  lVar12 = lVar51 + 3 + lVar52 + lVar28;
  lVar31 = lVar48 + lVar28 * 4;
  lVar18 = lVar15 + lVar31 + 8;
  lVar30 = lVar27 * lVar47 + lVar28 * 4;
  lVar16 = lVar30 + lVar15;
  lVar17 = lVar16 + 8;
  lVar26 = 0;
  lVar22 = 0;
  do {
    uVar34 = lVar28 + lVar22 + 2;
    lVar45 = lVar24 >> 0x1e;
    if (lVar35 <= (long)uVar34) {
      uVar54 = (ulong)(iVar41 + 2) + lVar22;
      if (iVar39 < (int)uVar54) {
        uVar54 = uVar54 & 0xffffffff;
        goto LAB_002a78fe;
      }
      uVar34 = uVar34 & 0xffffffff;
      if (*(char *)(lVar40 + uVar34) != '\0') {
        lVar24 = lVar24 >> 0x20;
        if (pcVar21[lVar24 + 3] == '\0') goto LAB_002a8310;
        if (pcVar21[uVar34] != '\0') goto LAB_002a7e20;
        if (pcVar21[uVar34 - lVar33] == '\0') {
          uVar6 = puVar10[uVar34];
          uVar7 = puVar53[lVar24];
          goto LAB_002a96da;
        }
        uVar6 = puVar10[lVar24];
        goto LAB_002a96fe;
      }
      uVar54 = (ulong)(uint)(iVar41 + 3 + (int)lVar22);
      if (pcVar9[uVar34] == '\0') {
        if (*(char *)(lVar40 + uVar54) == '\0') goto LAB_002a9279;
        if (pcVar21[uVar54] != '\0') goto LAB_002a7e20;
        cVar14 = pcVar21[uVar34];
        goto joined_r0x002a6dd5;
      }
      if ((*(char *)(lVar40 + uVar54) == '\0') || (pcVar21[uVar54] == '\0')) goto LAB_002a8681;
      if (pcVar21[uVar34] != '\0') goto LAB_002a7e20;
      if (pcVar21[uVar34 - lVar33] == '\0') goto LAB_002a6d38;
      uVar6 = *(uint *)((long)puVar10 + lVar45);
      goto LAB_002a96fe;
    }
    if (*(char *)(lVar12 + -1 + lVar22) != '\0') {
      uVar54 = (ulong)(iVar41 + 2) + lVar22;
      lVar26 = lVar24 + 0x300000000 >> 0x20;
      if (pcVar21[lVar26] != '\0') {
        local_138 = uVar54;
        if (*(char *)(lVar22 + 2 + lVar43 + lVar51) == '\0') {
          if (*(char *)(lVar22 + 2 + lVar36 + lVar51) != '\0') {
            *(undefined4 *)(lVar31 + lVar15 + 8 + lVar22 * 4) =
                 *(undefined4 *)((long)puVar10 + lVar45);
            goto LAB_002aab14;
          }
          uVar6 = TTA::Merge(*(uint *)(lVar17 + lVar22 * 4),*(uint *)((long)puVar53 + lVar45));
        }
        else {
          uVar6 = *(uint *)(lVar17 + lVar22 * 4);
        }
        *(uint *)(lVar18 + lVar22 * 4) = uVar6;
        goto LAB_002aab14;
      }
      if (*(char *)(lVar40 + lVar26) == '\0') {
        uVar6 = *(uint *)((long)puVar53 + lVar45);
        iVar41 = (int)uVar54;
        goto LAB_002ab0db;
      }
      lVar11 = lVar24 + 0x400000000 >> 0x20;
      if (pcVar21[lVar11] == '\0') {
        uVar6 = *(uint *)((long)puVar53 + lVar45);
        local_138 = uVar54 & 0xffffffff;
        goto LAB_002a86fa;
      }
      if (pcVar21[lVar26 - lVar33] == '\0') {
        uVar6 = TTA::Merge(puVar10[lVar11],*(uint *)((long)puVar53 + lVar45));
LAB_002a940c:
        *(uint *)(lVar31 + lVar15 + 8 + lVar22 * 4) = uVar6;
      }
      else {
        if (*(char *)(lVar22 + 2 + lVar43 + lVar51) == '\0') {
          if (*(char *)(lVar22 + 2 + lVar36 + lVar51) != '\0') {
            uVar6 = *(uint *)((long)puVar10 + lVar45);
            goto LAB_002a940c;
          }
          uVar6 = TTA::Merge(*(uint *)(lVar17 + lVar22 * 4),*(uint *)((long)puVar53 + lVar45));
        }
        else {
          uVar6 = *(uint *)(lVar17 + lVar22 * 4);
        }
        *(uint *)(lVar18 + lVar22 * 4) = uVar6;
      }
      goto LAB_002a6e39;
    }
    cVar14 = *(char *)(lVar12 + lVar22);
    if (*(char *)(lVar51 + lVar25 + 2 + lVar22) == '\0') {
      if (cVar14 == '\0') {
        uVar54 = (ulong)(iVar41 + 2) + lVar22;
        if (*(char *)(lVar22 + 3 + lVar25 + lVar51) != '\0') {
          uVar6 = TTA::NewLabel();
          *(uint *)(lVar31 + lVar15 + 8 + lVar22 * 4) = uVar6;
          goto LAB_002a5a15;
        }
        lVar26 = lVar26 + lVar31 + lVar15;
        goto LAB_002ac0db;
      }
      if (*(char *)(lVar11 + 3 + lVar22) == '\0') break;
LAB_002a784a:
      uVar6 = *(uint *)(lVar17 + lVar22 * 4);
    }
    else {
      if (cVar14 == '\0') {
        uVar54 = (ulong)(iVar41 + (int)lVar22 + 2);
        *(undefined4 *)(lVar31 + lVar15 + 8 + lVar22 * 4) = *(undefined4 *)((long)puVar53 + lVar45);
        goto LAB_002a79e2;
      }
      if (*(char *)(lVar11 + 3 + lVar22) == '\0') {
        uVar54 = (ulong)(iVar41 + 2) + lVar22;
        lVar26 = lVar24 + 0x400000000 >> 0x20;
        if (pcVar21[lVar26] == '\0') {
          uVar6 = *(uint *)((long)puVar53 + lVar45);
          local_138 = uVar54 & 0xffffffff;
          goto LAB_002a86fa;
        }
        if (*(char *)(lVar22 + 3 + lVar36 + lVar51) == '\0') {
          uVar6 = TTA::Merge(puVar10[lVar26],*(uint *)((long)puVar53 + lVar45));
          *(uint *)(lVar31 + lVar15 + 8 + lVar22 * 4) = uVar6;
        }
        else if (*(char *)(lVar22 + 2 + lVar43 + lVar51) == '\0') {
          if (*(char *)(lVar22 + 2 + lVar36 + lVar51) != '\0') {
            uVar6 = *(uint *)((long)puVar10 + lVar45);
            goto LAB_002a940c;
          }
          uVar6 = TTA::Merge(*(uint *)(lVar17 + lVar22 * 4),*(uint *)((long)puVar53 + lVar45));
          *(uint *)(lVar18 + lVar22 * 4) = uVar6;
        }
        else {
          *(undefined4 *)(lVar18 + lVar22 * 4) = *(undefined4 *)(lVar17 + lVar22 * 4);
        }
        goto LAB_002a6e39;
      }
      if (*(char *)(lVar11 + 2 + lVar22) != '\0') goto LAB_002a784a;
      if (*(char *)(lVar36 + lVar51 + 2 + lVar22) == '\0') {
        uVar6 = TTA::Merge(*(uint *)(lVar17 + lVar22 * 4),*(uint *)(lVar15 + lVar31 + lVar22 * 4));
      }
      else {
        uVar6 = *(uint *)(lVar16 + lVar22 * 4);
      }
    }
    *(uint *)(lVar18 + lVar22 * 4) = uVar6;
    lVar24 = lVar24 + 0x200000000;
    lVar22 = lVar22 + 2;
    lVar26 = lVar26 + 8;
  } while( true );
  local_138 = (ulong)(iVar41 + 2) + lVar22;
  lVar26 = lVar24 + 0x400000000 >> 0x20;
  cVar14 = *(char *)(lVar22 + 2 + lVar43 + lVar51);
  if (pcVar21[lVar26] == '\0') {
    if (cVar14 != '\0') {
      *(undefined4 *)(lVar18 + lVar22 * 4) = *(undefined4 *)(lVar17 + lVar22 * 4);
LAB_002a7264:
      lVar26 = (long)(int)local_138;
      uVar54 = lVar26 + 2;
      iVar41 = (int)uVar54;
      if (iVar41 < iVar39) {
        uVar34 = uVar54;
        if (*(char *)(lVar40 + uVar54) != '\0') {
          if (pcVar21[lVar26 + 3] != '\0') {
            local_138 = uVar54;
            if (pcVar21[uVar54 - lVar33] == '\0') {
              uVar6 = puVar10[lVar26 + 2];
              uVar7 = puVar53[lVar26];
            }
            else {
              uVar6 = puVar10[lVar26];
              if (pcVar21[lVar26 + (1 - lVar33)] != '\0') {
                puVar53[lVar26 + 2] = uVar6;
                goto LAB_002aab14;
              }
              uVar7 = puVar10[lVar26 + 2];
            }
            uVar6 = TTA::Merge(uVar6,uVar7);
            puVar53[lVar26 + 2] = uVar6;
            goto LAB_002aab14;
          }
          if (*(char *)(lVar40 + 3 + lVar26) == '\0') {
            uVar6 = puVar53[lVar26];
            goto LAB_002ab0db;
          }
          if (pcVar21[lVar26 + 4] != '\0') {
            if (pcVar21[lVar26 + (3 - lVar33)] == '\0') {
              uVar6 = TTA::Merge(puVar10[lVar26 + 4],puVar53[lVar26]);
              goto LAB_002a769a;
            }
            cVar14 = pcVar21[uVar54 - lVar33];
            goto joined_r0x002a73d9;
          }
          goto LAB_002a758d;
        }
        cVar14 = *(char *)(lVar26 + 3 + lVar40);
        if (pcVar9[lVar26 + 2] != '\0') goto code_r0x002a7347;
        if (cVar14 == '\0') {
          if (pcVar9[lVar26 + 3] != '\0') {
            uVar6 = TTA::NewLabel();
            puVar53[lVar26 + 2] = uVar6;
            goto LAB_002a5a15;
          }
          puVar13 = puVar53 + uVar54;
          goto LAB_002a50e1;
        }
        if (pcVar21[lVar26 + 3] != '\0') {
          puVar53[lVar26 + 2] = puVar10[lVar26 + 2];
          goto LAB_002a771f;
        }
        if (pcVar21[lVar26 + 4] == '\0') {
          uVar6 = TTA::NewLabel();
          puVar53[lVar26 + 2] = uVar6;
          local_138 = uVar54 & 0xffffffff;
          goto LAB_002a6775;
        }
        uVar6 = puVar10[lVar26 + 4];
LAB_002a769a:
        puVar53[lVar26 + 2] = uVar6;
        goto LAB_002a6e39;
      }
      if (iVar39 < iVar41) goto LAB_002a78fe;
      uVar54 = uVar54 & 0xffffffff;
      if (*(char *)(lVar40 + uVar54) == '\0') {
        uVar34 = (ulong)((int)local_138 + 3);
        if (pcVar9[uVar54] == '\0') {
          if (*(char *)(lVar40 + uVar34) == '\0') {
            if (pcVar9[uVar34] == '\0') {
              puVar53[uVar54] = 0;
              goto LAB_002a4ee3;
            }
LAB_002a76bb:
            uVar6 = TTA::NewLabel();
          }
          else {
            if (pcVar21[uVar34] == '\0') goto LAB_002a76bb;
            uVar6 = puVar10[uVar54];
          }
          puVar53[uVar54] = uVar6;
          goto LAB_002a4ee3;
        }
        if ((*(char *)(lVar40 + uVar34) != '\0') && (pcVar21[uVar34] != '\0')) {
          if (pcVar21[uVar54 - lVar33] == '\0') {
            uVar6 = TTA::Merge(puVar10[uVar54],puVar53[lVar26]);
            puVar53[uVar54] = uVar6;
          }
          else if (pcVar21[lVar26 + (1 - lVar33)] == '\0') {
            uVar6 = TTA::Merge(puVar10[lVar26],puVar10[uVar54]);
            puVar53[uVar54] = uVar6;
          }
          else {
            puVar53[uVar54] = puVar10[lVar26];
          }
          goto LAB_002a4ee3;
        }
      }
      else if (pcVar21[lVar26 + 3] != '\0') {
        if (pcVar21[uVar54 - lVar33] == '\0') {
          uVar6 = TTA::Merge(puVar10[uVar54],puVar53[lVar26]);
          puVar53[uVar54] = uVar6;
        }
        else if (pcVar21[lVar26 + (1 - lVar33)] == '\0') {
          uVar6 = TTA::Merge(puVar10[lVar26],puVar10[uVar54]);
          puVar53[uVar54] = uVar6;
        }
        else {
          puVar53[uVar54] = puVar10[lVar26];
        }
        goto LAB_002a4ee3;
      }
      puVar53[uVar54] = puVar53[lVar26];
      goto LAB_002a4ee3;
    }
    uVar6 = TTA::NewLabel();
    *(uint *)(lVar31 + lVar15 + 8 + lVar22 * 4) = uVar6;
    local_138 = local_138 & 0xffffffff;
    goto LAB_002a6775;
  }
  uVar54 = local_138;
  if (cVar14 == '\0') {
    *(uint *)(lVar31 + lVar15 + 8 + lVar22 * 4) = puVar10[lVar26];
  }
  else {
    uVar6 = *(uint *)(lVar30 + lVar15 + 8 + lVar22 * 4);
    if (*(char *)(lVar22 + 3 + lVar36 + lVar51) == '\0') {
      uVar6 = TTA::Merge(uVar6,puVar10[lVar26]);
      *(uint *)(lVar31 + lVar15 + 8 + lVar22 * 4) = uVar6;
    }
    else {
      *(uint *)(lVar31 + lVar15 + 8 + lVar22 * 4) = uVar6;
    }
  }
  goto LAB_002a6e39;
code_r0x002a7347:
  if (cVar14 == '\0') {
    puVar53[lVar26 + 2] = puVar53[lVar26];
LAB_002a79e2:
    iVar41 = (int)uVar54;
    lVar30 = (long)iVar41;
    lVar36 = lVar30 << 0x20;
    lVar11 = lVar48 + lVar30 * 4;
    lVar31 = lVar11 + lVar15 + 8;
    lVar26 = lVar51 + lVar33 * lVar44 + lVar30;
    lVar24 = lVar51 + lVar52 + lVar30;
    lVar12 = 0;
    lVar43 = 0;
LAB_002a7a37:
    uVar34 = lVar30 + lVar43 + 2;
    lVar16 = lVar36 >> 0x20;
    lVar17 = lVar36 >> 0x1e;
    if ((long)uVar34 < lVar35) {
      if (*(char *)(lVar24 + 2 + lVar43) == '\0') {
        if (*(char *)(lVar26 + 2 + lVar43) != '\0') {
          if (*(char *)(lVar24 + 3 + lVar43) == '\0') goto code_r0x002a7a6a;
          local_138 = (ulong)(iVar41 + 2) + lVar43;
          lVar26 = lVar33 * lVar46 + lVar30 + lVar51;
          cVar14 = *(char *)(lVar43 + 3 + lVar26);
          uVar54 = local_138;
          if (pcVar9[lVar16 + 1] == '\0') {
            if (cVar14 == '\0') {
              lVar12 = lVar36 + 0x400000000 >> 0x20;
              cVar14 = *(char *)(lVar43 + 2 + lVar26);
              if (pcVar21[lVar12] == '\0') goto LAB_002a9207;
              if (cVar14 == '\0') goto LAB_002a8d3a;
              lVar26 = lVar27 * lVar47 + lVar30 * 4;
              cVar14 = *(char *)(lVar43 + 3 + lVar33 * lVar47 + lVar30 + lVar51);
              goto LAB_002a8661;
            }
            *(undefined4 *)(lVar31 + lVar43 * 4) =
                 *(undefined4 *)(lVar27 * lVar47 + lVar30 * 4 + lVar15 + 8 + lVar43 * 4);
            goto LAB_002a771f;
          }
          if (cVar14 != '\0') {
            uVar6 = TTA::Merge(*(uint *)(lVar27 * lVar47 + lVar30 * 4 + lVar15 + 8 + lVar43 * 4),
                               puVar53[lVar16]);
            *(uint *)(lVar31 + lVar43 * 4) = uVar6;
            goto LAB_002a771f;
          }
          lVar12 = lVar36 + 0x400000000 >> 0x20;
          if (pcVar21[lVar12] == '\0') {
            if (*(char *)(lVar43 + 2 + lVar26) == '\0') {
              uVar6 = puVar53[lVar16];
              goto LAB_002a966b;
            }
            uVar6 = *(uint *)(lVar27 * lVar47 + lVar30 * 4 + lVar15 + 8 + lVar43 * 4);
            uVar7 = puVar53[lVar16];
            goto LAB_002a8db0;
          }
          if (*(char *)(lVar43 + 3 + lVar33 * lVar47 + lVar30 + lVar51) == '\0') {
            if (*(char *)(lVar43 + 2 + lVar26) == '\0') {
              uVar6 = TTA::Merge(puVar10[lVar12],puVar53[lVar16]);
              *(uint *)(lVar11 + lVar15 + 8 + lVar43 * 4) = uVar6;
            }
            else {
              uVar6 = TTA::Merge(*(uint *)(lVar27 * lVar47 + lVar30 * 4 + lVar15 + 8 + lVar43 * 4),
                                 puVar10[lVar12]);
              uVar6 = TTA::Merge(uVar6,puVar53[lVar16]);
              *(uint *)(lVar31 + lVar43 * 4) = uVar6;
            }
          }
          else {
            uVar6 = TTA::Merge(*(uint *)(lVar27 * lVar47 + lVar30 * 4 + lVar15 + 8 + lVar43 * 4),
                               puVar53[lVar16]);
            *(uint *)(lVar31 + lVar43 * 4) = uVar6;
          }
          goto LAB_002a6e39;
        }
        local_138 = (ulong)(iVar41 + 2) + lVar43;
        lVar24 = lVar36 + 0x300000000 >> 0x20;
        if (*(char *)(lVar40 + lVar24) == '\0') {
          if (pcVar9[lVar24] != '\0') {
            uVar6 = TTA::NewLabel();
            goto LAB_002abac4;
          }
          lVar12 = lVar12 + lVar11 + lVar15;
          goto LAB_002a85b5;
        }
        if (pcVar21[lVar24] != '\0') {
          *(undefined4 *)(lVar31 + lVar43 * 4) =
               *(undefined4 *)(lVar27 * lVar47 + lVar30 * 4 + lVar15 + 8 + lVar43 * 4);
          uVar54 = local_138;
          goto LAB_002a771f;
        }
        lVar12 = lVar36 + 0x400000000 >> 0x20;
        cVar14 = *(char *)(lVar43 + 2 + lVar33 * lVar46 + lVar30 + lVar51);
        if (pcVar21[lVar12] == '\0') {
LAB_002a9207:
          if (cVar14 != '\0') goto LAB_002a9211;
          uVar6 = TTA::NewLabel();
          *(uint *)(lVar11 + lVar15 + 8 + lVar43 * 4) = uVar6;
          local_138 = local_138 & 0xffffffff;
          goto LAB_002a6775;
        }
        if (cVar14 == '\0') {
LAB_002a8d3a:
          uVar6 = puVar10[lVar12];
          goto LAB_002a8d50;
        }
        lVar26 = lVar27 * lVar47 + lVar30 * 4;
        cVar14 = pcVar21[lVar24 - lVar33];
LAB_002a8661:
        uVar6 = *(uint *)(lVar26 + lVar15 + 8 + lVar43 * 4);
        if (cVar14 != '\0') goto LAB_002a866c;
        uVar7 = puVar10[lVar12];
        goto LAB_002a90ff;
      }
      local_138 = (ulong)(iVar41 + 2) + lVar43;
      iVar41 = (int)local_138;
      lVar26 = lVar36 + 0x100000000 >> 0x20;
      lVar12 = lVar36 + 0x300000000 >> 0x20;
      uVar54 = local_138;
      if (pcVar9[lVar26] == '\0') {
        if (pcVar21[lVar12] != '\0') {
          if (*(char *)(lVar43 + 2 + lVar33 * lVar46 + lVar30 + lVar51) == '\0') {
            if (pcVar21[lVar26] != '\0') {
              uVar6 = *(uint *)((long)puVar10 + lVar17);
              if (*(char *)(lVar43 + 2 + lVar33 * lVar47 + lVar30 + lVar51) != '\0') {
                *(uint *)(lVar11 + lVar15 + 8 + lVar43 * 4) = uVar6;
                goto LAB_002aab14;
              }
              uVar7 = *(uint *)(lVar27 * lVar47 + lVar30 * 4 + lVar15 + 8 + lVar43 * 4);
              goto LAB_002a9917;
            }
            lVar26 = lVar27 * lVar47 + lVar30 * 4;
          }
          else {
            lVar26 = lVar27 * lVar47 + lVar30 * 4;
          }
          uVar6 = *(uint *)(lVar26 + lVar15 + 8 + lVar43 * 4);
          goto LAB_002a7fba;
        }
        if (*(char *)(lVar40 + lVar12) != '\0') {
          lVar36 = lVar36 + 0x400000000 >> 0x20;
          cVar14 = *(char *)(lVar43 + 2 + lVar33 * lVar46 + lVar30 + lVar51);
          if (pcVar21[lVar36] != '\0') {
            if (cVar14 == '\0') {
              if (pcVar21[lVar26] == '\0') {
                uVar6 = puVar10[lVar36];
LAB_002a8d50:
                *(uint *)(lVar11 + lVar15 + 8 + lVar43 * 4) = uVar6;
                uVar54 = local_138;
              }
              else if (pcVar21[lVar12 - lVar33] == '\0') {
                uVar6 = TTA::Merge(*(uint *)((long)puVar10 + lVar17),puVar10[lVar36]);
                *(uint *)(lVar11 + lVar15 + 8 + lVar43 * 4) = uVar6;
              }
              else if (*(char *)(lVar43 + 2 + lVar33 * lVar47 + lVar30 + lVar51) == '\0') {
                uVar6 = TTA::Merge(*(uint *)((long)puVar10 + lVar17),
                                   *(uint *)(lVar27 * lVar47 + lVar30 * 4 + lVar15 + 8 + lVar43 * 4)
                                  );
                *(uint *)(lVar31 + lVar43 * 4) = uVar6;
              }
              else {
                *(uint *)(lVar11 + lVar15 + 8 + lVar43 * 4) = *(uint *)((long)puVar10 + lVar17);
              }
            }
            else {
              uVar6 = *(uint *)(lVar27 * lVar47 + lVar30 * 4 + lVar15 + 8 + lVar43 * 4);
              if (pcVar21[lVar12 - lVar33] == '\0') {
                uVar7 = puVar10[lVar36];
LAB_002a90ff:
                uVar6 = TTA::Merge(uVar6,uVar7);
                *(uint *)(lVar11 + lVar15 + 8 + lVar43 * 4) = uVar6;
                uVar54 = local_138;
              }
              else {
LAB_002a866c:
                *(uint *)(lVar11 + lVar15 + 8 + lVar43 * 4) = uVar6;
                uVar54 = local_138;
              }
            }
            goto LAB_002a6e39;
          }
          if (cVar14 == '\0') {
            if (pcVar21[lVar26] == '\0') {
              uVar6 = TTA::NewLabel();
LAB_002ad6d5:
              *(uint *)(lVar11 + lVar15 + 8 + lVar43 * 4) = uVar6;
              local_138 = uVar54 & 0xffffffff;
            }
            else {
              *(undefined4 *)(lVar11 + lVar15 + 8 + lVar43 * 4) =
                   *(undefined4 *)((long)puVar10 + lVar17);
            }
            goto LAB_002a6775;
          }
LAB_002a9211:
          *(undefined4 *)(lVar31 + lVar43 * 4) =
               *(undefined4 *)(lVar27 * lVar47 + lVar30 * 4 + lVar15 + 8 + lVar43 * 4);
          goto LAB_002a7264;
        }
        if (*(char *)(lVar43 + 2 + lVar33 * lVar46 + lVar30 + lVar51) != '\0') {
          uVar6 = *(uint *)(lVar27 * lVar47 + lVar30 * 4 + lVar15 + 8 + lVar43 * 4);
          goto LAB_002a95fd;
        }
        puVar13 = puVar10;
        if (pcVar21[lVar26] == '\0') {
          uVar6 = TTA::NewLabel();
          goto LAB_002a9c38;
        }
      }
      else {
        if (pcVar21[lVar12] != '\0') {
          if (*(char *)(lVar43 + 2 + lVar33 * lVar46 + lVar30 + lVar51) == '\0') {
            if (pcVar21[lVar26] != '\0') {
              if (*(char *)(lVar43 + 2 + lVar33 * lVar47 + lVar30 + lVar51) == '\0') {
                uVar6 = TTA::Merge(*(uint *)((long)puVar10 + lVar17),
                                   *(uint *)(lVar27 * lVar47 + lVar30 * 4 + lVar15 + 8 + lVar43 * 4)
                                  );
                uVar6 = TTA::Merge(uVar6,puVar53[lVar16]);
                *(uint *)(lVar31 + lVar43 * 4) = uVar6;
                goto LAB_002aab14;
              }
              uVar6 = TTA::Merge(*(uint *)((long)puVar10 + lVar17),puVar53[lVar16]);
              *(uint *)(lVar11 + lVar15 + 8 + lVar43 * 4) = uVar6;
              goto LAB_002aab14;
            }
            uVar6 = *(uint *)(lVar27 * lVar47 + lVar30 * 4 + lVar15 + 8 + lVar43 * 4);
            uVar7 = *(uint *)((long)puVar53 + lVar17);
LAB_002a9917:
            uVar6 = TTA::Merge(uVar6,uVar7);
            *(uint *)(lVar31 + lVar43 * 4) = uVar6;
            goto LAB_002aab14;
          }
          uVar6 = TTA::Merge(*(uint *)(lVar27 * lVar47 + lVar30 * 4 + lVar15 + 8 + lVar43 * 4),
                             *(uint *)((long)puVar53 + lVar17));
LAB_002a7fba:
          *(uint *)(lVar31 + lVar43 * 4) = uVar6;
          goto LAB_002aab14;
        }
        if (*(char *)(lVar40 + lVar12) != '\0') {
          lVar36 = lVar36 + 0x400000000 >> 0x20;
          if (pcVar21[lVar36] != '\0') {
            if (*(char *)(lVar43 + 2 + lVar33 * lVar46 + lVar30 + lVar51) == '\0') {
              if (pcVar21[lVar26] == '\0') {
                uVar6 = TTA::Merge(puVar10[lVar36],*(uint *)((long)puVar53 + lVar17));
                *(uint *)(lVar11 + lVar15 + 8 + lVar43 * 4) = uVar6;
              }
              else if (pcVar21[lVar12 - lVar33] == '\0') {
                uVar6 = TTA::Merge(*(uint *)((long)puVar10 + lVar17),puVar10[lVar36]);
                uVar6 = TTA::Merge(uVar6,*(uint *)((long)puVar53 + lVar17));
                *(uint *)(lVar11 + lVar15 + 8 + lVar43 * 4) = uVar6;
              }
              else if (*(char *)(lVar43 + 2 + lVar33 * lVar47 + lVar30 + lVar51) == '\0') {
                uVar6 = TTA::Merge(*(uint *)((long)puVar10 + lVar17),
                                   *(uint *)(lVar27 * lVar47 + lVar30 * 4 + lVar15 + 8 + lVar43 * 4)
                                  );
                uVar6 = TTA::Merge(uVar6,puVar53[lVar16]);
                *(uint *)(lVar31 + lVar43 * 4) = uVar6;
              }
              else {
                uVar6 = TTA::Merge(*(uint *)((long)puVar10 + lVar17),puVar53[lVar16]);
                *(uint *)(lVar11 + lVar15 + 8 + lVar43 * 4) = uVar6;
              }
            }
            else {
              uVar6 = *(uint *)(lVar27 * lVar47 + lVar30 * 4 + lVar15 + 8 + lVar43 * 4);
              if (pcVar21[lVar12 - lVar33] == '\0') {
                uVar6 = TTA::Merge(uVar6,puVar10[lVar36]);
                uVar7 = *(uint *)((long)puVar53 + lVar17);
              }
              else {
                uVar7 = *(uint *)((long)puVar53 + lVar17);
              }
              uVar6 = TTA::Merge(uVar6,uVar7);
              *(uint *)(lVar11 + lVar15 + 8 + lVar43 * 4) = uVar6;
            }
            goto LAB_002a6e39;
          }
          if (pcVar21[lVar26] != '\0') {
            uVar6 = TTA::Merge(*(uint *)((long)puVar10 + lVar17),*(uint *)((long)puVar53 + lVar17));
LAB_002ac09c:
            local_138 = local_138 & 0xffffffff;
            goto LAB_002a86fa;
          }
          if (*(char *)(lVar43 + 2 + lVar33 * lVar46 + lVar30 + lVar51) == '\0') {
            uVar6 = *(uint *)((long)puVar53 + lVar17);
LAB_002a966b:
            *(uint *)(lVar11 + lVar15 + 8 + lVar43 * 4) = uVar6;
            goto LAB_002a6775;
          }
          uVar6 = *(uint *)(lVar27 * lVar47 + lVar30 * 4 + lVar15 + 8 + lVar43 * 4);
          uVar7 = *(uint *)((long)puVar53 + lVar17);
LAB_002a8db0:
          uVar6 = TTA::Merge(uVar6,uVar7);
          *(uint *)(lVar31 + lVar43 * 4) = uVar6;
          local_138 = local_138 & 0xffffffff;
          goto LAB_002a7264;
        }
        if (pcVar21[lVar26] != '\0') {
          uVar6 = TTA::Merge(*(uint *)((long)puVar10 + lVar17),*(uint *)((long)puVar53 + lVar17));
          goto LAB_002ab0db;
        }
        puVar13 = puVar53;
        if (*(char *)(lVar43 + 2 + lVar33 * lVar46 + lVar30 + lVar51) != '\0') {
          uVar6 = TTA::Merge(*(uint *)(lVar27 * lVar47 + lVar30 * 4 + lVar15 + 8 + lVar43 * 4),
                             *(uint *)((long)puVar53 + lVar17));
LAB_002a95fd:
          *(uint *)(lVar31 + lVar43 * 4) = uVar6;
          goto LAB_002aa418;
        }
      }
      uVar6 = *(uint *)((long)puVar13 + lVar17);
LAB_002a9c38:
      *(uint *)(lVar11 + lVar15 + 8 + lVar43 * 4) = uVar6;
LAB_002a9e42:
      lVar18 = (long)iVar41;
      lVar17 = lVar18 << 0x20;
      lVar11 = lVar48 + lVar18 * 4;
      lVar31 = lVar15 + lVar11;
      lVar24 = lVar31 + 8;
      lVar30 = lVar51 + lVar52 + lVar18;
      lVar16 = lVar30 + 3;
      lVar12 = lVar33 * lVar46 + lVar18;
      lVar22 = lVar51 + lVar12 + 2;
      lVar36 = lVar33 * lVar44 + lVar18;
      lVar26 = 0;
      lVar43 = 0;
      do {
        lVar25 = lVar17 >> 0x20;
        iVar23 = (int)lVar43;
        if (lVar35 <= lVar43 + lVar18 + 2) {
          uVar6 = iVar41 + iVar23 + 2;
          uVar34 = (ulong)uVar6;
          if ((int)uVar6 <= iVar39) {
            if (*(char *)(lVar40 + uVar34) == '\0') {
              uVar54 = (ulong)(uint)(iVar41 + 3 + iVar23);
              if (pcVar9[uVar34] != '\0') {
                cVar14 = pcVar9[lVar25 + 1];
                if (*(char *)(lVar40 + uVar54) == '\0') goto joined_r0x002ac9a5;
                cVar2 = pcVar21[uVar54];
                goto joined_r0x002ab784;
              }
              if (*(char *)(lVar40 + uVar54) != '\0') {
                cVar14 = pcVar21[uVar54];
joined_r0x002ac28a:
                if (cVar14 == '\0') {
                  cVar14 = pcVar21[uVar34];
                  goto joined_r0x002acfa1;
                }
                goto LAB_002acfa3;
              }
              cVar14 = pcVar9[uVar54];
              goto joined_r0x002a9b9a;
            }
            cVar14 = pcVar9[lVar25 + 1];
            cVar2 = pcVar21[lVar25 + 3];
joined_r0x002ab784:
            if (cVar14 != '\0') {
              if ((cVar2 != '\0') || (pcVar21[uVar34] != '\0')) goto LAB_002ab792;
LAB_002ac9a7:
              uVar6 = puVar53[lVar25];
              goto LAB_002ac9cc;
            }
            if (cVar2 != '\0') goto LAB_002abccb;
            cVar14 = pcVar21[uVar34];
            goto joined_r0x002acfa1;
          }
          if (*(char *)(lVar40 + uVar34) == '\0') {
            if (pcVar9[uVar34] == '\0') {
              puVar53[uVar34] = 0;
              goto LAB_002a4ee3;
            }
            cVar14 = pcVar9[lVar25 + 1];
joined_r0x002ac9a5:
            if (cVar14 != '\0') goto LAB_002ac9a7;
LAB_002ac9ad:
            uVar6 = TTA::NewLabel();
          }
          else if (pcVar9[lVar25 + 1] == '\0') {
            if (pcVar21[uVar34] == '\0') goto LAB_002ac9ad;
LAB_002abccb:
            uVar6 = puVar10[uVar34];
          }
          else {
            if (pcVar21[uVar34] == '\0') goto LAB_002ac9a7;
LAB_002ab792:
            uVar6 = TTA::Merge(puVar10[uVar34],puVar53[lVar25]);
          }
LAB_002ac9cc:
          puVar53[uVar34] = uVar6;
          goto LAB_002a4ee3;
        }
        if (*(char *)(lVar30 + 2 + lVar43) == '\0') {
          local_138 = (ulong)(iVar41 + 2) + lVar43;
          lVar31 = lVar17 + 0x300000000 >> 0x20;
          uVar54 = local_138;
          if (*(char *)(lVar43 + 2 + lVar36 + lVar51) == '\0') {
            if (*(char *)(lVar40 + lVar31) == '\0') {
              if (pcVar9[lVar31] != '\0') {
                uVar6 = TTA::NewLabel();
                *(uint *)(lVar11 + lVar15 + 8 + lVar43 * 4) = uVar6;
                goto LAB_002a5a15;
              }
              lVar26 = lVar26 + lVar11 + lVar15;
              goto LAB_002ac0db;
            }
            if (pcVar21[lVar31] != '\0') {
LAB_002ab992:
              *(undefined4 *)(lVar24 + lVar43 * 4) =
                   *(undefined4 *)(lVar27 * lVar47 + lVar18 * 4 + lVar15 + 8 + lVar43 * 4);
              goto LAB_002a771f;
            }
            lVar26 = lVar17 + 0x400000000 >> 0x20;
            cVar2 = pcVar21[lVar26];
            cVar14 = *(char *)(lVar43 + 2 + lVar12 + lVar51);
          }
          else {
            if (*(char *)(lVar40 + lVar31) == '\0') {
              if (pcVar9[lVar25 + 1] == '\0') {
                uVar6 = TTA::NewLabel();
              }
              else {
                uVar6 = puVar53[lVar25];
              }
              *(uint *)(lVar11 + lVar15 + 8 + lVar43 * 4) = uVar6;
              goto LAB_002a79e2;
            }
            if (pcVar9[lVar25 + 1] != '\0') {
              if (pcVar21[lVar31] != '\0') {
                uVar6 = TTA::Merge(*(uint *)(lVar27 * lVar47 + lVar18 * 4 + lVar15 + 8 + lVar43 * 4)
                                   ,puVar53[lVar25]);
                *(uint *)(lVar24 + lVar43 * 4) = uVar6;
                goto LAB_002a771f;
              }
              lVar26 = lVar17 + 0x400000000 >> 0x20;
              if (pcVar21[lVar26] != '\0') {
                if (pcVar21[lVar31 - lVar33] == '\0') {
                  if (*(char *)(lVar43 + 2 + lVar12 + lVar51) == '\0') {
                    uVar6 = TTA::Merge(puVar10[lVar26],puVar53[lVar25]);
                    *(uint *)(lVar11 + lVar15 + 8 + lVar43 * 4) = uVar6;
                  }
                  else {
                    uVar6 = TTA::Merge(*(uint *)(lVar27 * lVar47 + lVar18 * 4 + lVar15 + 8 +
                                                lVar43 * 4),puVar10[lVar26]);
                    uVar6 = TTA::Merge(uVar6,puVar53[lVar25]);
                    *(uint *)(lVar24 + lVar43 * 4) = uVar6;
                  }
                }
                else {
                  uVar6 = TTA::Merge(*(uint *)(lVar27 * lVar47 + lVar18 * 4 + lVar15 + 8 +
                                              lVar43 * 4),puVar53[lVar25]);
                  *(uint *)(lVar24 + lVar43 * 4) = uVar6;
                }
                goto LAB_002a6e39;
              }
              if (*(char *)(lVar43 + 2 + lVar12 + lVar51) == '\0') {
                *(uint *)(lVar11 + lVar15 + 8 + lVar43 * 4) = puVar53[lVar25];
                goto LAB_002a6775;
              }
              uVar6 = TTA::Merge(*(uint *)(lVar27 * lVar47 + lVar18 * 4 + lVar15 + 8 + lVar43 * 4),
                                 puVar53[lVar25]);
              *(uint *)(lVar24 + lVar43 * 4) = uVar6;
              local_138 = local_138 & 0xffffffff;
              goto LAB_002a7264;
            }
            if (pcVar21[lVar31] != '\0') goto LAB_002ab992;
            lVar26 = lVar17 + 0x400000000 >> 0x20;
            cVar2 = pcVar21[lVar26];
            cVar14 = *(char *)(lVar43 + 2 + lVar12 + lVar51);
          }
          if (cVar2 != '\0') {
            if (cVar14 == '\0') {
LAB_002abd1f:
              *(uint *)(lVar11 + lVar15 + 8 + lVar43 * 4) = puVar10[lVar26];
              uVar54 = local_138;
            }
            else {
              lVar30 = lVar27 * lVar47 + lVar18 * 4;
              cVar14 = pcVar21[lVar31 - lVar33];
LAB_002aa3c1:
              uVar6 = *(uint *)(lVar30 + lVar15 + 8 + lVar43 * 4);
              uVar54 = local_138;
              if (cVar14 == '\0') {
                uVar6 = TTA::Merge(uVar6,puVar10[lVar26]);
                *(uint *)(lVar11 + lVar15 + 8 + lVar43 * 4) = uVar6;
              }
              else {
                *(uint *)(lVar11 + lVar15 + 8 + lVar43 * 4) = uVar6;
              }
            }
            goto LAB_002a6e39;
          }
          if (cVar14 == '\0') {
            uVar6 = TTA::NewLabel();
            *(uint *)(lVar11 + lVar15 + 8 + lVar43 * 4) = uVar6;
            local_138 = local_138 & 0xffffffff;
            goto LAB_002a6775;
          }
          *(undefined4 *)(lVar24 + lVar43 * 4) =
               *(undefined4 *)(lVar27 * lVar47 + lVar18 * 4 + lVar15 + 8 + lVar43 * 4);
          goto LAB_002a7264;
        }
        cVar14 = *(char *)(lVar51 + lVar12 + 3 + lVar43);
        if (*(char *)(lVar51 + lVar36 + 1 + lVar43) == '\0') {
          if (cVar14 != '\0') {
            local_138 = (ulong)(iVar41 + iVar23 + 2);
            *(undefined4 *)(lVar24 + lVar43 * 4) =
                 *(undefined4 *)(lVar27 * lVar47 + lVar18 * 4 + lVar15 + 8 + lVar43 * 4);
            goto LAB_002aab14;
          }
          if (*(char *)(lVar16 + lVar43) != '\0') {
            local_138 = (ulong)(iVar41 + 2) + lVar43;
            lVar26 = lVar17 + 0x400000000 >> 0x20;
            cVar14 = *(char *)(lVar43 + 2 + lVar12 + lVar51);
            if (pcVar21[lVar26] != '\0') {
              if (cVar14 == '\0') goto LAB_002abd1f;
              lVar30 = lVar27 * lVar47 + lVar18 * 4;
              cVar14 = *(char *)(lVar43 + 3 + lVar33 * lVar47 + lVar18 + lVar51);
              goto LAB_002aa3c1;
            }
            if (cVar14 != '\0') {
              *(undefined4 *)(lVar24 + lVar43 * 4) =
                   *(undefined4 *)(lVar27 * lVar47 + lVar18 * 4 + lVar15 + 8 + lVar43 * 4);
              goto LAB_002a7264;
            }
            uVar6 = TTA::NewLabel();
            *(uint *)(lVar11 + lVar15 + 8 + lVar43 * 4) = uVar6;
            local_138 = local_138 & 0xffffffff;
            goto LAB_002a6775;
          }
          if (*(char *)(lVar22 + lVar43) != '\0') {
            local_138 = (ulong)(iVar41 + iVar23 + 2);
            *(undefined4 *)(lVar24 + lVar43 * 4) =
                 *(undefined4 *)(lVar27 * lVar47 + lVar18 * 4 + lVar15 + 8 + lVar43 * 4);
            goto LAB_002aa418;
          }
          uVar6 = TTA::NewLabel();
        }
        else {
          if (cVar14 != '\0') {
            local_138 = (ulong)(iVar41 + iVar23 + 2);
            uVar6 = TTA::Merge(*(uint *)(lVar27 * lVar47 + lVar18 * 4 + lVar15 + 8 + lVar43 * 4),
                               *(uint *)(lVar31 + lVar43 * 4));
            *(uint *)(lVar24 + lVar43 * 4) = uVar6;
            goto LAB_002aab14;
          }
          if (*(char *)(lVar16 + lVar43) != '\0') {
            local_138 = (ulong)(iVar41 + 2) + lVar43;
            lVar26 = lVar17 + 0x400000000 >> 0x20;
            if (pcVar21[lVar26] == '\0') {
              if (*(char *)(lVar43 + 2 + lVar12 + lVar51) == '\0') {
                *(undefined4 *)(lVar11 + lVar15 + 8 + lVar43 * 4) =
                     *(undefined4 *)(lVar11 + lVar15 + lVar43 * 4);
                goto LAB_002a6775;
              }
              uVar6 = TTA::Merge(*(uint *)(lVar27 * lVar47 + lVar18 * 4 + lVar15 + 8 + lVar43 * 4),
                                 *(uint *)(lVar31 + lVar43 * 4));
              *(uint *)(lVar24 + lVar43 * 4) = uVar6;
              goto LAB_002a7264;
            }
            uVar54 = local_138;
            if (*(char *)(lVar43 + 3 + lVar33 * lVar47 + lVar18 + lVar51) == '\0') {
              if (*(char *)(lVar43 + 2 + lVar12 + lVar51) == '\0') {
                uVar6 = TTA::Merge(puVar10[lVar26],*(uint *)(lVar11 + lVar15 + lVar43 * 4));
                *(uint *)(lVar11 + lVar15 + 8 + lVar43 * 4) = uVar6;
              }
              else {
                uVar6 = TTA::Merge(*(uint *)(lVar27 * lVar47 + lVar18 * 4 + lVar15 + 8 + lVar43 * 4)
                                   ,puVar10[lVar26]);
                uVar6 = TTA::Merge(uVar6,*(uint *)(lVar31 + lVar43 * 4));
                *(uint *)(lVar24 + lVar43 * 4) = uVar6;
              }
            }
            else {
              uVar6 = TTA::Merge(*(uint *)(lVar27 * lVar47 + lVar18 * 4 + lVar15 + 8 + lVar43 * 4),
                                 *(uint *)(lVar31 + lVar43 * 4));
              *(uint *)(lVar24 + lVar43 * 4) = uVar6;
            }
            goto LAB_002a6e39;
          }
          if (*(char *)(lVar22 + lVar43) != '\0') goto LAB_002aa1d1;
          uVar6 = *(uint *)(lVar31 + lVar43 * 4);
        }
        *(uint *)(lVar24 + lVar43 * 4) = uVar6;
        lVar17 = lVar17 + 0x200000000;
        lVar43 = lVar43 + 2;
        lVar26 = lVar26 + 8;
      } while( true );
    }
    iVar23 = (int)lVar43;
    uVar6 = iVar41 + iVar23 + 2;
    uVar34 = (ulong)uVar6;
    if (iVar39 < (int)uVar6) {
      if (*(char *)(lVar40 + uVar34) != '\0') {
        uVar6 = iVar41 + iVar23 + 1;
        if (pcVar9[uVar6] == '\0') {
          if (pcVar21[uVar34] != '\0') goto LAB_002ad3d1;
          if (pcVar21[uVar6] != '\0') goto LAB_002aad8e;
          goto LAB_002acf63;
        }
        if (pcVar21[uVar6] == '\0') {
          if (pcVar21[uVar34] == '\0') goto LAB_002ac238;
LAB_002a8e83:
          uVar6 = puVar10[uVar34];
          lVar17 = lVar36 >> 0x1e;
        }
        else {
          uVar6 = *(uint *)((long)puVar10 + lVar17);
        }
        uVar7 = *(uint *)((long)puVar53 + lVar17);
        goto LAB_002a9ddc;
      }
      if (pcVar9[uVar34] == '\0') goto LAB_002ab6bf;
      cVar2 = pcVar9[lVar16 + 1];
joined_r0x002ac939:
      if (cVar2 == '\0') goto LAB_002acf63;
LAB_002a9e34:
      uVar6 = puVar53[lVar16];
      goto LAB_002ad3d9;
    }
    if (*(char *)(lVar40 + uVar34) == '\0') {
      uVar54 = (ulong)(uint)(iVar41 + 3 + iVar23);
      cVar14 = *(char *)(lVar40 + uVar54);
      if (pcVar9[uVar34] == '\0') goto LAB_002abd0f;
      cVar2 = pcVar9[lVar16 + 1];
      if (cVar14 == '\0') goto joined_r0x002ac939;
      cVar14 = pcVar21[uVar54];
      if (cVar2 == '\0') goto joined_r0x002ad3cb;
      if (cVar14 != '\0') goto LAB_002a9dca;
      cVar14 = pcVar21[uVar34];
joined_r0x002a840e:
      if (cVar14 != '\0') goto LAB_002a9dca;
      goto LAB_002a9e34;
    }
    uVar6 = iVar41 + iVar23 + 1;
    if (pcVar9[uVar6] != '\0') {
      if (pcVar21[lVar16 + 3] != '\0') {
        if (pcVar21[uVar34] == '\0') {
          if (pcVar21[uVar6] == '\0') {
            uVar6 = puVar10[uVar34];
            uVar7 = puVar53[lVar16];
LAB_002a9a3b:
            uVar6 = TTA::Merge(uVar6,uVar7);
            puVar53[uVar34] = uVar6;
          }
          else {
            uVar6 = puVar10[lVar16];
            if (pcVar21[uVar34 - lVar33] == '\0') {
              uVar6 = TTA::Merge(uVar6,puVar10[uVar34]);
              uVar7 = puVar53[lVar16];
            }
            else {
LAB_002a9d8b:
              uVar7 = puVar53[lVar16];
            }
LAB_002ad360:
            uVar6 = TTA::Merge(uVar6,uVar7);
            puVar53[uVar34] = uVar6;
          }
          goto LAB_002a4ee3;
        }
        goto LAB_002a9dca;
      }
      if (pcVar21[uVar6] == '\0') {
        cVar14 = pcVar21[uVar34];
        goto joined_r0x002a840e;
      }
      uVar6 = puVar10[lVar16];
      goto LAB_002a9dd2;
    }
    if (pcVar21[lVar16 + 3] == '\0') {
      if (pcVar21[uVar34] != '\0') goto LAB_002ad3d1;
      if (pcVar21[uVar6] != '\0') goto LAB_002a9dbc;
      goto LAB_002acf63;
    }
    if ((pcVar21[uVar34] != '\0') || (pcVar21[uVar6] == '\0')) goto LAB_002ad3d1;
LAB_002a9d94:
    cVar14 = pcVar21[uVar34 - lVar33];
    uVar6 = puVar10[lVar16];
joined_r0x002ad2d2:
    if (cVar14 == '\0') {
      uVar6 = TTA::Merge(uVar6,puVar10[uVar34]);
      puVar53[uVar34] = uVar6;
    }
    else {
      puVar53[uVar34] = uVar6;
    }
    goto LAB_002a4ee3;
  }
  if (pcVar21[lVar26 + 3] != '\0') {
    if (pcVar21[uVar54 - lVar33] == '\0') {
      uVar6 = TTA::Merge(puVar10[lVar26 + 2],puVar53[lVar26]);
      puVar53[lVar26 + 2] = uVar6;
    }
    else if (pcVar21[lVar26 + (1 - lVar33)] == '\0') {
      uVar6 = TTA::Merge(puVar10[lVar26],puVar10[lVar26 + 2]);
      puVar53[lVar26 + 2] = uVar6;
    }
    else {
      puVar53[lVar26 + 2] = puVar10[lVar26];
    }
    goto LAB_002a771f;
  }
  if (pcVar21[lVar26 + 4] == '\0') {
LAB_002a758d:
    uVar6 = puVar53[lVar26];
    local_138 = uVar54 & 0xffffffff;
    goto LAB_002a86fa;
  }
  if (pcVar21[lVar26 + (3 - lVar33)] == '\0') {
    uVar6 = TTA::Merge(puVar10[lVar26 + 4],puVar53[lVar26]);
    puVar53[lVar26 + 2] = uVar6;
    goto LAB_002a6e39;
  }
  cVar14 = pcVar21[uVar54 - lVar33];
joined_r0x002a73d9:
  if (cVar14 == '\0') {
    uVar6 = puVar10[lVar26 + 2];
    uVar7 = puVar53[lVar26];
  }
  else {
    uVar6 = puVar10[lVar26];
    if (pcVar21[lVar26 + (1 - lVar33)] != '\0') {
      puVar53[lVar26 + 2] = uVar6;
      goto LAB_002a6e39;
    }
    uVar7 = puVar10[lVar26 + 2];
  }
  uVar6 = TTA::Merge(uVar6,uVar7);
  puVar53[lVar26 + 2] = uVar6;
  goto LAB_002a6e39;
code_r0x002a7a6a:
  if (*(char *)(lVar26 + 1 + lVar43) == '\0') {
    uVar6 = TTA::NewLabel();
  }
  else {
    uVar6 = *(uint *)(lVar11 + lVar15 + lVar43 * 4);
  }
  *(uint *)(lVar31 + lVar43 * 4) = uVar6;
  lVar36 = lVar36 + 0x200000000;
  lVar43 = lVar43 + 2;
  lVar12 = lVar12 + 8;
  goto LAB_002a7a37;
LAB_002aa1d1:
  local_138 = (ulong)(iVar41 + iVar23 + 2);
  uVar6 = TTA::Merge(*(uint *)(lVar27 * lVar47 + lVar18 * 4 + lVar15 + 8 + lVar43 * 4),
                     *(uint *)(lVar31 + lVar43 * 4));
  *(uint *)(lVar24 + lVar43 * 4) = uVar6;
LAB_002aa418:
  iVar41 = (int)local_138;
  lVar17 = (long)iVar41;
  lVar22 = lVar17 << 0x20;
  lVar36 = lVar33 * lVar47 + lVar17;
  lVar26 = lVar51 + lVar52 + lVar17;
  lVar18 = lVar26 + 3;
  lVar24 = lVar33 * lVar46 + lVar17;
  lVar25 = lVar51 + lVar24 + 2;
  lVar16 = lVar33 * lVar44 + lVar17;
  lVar30 = lVar17 * 4;
  lVar31 = lVar27 * lVar47 + lVar17 * 4;
  lVar12 = lVar15 + 8 + lVar31;
  lVar11 = lVar48 + lVar17 * 4;
  puVar49 = (uint *)(lVar11 + lVar15 + 8);
  lVar43 = 0;
  puVar13 = puVar49;
LAB_002aa4ea:
  lVar28 = lVar22 >> 0x1e;
  lVar45 = lVar22 >> 0x20;
  iVar23 = (int)lVar43;
  if (lVar35 <= lVar17 + lVar43 + 2) {
    uVar6 = iVar41 + iVar23 + 2;
    uVar34 = (ulong)uVar6;
    if (iVar39 < (int)uVar6) {
      if (*(char *)(lVar40 + uVar34) == '\0') {
        if (pcVar9[uVar34] == '\0') {
          puVar53[uVar34] = 0;
          goto LAB_002a4ee3;
        }
        if (pcVar9[lVar45 + 1] == '\0') goto LAB_002acfd8;
LAB_002ac1e5:
        uVar6 = puVar53[lVar45];
        goto LAB_002ad3b6;
      }
      uVar54 = (ulong)(iVar41 + iVar23 + 1);
      cVar14 = pcVar21[uVar34];
      if (pcVar9[uVar54] == '\0') goto joined_r0x002acfa1;
      if (cVar14 == '\0') {
LAB_002ad3ae:
        uVar6 = *(uint *)((long)puVar53 + lVar28);
        goto LAB_002ad3b6;
      }
      bVar55 = pcVar21[uVar54 - lVar33] == '\0';
LAB_002aa661:
      uVar6 = *(uint *)((long)puVar10 + lVar28);
      if (bVar55) {
LAB_002ad77a:
        uVar6 = TTA::Merge(uVar6,puVar10[uVar34]);
LAB_002ad798:
        puVar53[uVar34] = uVar6;
        goto LAB_002a4ee3;
      }
    }
    else {
      if (*(char *)(lVar40 + uVar34) == '\0') {
        uVar54 = (ulong)(uint)(iVar41 + 3 + iVar23);
        if (pcVar9[uVar34] == '\0') {
          if (*(char *)(lVar40 + uVar54) == '\0') {
            cVar14 = pcVar9[uVar54];
            goto joined_r0x002a9b9a;
          }
          cVar14 = pcVar21[uVar54];
          goto joined_r0x002ac28a;
        }
        if (*(char *)(lVar40 + uVar54) != '\0') {
          uVar19 = (ulong)(iVar41 + iVar23 + 1);
          cVar14 = pcVar21[uVar54];
          if (pcVar9[uVar19] == '\0') goto LAB_002abced;
          if (cVar14 == '\0') {
            if (pcVar21[uVar34] == '\0') goto LAB_002ad3ae;
            bVar55 = pcVar21[uVar19 - lVar33] == '\0';
          }
          else {
            if (pcVar21[uVar19 - lVar33] == '\0') {
              uVar6 = *(uint *)((long)puVar10 + lVar28);
              goto LAB_002ad77a;
            }
            if (pcVar21[uVar34] != '\0') {
              uVar6 = *(uint *)((long)puVar10 + lVar28);
              goto LAB_002ad798;
            }
            bVar55 = pcVar21[uVar34 - lVar33] == '\0';
          }
          goto LAB_002aa661;
        }
        if (pcVar9[lVar45 + 1] == '\0') {
          uVar6 = TTA::NewLabel();
        }
        else {
          uVar6 = puVar53[lVar45];
        }
        puVar53[uVar34] = uVar6;
        goto LAB_002a4ee3;
      }
      uVar54 = (ulong)(iVar41 + iVar23 + 1);
      cVar14 = pcVar21[lVar45 + 3];
      if (pcVar9[uVar54] == '\0') {
LAB_002abced:
        if (cVar14 != '\0') goto LAB_002acfa3;
        cVar14 = pcVar21[uVar34];
        goto joined_r0x002acfa1;
      }
      if (cVar14 != '\0') {
        if (pcVar21[uVar54 - lVar33] == '\0') {
          uVar6 = puVar10[lVar45];
          goto LAB_002ad77a;
        }
        if (pcVar21[uVar34] == '\0') {
          cVar14 = pcVar21[uVar34 - lVar33];
          goto LAB_002acf39;
        }
        uVar6 = puVar10[lVar45];
        goto LAB_002ad798;
      }
      if (pcVar21[uVar34] == '\0') goto LAB_002ac1e5;
      cVar14 = pcVar21[uVar54 - lVar33];
LAB_002acf39:
      uVar6 = puVar10[lVar45];
      if (cVar14 == '\0') goto LAB_002ad77a;
    }
    puVar53[uVar34] = uVar6;
    goto LAB_002a4ee3;
  }
  if (*(char *)(lVar26 + 2 + lVar43) == '\0') goto LAB_002aa675;
  cVar14 = *(char *)(lVar51 + lVar24 + 3 + lVar43);
  if (*(char *)(lVar51 + lVar16 + 1 + lVar43) == '\0') {
    if (cVar14 != '\0') {
      local_138 = (ulong)(iVar41 + iVar23 + 2);
      *(undefined4 *)(lVar15 + lVar30 + lVar48 + 8 + lVar43 * 4) =
           *(undefined4 *)(lVar12 + lVar43 * 4);
      goto LAB_002aab14;
    }
    if (*(char *)(lVar18 + lVar43) != '\0') {
      uVar54 = (ulong)(iVar41 + 2) + lVar43;
      lVar26 = lVar22 + 0x400000000 >> 0x20;
      cVar14 = *(char *)(lVar43 + 2 + lVar24 + lVar51);
      if (pcVar21[lVar26] == '\0') {
        if (cVar14 == '\0') {
          uVar6 = TTA::NewLabel();
          *(uint *)(lVar30 + lVar48 + lVar15 + 8 + lVar43 * 4) = uVar6;
          local_138 = uVar54 & 0xffffffff;
          goto LAB_002a6775;
        }
        *(undefined4 *)(lVar15 + lVar30 + lVar48 + 8 + lVar43 * 4) =
             *(undefined4 *)(lVar12 + lVar43 * 4);
        local_138 = uVar54;
        goto LAB_002a7264;
      }
      if (cVar14 != '\0') {
        uVar6 = *(uint *)(lVar31 + lVar15 + 8 + lVar43 * 4);
        if (*(char *)(lVar43 + 3 + lVar36 + lVar51) != '\0') goto LAB_002ac656;
        uVar6 = TTA::Merge(uVar6,puVar10[lVar26]);
        goto LAB_002aaa16;
      }
      uVar6 = puVar10[lVar26];
      lVar11 = lVar30 + lVar48;
LAB_002ac12e:
      *(uint *)(lVar11 + lVar15 + 8 + lVar43 * 4) = uVar6;
      goto LAB_002a6e39;
    }
    if (*(char *)(lVar25 + lVar43) == '\0') {
      uVar6 = TTA::NewLabel();
      goto LAB_002aaa4e;
    }
    uVar6 = *(uint *)(lVar12 + lVar43 * 4);
  }
  else {
    if (cVar14 != '\0') {
      local_138 = (ulong)(iVar41 + 2) + lVar43;
      if (*(char *)(lVar43 + 1 + lVar36 + lVar51) == '\0') {
        uVar6 = TTA::Merge(*(uint *)((long)puVar10 + lVar28),*(uint *)(lVar12 + lVar43 * 4));
        *(uint *)(lVar15 + lVar30 + lVar48 + 8 + lVar43 * 4) = uVar6;
        goto LAB_002aab14;
      }
      if (*(char *)(lVar43 + 2 + lVar24 + lVar51) != '\0') {
        *(undefined4 *)(lVar30 + lVar48 + lVar15 + 8 + lVar43 * 4) =
             *(undefined4 *)((long)puVar10 + lVar28);
        goto LAB_002aab14;
      }
      if (*(char *)(lVar43 + 2 + lVar36 + lVar51) != '\0') {
        *(uint *)(lVar30 + lVar48 + lVar15 + 8 + lVar43 * 4) = *(uint *)((long)puVar10 + lVar28);
        goto LAB_002aab14;
      }
      uVar6 = TTA::Merge(*(uint *)((long)puVar10 + lVar28),*(uint *)(lVar12 + lVar43 * 4));
      *(uint *)(lVar15 + lVar30 + lVar48 + 8 + lVar43 * 4) = uVar6;
      goto LAB_002aab14;
    }
    if (*(char *)(lVar18 + lVar43) != '\0') {
      uVar54 = (ulong)(iVar41 + 2) + lVar43;
      lVar26 = lVar22 + 0x400000000 >> 0x20;
      if (pcVar21[lVar26] == '\0') {
        local_138 = uVar54;
        if (*(char *)(lVar43 + 2 + lVar24 + lVar51) == '\0') goto LAB_002acc45;
        uVar6 = *(uint *)((long)puVar10 + lVar28);
        if (*(char *)(lVar43 + 1 + lVar36 + lVar51) != '\0') goto LAB_002ab560;
        uVar7 = *(uint *)(lVar12 + lVar43 * 4);
        goto LAB_002ac7ce;
      }
      lVar36 = lVar36 + lVar51;
      if (*(char *)(lVar43 + 3 + lVar36) == '\0') {
        if (*(char *)(lVar43 + 2 + lVar24 + lVar51) == '\0') {
          uVar6 = puVar10[lVar26];
          uVar7 = *(uint *)((long)puVar53 + lVar28);
          goto LAB_002ac822;
        }
        if (*(char *)(lVar43 + 1 + lVar36) == '\0') {
          uVar6 = TTA::Merge(*(uint *)((long)puVar10 + lVar28),*(uint *)(lVar12 + lVar43 * 4));
          uVar6 = TTA::Merge(uVar6,puVar10[lVar26]);
          *(uint *)(lVar30 + lVar48 + lVar15 + 8 + lVar43 * 4) = uVar6;
        }
        else {
          uVar6 = TTA::Merge(*(uint *)((long)puVar10 + lVar28),puVar10[lVar26]);
          *(uint *)(lVar30 + lVar48 + lVar15 + 8 + lVar43 * 4) = uVar6;
        }
        goto LAB_002a6e39;
      }
      if (*(char *)(lVar43 + 1 + lVar36) == '\0') {
        uVar6 = *(uint *)((long)puVar10 + lVar28);
        goto LAB_002ac668;
      }
      if (*(char *)(lVar43 + 2 + lVar24 + lVar51) != '\0') goto LAB_002aa848;
      cVar14 = *(char *)(lVar43 + 2 + lVar36);
      goto LAB_002ac64b;
    }
    if (*(char *)(lVar25 + lVar43) == '\0') {
      uVar6 = *(uint *)((long)puVar53 + lVar28);
LAB_002aaa4e:
      iVar41 = iVar41 + iVar23 + 2;
      *(uint *)(lVar30 + lVar48 + lVar15 + 8 + lVar43 * 4) = uVar6;
      goto LAB_002a9e42;
    }
    uVar6 = *(uint *)(lVar12 + -8 + lVar43 * 4);
    if (*(char *)(lVar51 + lVar36 + 1 + lVar43) == '\0') {
      uVar6 = TTA::Merge(uVar6,*(uint *)(lVar12 + lVar43 * 4));
    }
  }
  puVar49[lVar43] = uVar6;
  lVar22 = lVar22 + 0x200000000;
  lVar43 = lVar43 + 2;
  puVar13 = puVar13 + 2;
  goto LAB_002aa4ea;
LAB_002aa675:
  uVar54 = (ulong)(iVar41 + 2) + lVar43;
  lVar26 = lVar22 + 0x300000000 >> 0x20;
  local_138 = uVar54;
  if (*(char *)(lVar43 + 2 + lVar16 + lVar51) == '\0') {
    if (*(char *)(lVar40 + lVar26) == '\0') {
      if (pcVar9[lVar26] == '\0') goto LAB_002a50e1;
      uVar6 = TTA::NewLabel();
LAB_002abac4:
      *(uint *)(lVar11 + lVar15 + 8 + lVar43 * 4) = uVar6;
      uVar54 = local_138;
LAB_002a5a15:
      iVar41 = (int)uVar54;
      lVar43 = (long)iVar41;
      lVar24 = lVar43 << 0x20;
      lVar11 = lVar51 + lVar52 + lVar43;
      lVar31 = lVar51 + lVar33 * lVar44 + lVar43;
      lVar30 = lVar48 + lVar43 * 4;
      lVar12 = lVar30 + lVar15 + 8;
      lVar26 = 0;
      lVar36 = 0;
      while( true ) {
        uVar34 = lVar36 + lVar43 + 2;
        lVar16 = lVar24 >> 0x20;
        lVar17 = lVar24 >> 0x1e;
        iVar23 = (int)lVar36;
        if (lVar35 <= (long)uVar34) break;
        if (*(char *)(lVar11 + 2 + lVar36) != '\0') {
          local_138 = (ulong)(iVar41 + 2) + lVar36;
          iVar41 = (int)local_138;
          lVar26 = lVar24 + 0x300000000 >> 0x20;
          if (pcVar21[lVar26] != '\0') {
            if (*(char *)(lVar36 + 2 + lVar33 * lVar46 + lVar43 + lVar51) != '\0') {
              uVar6 = TTA::Merge(*(uint *)(lVar27 * lVar47 + lVar43 * 4 + lVar15 + 8 + lVar36 * 4),
                                 *(uint *)((long)puVar53 + lVar17));
              *(uint *)(lVar12 + lVar36 * 4) = uVar6;
              goto LAB_002aab14;
            }
            if (pcVar21[lVar16 + 1] == '\0') {
              uVar6 = TTA::Merge(*(uint *)(lVar27 * lVar47 + lVar43 * 4 + lVar15 + 8 + lVar36 * 4),
                                 puVar53[lVar16]);
              *(uint *)(lVar12 + lVar36 * 4) = uVar6;
              goto LAB_002aab14;
            }
            if (*(char *)(lVar36 + 2 + lVar33 * lVar47 + lVar43 + lVar51) == '\0') {
              uVar6 = TTA::Merge(puVar10[lVar16],
                                 *(uint *)(lVar27 * lVar47 + lVar43 * 4 + lVar15 + 8 + lVar36 * 4));
              uVar6 = TTA::Merge(uVar6,puVar53[lVar16]);
              *(uint *)(lVar12 + lVar36 * 4) = uVar6;
              goto LAB_002aab14;
            }
            uVar6 = TTA::Merge(puVar10[lVar16],puVar53[lVar16]);
            *(uint *)(lVar30 + lVar15 + 8 + lVar36 * 4) = uVar6;
            goto LAB_002aab14;
          }
          if (*(char *)(lVar40 + lVar26) == '\0') {
            if (pcVar21[lVar16 + 1] != '\0') {
              uVar6 = TTA::Merge(puVar10[lVar16],puVar53[lVar16]);
              goto LAB_002ab0db;
            }
            if (*(char *)(lVar36 + 2 + lVar33 * lVar46 + lVar43 + lVar51) == '\0') {
              *(uint *)(lVar30 + lVar15 + 8 + lVar36 * 4) = puVar53[lVar16];
              goto LAB_002a9e42;
            }
            uVar6 = TTA::Merge(*(uint *)(lVar27 * lVar47 + lVar43 * 4 + lVar15 + 8 + lVar36 * 4),
                               puVar53[lVar16]);
            *(uint *)(lVar12 + lVar36 * 4) = uVar6;
            goto LAB_002aa418;
          }
          lVar11 = lVar24 + 0x400000000 >> 0x20;
          if (pcVar21[lVar11] == '\0') {
            if (pcVar21[lVar16 + 1] != '\0') {
              uVar6 = TTA::Merge(puVar10[lVar16],puVar53[lVar16]);
              goto LAB_002a86fa;
            }
            if (*(char *)(lVar36 + 2 + lVar33 * lVar46 + lVar43 + lVar51) != '\0') {
              uVar6 = TTA::Merge(*(uint *)(lVar27 * lVar47 + lVar43 * 4 + lVar15 + 8 + lVar36 * 4),
                                 puVar53[lVar16]);
              *(uint *)(lVar12 + lVar36 * 4) = uVar6;
              goto LAB_002a7264;
            }
            *(uint *)(lVar30 + lVar15 + 8 + lVar36 * 4) = puVar53[lVar16];
            goto LAB_002a6775;
          }
          uVar54 = local_138;
          if (*(char *)(lVar36 + 2 + lVar33 * lVar46 + lVar43 + lVar51) == '\0') {
            if (pcVar21[lVar16 + 1] == '\0') {
              uVar6 = TTA::Merge(puVar10[lVar11],puVar53[lVar16]);
LAB_002a6269:
              *(uint *)(lVar30 + lVar15 + 8 + lVar36 * 4) = uVar6;
              uVar54 = local_138;
            }
            else {
              if (pcVar21[lVar26 - lVar33] != '\0') {
                uVar6 = puVar10[lVar16];
                if (*(char *)(lVar36 + 2 + lVar33 * lVar47 + lVar43 + lVar51) == '\0') {
                  uVar7 = TTA::Merge(uVar6,*(uint *)(lVar27 * lVar47 + lVar43 * 4 + lVar15 + 8 +
                                                    lVar36 * 4));
                  uVar6 = puVar53[lVar16];
                  goto LAB_002a63d2;
                }
                uVar7 = puVar53[lVar16];
                goto LAB_002a6657;
              }
              uVar6 = TTA::Merge(puVar10[lVar16],puVar10[lVar11]);
              uVar6 = TTA::Merge(uVar6,puVar53[lVar16]);
              *(uint *)(lVar30 + lVar15 + 8 + lVar36 * 4) = uVar6;
            }
          }
          else {
            uVar6 = *(uint *)(lVar27 * lVar47 + lVar43 * 4 + lVar15 + 8 + lVar36 * 4);
            if (pcVar21[lVar26 - lVar33] == '\0') {
              uVar6 = TTA::Merge(uVar6,puVar10[lVar11]);
              uVar7 = *(uint *)((long)puVar53 + lVar17);
            }
            else {
              uVar7 = *(uint *)((long)puVar53 + lVar17);
            }
            uVar6 = TTA::Merge(uVar6,uVar7);
            *(uint *)(lVar30 + lVar15 + 8 + lVar36 * 4) = uVar6;
          }
          goto LAB_002a6e39;
        }
        if (*(char *)(lVar31 + 2 + lVar36) != '\0') {
          uVar54 = (ulong)(iVar41 + 2) + lVar36;
          lVar26 = lVar24 + 0x300000000 >> 0x20;
          if (*(char *)(lVar40 + lVar26) == '\0') {
            *(undefined4 *)(lVar30 + lVar15 + 8 + lVar36 * 4) =
                 *(undefined4 *)((long)puVar53 + lVar17);
            goto LAB_002a79e2;
          }
          if (pcVar21[lVar26] != '\0') {
            uVar6 = TTA::Merge(*(uint *)(lVar27 * lVar47 + lVar43 * 4 + lVar15 + 8 + lVar36 * 4),
                               *(uint *)((long)puVar53 + lVar17));
            *(uint *)(lVar12 + lVar36 * 4) = uVar6;
            goto LAB_002a771f;
          }
          lVar11 = lVar24 + 0x400000000 >> 0x20;
          local_138 = uVar54;
          if (pcVar21[lVar11] != '\0') {
            if (pcVar21[lVar26 - lVar33] == '\0') {
              if (*(char *)(lVar36 + 2 + lVar33 * lVar46 + lVar43 + lVar51) == '\0') {
                uVar6 = puVar10[lVar11];
                uVar7 = *(uint *)((long)puVar53 + lVar17);
LAB_002a6657:
                uVar6 = TTA::Merge(uVar6,uVar7);
                *(uint *)(lVar30 + lVar15 + 8 + lVar36 * 4) = uVar6;
                uVar54 = local_138;
              }
              else {
                uVar7 = TTA::Merge(*(uint *)(lVar27 * lVar47 + lVar43 * 4 + lVar15 + 8 + lVar36 * 4)
                                   ,puVar10[lVar11]);
                uVar6 = *(uint *)((long)puVar53 + lVar17);
LAB_002a63d2:
                uVar6 = TTA::Merge(uVar7,uVar6);
                *(uint *)(lVar12 + lVar36 * 4) = uVar6;
                uVar54 = local_138;
              }
            }
            else {
              uVar6 = TTA::Merge(*(uint *)(lVar27 * lVar47 + lVar43 * 4 + lVar15 + 8 + lVar36 * 4),
                                 *(uint *)((long)puVar53 + lVar17));
              *(uint *)(lVar12 + lVar36 * 4) = uVar6;
            }
            goto LAB_002a6e39;
          }
          if (*(char *)(lVar36 + 2 + lVar33 * lVar46 + lVar43 + lVar51) == '\0') {
            uVar6 = *(uint *)((long)puVar53 + lVar17);
            goto LAB_002a658a;
          }
          uVar6 = TTA::Merge(*(uint *)(lVar27 * lVar47 + lVar43 * 4 + lVar15 + 8 + lVar36 * 4),
                             *(uint *)((long)puVar53 + lVar17));
LAB_002a6246:
          *(uint *)(lVar12 + lVar36 * 4) = uVar6;
          goto LAB_002a7264;
        }
        if (*(char *)(lVar11 + 3 + lVar36) != '\0') {
          local_138 = (ulong)(iVar41 + 2) + lVar36;
          lVar26 = lVar33 * lVar46 + lVar43 + lVar51;
          uVar54 = local_138;
          if (*(char *)(lVar36 + 3 + lVar26) != '\0') {
            *(undefined4 *)(lVar12 + lVar36 * 4) =
                 *(undefined4 *)(lVar27 * lVar47 + lVar43 * 4 + lVar15 + 8 + lVar36 * 4);
            goto LAB_002a771f;
          }
          lVar11 = lVar24 + 0x400000000 >> 0x20;
          cVar14 = *(char *)(lVar36 + 2 + lVar26);
          if (pcVar21[lVar11] != '\0') {
            if (cVar14 == '\0') {
              uVar6 = puVar10[lVar11];
              goto LAB_002a6269;
            }
            uVar6 = *(uint *)(lVar27 * lVar47 + lVar43 * 4 + lVar15 + 8 + lVar36 * 4);
            if (*(char *)(lVar36 + 3 + lVar33 * lVar47 + lVar43 + lVar51) == '\0') {
              uVar6 = TTA::Merge(uVar6,puVar10[lVar11]);
              *(uint *)(lVar30 + lVar15 + 8 + lVar36 * 4) = uVar6;
            }
            else {
              *(uint *)(lVar30 + lVar15 + 8 + lVar36 * 4) = uVar6;
            }
            goto LAB_002a6e39;
          }
          if (cVar14 != '\0') {
            uVar6 = *(uint *)(lVar27 * lVar47 + lVar43 * 4 + lVar15 + 8 + lVar36 * 4);
            goto LAB_002a6246;
          }
          uVar6 = TTA::NewLabel();
LAB_002a658a:
          *(uint *)(lVar30 + lVar15 + 8 + lVar36 * 4) = uVar6;
          goto LAB_002a6775;
        }
        if (*(char *)(lVar31 + 3 + lVar36) == '\0') {
          lVar26 = lVar26 + lVar30 + lVar15;
          uVar54 = (ulong)(iVar41 + iVar23 + 2);
LAB_002ac0db:
          puVar13 = (uint *)(lVar26 + 8);
LAB_002a50e1:
          *puVar13 = 0;
          iVar41 = (int)uVar54;
          lVar31 = (long)iVar41;
          lVar11 = lVar31 << 0x20;
          lVar30 = lVar52 + lVar31 + lVar51;
          lVar36 = lVar33 * lVar44 + lVar31 + lVar51;
          lVar26 = lVar48 + lVar31 * 4;
          lVar43 = lVar15 + lVar26 + 8;
          lVar12 = 0;
          do {
            lVar24 = lVar11 >> 0x20;
            iVar23 = (int)lVar12;
            if (lVar35 <= lVar31 + lVar12 + 2) {
              uVar6 = iVar41 + iVar23 + 2;
              uVar54 = (ulong)uVar6;
              if (iVar39 < (int)uVar6) {
                if (*(char *)(lVar40 + uVar54) == '\0') {
                  cVar14 = pcVar9[uVar54];
joined_r0x002a58f9:
                  if (cVar14 == '\0') {
                    puVar53[uVar54] = 0;
                    goto LAB_002a4ee3;
                  }
                }
                else {
                  if (pcVar21[uVar54] != '\0') goto LAB_002a576e;
LAB_002a5673:
                  if (pcVar21[lVar24 + 1] != '\0') {
                    uVar6 = puVar10[lVar24];
                    goto LAB_002a591d;
                  }
                }
LAB_002a58ff:
                uVar6 = TTA::NewLabel();
              }
              else {
                if (*(char *)(lVar40 + uVar54) == '\0') {
                  uVar34 = (ulong)(uint)(iVar41 + 3 + iVar23);
                  if (pcVar9[uVar54] == '\0') {
                    if (*(char *)(lVar40 + uVar34) == '\0') {
                      cVar14 = pcVar9[uVar34];
                      goto joined_r0x002a58f9;
                    }
                  }
                  else if (*(char *)(lVar40 + uVar34) == '\0') goto LAB_002a58ff;
                  if ((pcVar21[uVar34] == '\0') && (pcVar21[uVar54] == '\0')) goto LAB_002a58ff;
                }
                else if (pcVar21[lVar24 + 3] == '\0') {
                  if (pcVar21[uVar54] == '\0') goto LAB_002a5673;
                }
                else if ((pcVar21[uVar54] == '\0') && (pcVar21[lVar24 + 1] != '\0')) {
                  if (pcVar21[uVar54 - lVar33] == '\0') {
                    uVar6 = TTA::Merge(puVar10[lVar24],puVar10[uVar54]);
                    puVar53[uVar54] = uVar6;
                  }
                  else {
                    puVar53[uVar54] = puVar10[lVar24];
                  }
                  goto LAB_002a4ee3;
                }
LAB_002a576e:
                uVar6 = puVar10[uVar54];
              }
LAB_002a591d:
              puVar53[uVar54] = uVar6;
              goto LAB_002a4ee3;
            }
            if (*(char *)(lVar30 + 2 + lVar12) != '\0') goto LAB_002a51c6;
            if (*(char *)(lVar36 + 2 + lVar12) != '\0') {
              uVar54 = (ulong)(iVar41 + 2) + lVar12;
              lVar30 = lVar11 + 0x300000000 >> 0x20;
              if (*(char *)(lVar40 + lVar30) == '\0') {
                uVar6 = TTA::NewLabel();
                *(uint *)(lVar26 + lVar15 + 8 + lVar12 * 4) = uVar6;
                goto LAB_002a79e2;
              }
              if (pcVar21[lVar30] != '\0') {
                *(undefined4 *)(lVar43 + lVar12 * 4) =
                     *(undefined4 *)(lVar27 * lVar47 + lVar31 * 4 + lVar15 + 8 + lVar12 * 4);
                goto LAB_002a771f;
              }
              lVar11 = lVar11 + 0x400000000 >> 0x20;
              cVar14 = *(char *)(lVar12 + 2 + lVar33 * lVar46 + lVar31 + lVar51);
              if (pcVar21[lVar11] == '\0') {
                if (cVar14 != '\0') {
                  *(undefined4 *)(lVar43 + lVar12 * 4) =
                       *(undefined4 *)(lVar27 * lVar47 + lVar31 * 4 + lVar15 + 8 + lVar12 * 4);
                  local_138 = uVar54;
                  goto LAB_002a7264;
                }
                uVar6 = TTA::NewLabel();
                *(uint *)(lVar26 + lVar15 + 8 + lVar12 * 4) = uVar6;
                local_138 = uVar54 & 0xffffffff;
                goto LAB_002a6775;
              }
              if (cVar14 == '\0') goto LAB_002a5613;
              lVar36 = lVar27 * lVar47 + lVar31 * 4;
              cVar14 = pcVar21[lVar30 - lVar33];
LAB_002a5560:
              uVar6 = *(uint *)(lVar36 + lVar15 + 8 + lVar12 * 4);
              local_138 = uVar54;
              if (cVar14 != '\0') goto LAB_002a556a;
              uVar7 = puVar10[lVar11];
              goto LAB_002a5718;
            }
            if (*(char *)(lVar30 + 3 + lVar12) != '\0') {
              uVar54 = (ulong)(iVar41 + 2) + lVar12;
              lVar30 = lVar33 * lVar46 + lVar31 + lVar51;
              if (*(char *)(lVar12 + 3 + lVar30) != '\0') {
                *(undefined4 *)(lVar43 + lVar12 * 4) =
                     *(undefined4 *)(lVar27 * lVar47 + lVar31 * 4 + lVar15 + 8 + lVar12 * 4);
                goto LAB_002a771f;
              }
              lVar11 = lVar11 + 0x400000000 >> 0x20;
              cVar14 = *(char *)(lVar12 + 2 + lVar30);
              if (pcVar21[lVar11] == '\0') {
                local_138 = uVar54;
                if (cVar14 == '\0') goto LAB_002a587c;
                *(undefined4 *)(lVar43 + lVar12 * 4) =
                     *(undefined4 *)(lVar27 * lVar47 + lVar31 * 4 + lVar15 + 8 + lVar12 * 4);
                goto LAB_002a7264;
              }
              if (cVar14 != '\0') {
                lVar36 = lVar27 * lVar47 + lVar31 * 4;
                cVar14 = *(char *)(lVar12 + 3 + lVar33 * lVar47 + lVar31 + lVar51);
                goto LAB_002a5560;
              }
LAB_002a5613:
              *(uint *)(lVar26 + lVar15 + 8 + lVar12 * 4) = puVar10[lVar11];
              goto LAB_002a6e39;
            }
            if (*(char *)(lVar36 + 3 + lVar12) != '\0') {
              uVar6 = TTA::NewLabel();
              *(uint *)(lVar26 + lVar15 + 8 + lVar12 * 4) = uVar6;
              uVar54 = (ulong)(iVar41 + iVar23 + 2);
              goto LAB_002a5a15;
            }
            *(undefined4 *)(lVar43 + lVar12 * 4) = 0;
            lVar11 = lVar11 + 0x200000000;
            lVar12 = lVar12 + 2;
          } while( true );
        }
        uVar6 = TTA::NewLabel();
        *(uint *)(lVar12 + lVar36 * 4) = uVar6;
        lVar24 = lVar24 + 0x200000000;
        lVar36 = lVar36 + 2;
        lVar26 = lVar26 + 8;
      }
      uVar6 = iVar41 + iVar23 + 2;
      uVar54 = (ulong)uVar6;
      if (iVar39 < (int)uVar6) {
        if (*(char *)(lVar40 + uVar54) == '\0') {
          if (pcVar9[uVar54] == '\0') {
            puVar53[uVar54] = 0;
            goto LAB_002a4ee3;
          }
LAB_002a6065:
          uVar6 = *(uint *)((long)puVar53 + lVar17);
        }
        else {
          cVar14 = pcVar21[lVar16 + 1];
joined_r0x002a6101:
          if (cVar14 != '\0') {
            uVar6 = puVar10[lVar16];
            goto LAB_002a611b;
          }
          if (pcVar21[uVar54] != '\0') goto LAB_002a6112;
          uVar6 = puVar53[lVar16];
        }
LAB_002a6138:
        puVar53[uVar54] = uVar6;
      }
      else {
        if (*(char *)(lVar40 + uVar54) != '\0') {
          if (pcVar21[lVar16 + 3] == '\0') {
            cVar14 = pcVar21[lVar16 + 1];
            goto joined_r0x002a6101;
          }
          if (pcVar21[uVar54] == '\0') {
            if (pcVar21[lVar16 + 1] == '\0') {
              uVar6 = TTA::Merge(puVar10[uVar54],puVar53[lVar16]);
              puVar53[uVar54] = uVar6;
            }
            else {
              uVar6 = puVar10[lVar16];
              if (pcVar21[uVar54 - lVar33] == '\0') {
                uVar6 = TTA::Merge(uVar6,puVar10[uVar54]);
                uVar7 = puVar53[lVar16];
              }
              else {
                uVar7 = puVar53[lVar16];
              }
              uVar6 = TTA::Merge(uVar6,uVar7);
              puVar53[uVar54] = uVar6;
            }
            goto LAB_002a4ee3;
          }
LAB_002a6112:
          uVar6 = puVar10[uVar54];
LAB_002a611b:
          uVar7 = puVar53[lVar16];
LAB_002a611f:
          uVar6 = TTA::Merge(uVar6,uVar7);
          goto LAB_002a6138;
        }
        uVar34 = (ulong)(uint)(iVar41 + 3 + iVar23);
        if (pcVar9[uVar54] != '\0') {
          if ((*(char *)(lVar40 + uVar34) == '\0') ||
             ((pcVar21[uVar34] == '\0' && (pcVar21[uVar54] == '\0')))) goto LAB_002a6065;
          uVar6 = puVar10[uVar54];
          uVar7 = *(uint *)((long)puVar53 + lVar17);
          goto LAB_002a611f;
        }
        if (*(char *)(lVar40 + uVar34) == '\0') {
          if (pcVar9[uVar34] == '\0') {
            puVar53[uVar54] = 0;
            goto LAB_002a4ee3;
          }
LAB_002a65fb:
          uVar6 = TTA::NewLabel();
        }
        else {
          if ((pcVar21[uVar34] == '\0') && (pcVar21[uVar54] == '\0')) goto LAB_002a65fb;
          uVar6 = puVar10[uVar54];
        }
        puVar53[uVar54] = uVar6;
      }
      goto LAB_002a4ee3;
    }
    if (pcVar21[lVar26] != '\0') {
      *(undefined4 *)(lVar30 + lVar48 + lVar15 + 8 + lVar43 * 4) =
           *(undefined4 *)(lVar12 + lVar43 * 4);
      goto LAB_002a771f;
    }
    lVar11 = lVar22 + 0x400000000 >> 0x20;
    cVar14 = *(char *)(lVar43 + 2 + lVar24 + lVar51);
    if (pcVar21[lVar11] == '\0') goto LAB_002ac6a3;
    if (cVar14 == '\0') {
      uVar6 = puVar10[lVar11];
      lVar11 = lVar30 + lVar48;
LAB_002ad246:
      *(uint *)(lVar11 + lVar15 + 8 + lVar43 * 4) = uVar6;
    }
    else {
      uVar6 = *(uint *)(lVar31 + lVar15 + 8 + lVar43 * 4);
      if (pcVar21[lVar26 - lVar33] == '\0') {
        uVar7 = puVar10[lVar11];
LAB_002ac822:
        uVar6 = TTA::Merge(uVar6,uVar7);
        lVar11 = lVar30 + lVar48;
LAB_002ad1d9:
        *(uint *)(lVar11 + lVar15 + 8 + lVar43 * 4) = uVar6;
      }
      else {
        lVar11 = lVar30 + lVar48;
LAB_002ac006:
        *(uint *)(lVar11 + lVar15 + 8 + lVar43 * 4) = uVar6;
      }
    }
    goto LAB_002a6e39;
  }
  if (*(char *)(lVar40 + lVar26) == '\0') {
    if (pcVar9[lVar45 + 1] == '\0') {
      uVar6 = TTA::NewLabel();
    }
    else {
      uVar6 = puVar53[lVar45];
    }
    lVar11 = lVar30 + lVar48;
LAB_002ac03f:
    *(uint *)(lVar11 + lVar15 + 8 + lVar43 * 4) = uVar6;
    goto LAB_002a79e2;
  }
  lVar11 = lVar22 + 0x100000000 >> 0x20;
  if (pcVar9[lVar11] == '\0') {
    if (pcVar21[lVar26] != '\0') {
      *(undefined4 *)(lVar30 + lVar48 + lVar15 + 8 + lVar43 * 4) =
           *(undefined4 *)(lVar12 + lVar43 * 4);
      goto LAB_002a771f;
    }
    lVar11 = lVar22 + 0x400000000 >> 0x20;
    cVar14 = *(char *)(lVar43 + 2 + lVar24 + lVar51);
    if (pcVar21[lVar11] == '\0') {
LAB_002ac6a3:
      if (cVar14 == '\0') {
        uVar6 = TTA::NewLabel();
        lVar11 = lVar30 + lVar48;
        goto LAB_002ad6d5;
      }
      uVar8 = *(undefined4 *)(lVar12 + lVar43 * 4);
      lVar31 = lVar15 + lVar30 + lVar48 + 8;
LAB_002ad21d:
      *(undefined4 *)(lVar31 + lVar43 * 4) = uVar8;
      local_138 = uVar54;
      goto LAB_002a7264;
    }
    if (cVar14 == '\0') {
      *(uint *)(lVar30 + lVar48 + lVar15 + 8 + lVar43 * 4) = puVar10[lVar11];
      goto LAB_002a6e39;
    }
    uVar6 = *(uint *)(lVar31 + lVar15 + 8 + lVar43 * 4);
    if (pcVar21[lVar26 - lVar33] != '\0') {
      *(uint *)(lVar30 + lVar48 + lVar15 + 8 + lVar43 * 4) = uVar6;
      goto LAB_002a6e39;
    }
    uVar7 = puVar10[lVar11];
  }
  else {
    if (pcVar21[lVar26] != '\0') {
      if (pcVar21[lVar11 - lVar33] == '\0') {
        uVar6 = *(uint *)((long)puVar10 + lVar28);
        uVar7 = *(uint *)(lVar12 + lVar43 * 4);
      }
      else {
        if (*(char *)(lVar43 + 2 + lVar24 + lVar51) != '\0') {
          *(undefined4 *)(lVar30 + lVar48 + lVar15 + 8 + lVar43 * 4) =
               *(undefined4 *)((long)puVar10 + lVar28);
          goto LAB_002a771f;
        }
        uVar6 = *(uint *)((long)puVar10 + lVar28);
        if (*(char *)(lVar43 + 2 + lVar36 + lVar51) != '\0') {
          *(uint *)(lVar30 + lVar48 + lVar15 + 8 + lVar43 * 4) = uVar6;
          goto LAB_002a771f;
        }
        uVar7 = *(uint *)(lVar12 + lVar43 * 4);
      }
      uVar6 = TTA::Merge(uVar6,uVar7);
      *(uint *)(lVar30 + lVar48 + lVar15 + 8 + lVar43 * 4) = uVar6;
      goto LAB_002a771f;
    }
    lVar31 = lVar22 + 0x400000000 >> 0x20;
    if (pcVar21[lVar31] == '\0') {
      if (*(char *)(lVar43 + 2 + lVar24 + lVar51) != '\0') {
        uVar6 = *(uint *)((long)puVar10 + lVar28);
        if (pcVar21[lVar11 - lVar33] == '\0') {
          uVar7 = *(uint *)(lVar12 + lVar43 * 4);
LAB_002ac7ce:
          uVar6 = TTA::Merge(uVar6,uVar7);
          *(uint *)(lVar15 + lVar30 + lVar48 + 8 + lVar43 * 4) = uVar6;
          local_138 = uVar54 & 0xffffffff;
        }
        else {
LAB_002ab560:
          *(uint *)(lVar30 + lVar48 + lVar15 + 8 + lVar43 * 4) = uVar6;
          local_138 = uVar54;
        }
        goto LAB_002a7264;
      }
LAB_002acc45:
      uVar8 = *(undefined4 *)((long)puVar53 + lVar28);
      lVar11 = lVar30 + lVar48;
LAB_002acc5f:
      *(undefined4 *)(lVar11 + lVar15 + 8 + lVar43 * 4) = uVar8;
      goto LAB_002a6775;
    }
    if (pcVar21[lVar26 - lVar33] != '\0') {
      if (pcVar21[lVar11 - lVar33] == '\0') {
        uVar6 = *(uint *)((long)puVar10 + lVar28);
        uVar7 = *(uint *)(lVar12 + lVar43 * 4);
      }
      else {
        if (*(char *)(lVar43 + 2 + lVar24 + lVar51) != '\0') {
LAB_002aa848:
          uVar6 = *(uint *)((long)puVar10 + lVar28);
LAB_002aaa16:
          lVar11 = lVar30 + lVar48;
          local_138 = uVar54;
LAB_002ab504:
          *(uint *)(lVar11 + lVar15 + 8 + lVar43 * 4) = uVar6;
          uVar54 = local_138;
          goto LAB_002a6e39;
        }
        cVar14 = *(char *)(lVar43 + 2 + lVar36 + lVar51);
LAB_002ac64b:
        uVar6 = *(uint *)((long)puVar10 + lVar28);
        if (cVar14 != '\0') {
LAB_002ac656:
          lVar11 = lVar30 + lVar48;
LAB_002acd10:
          *(uint *)(lVar11 + lVar15 + 8 + lVar43 * 4) = uVar6;
          goto LAB_002a6e39;
        }
LAB_002ac668:
        uVar7 = *(uint *)(lVar12 + lVar43 * 4);
      }
      uVar6 = TTA::Merge(uVar6,uVar7);
      lVar31 = lVar30 + lVar48 + lVar15 + 8;
LAB_002ac69a:
      *(uint *)(lVar31 + lVar43 * 4) = uVar6;
      goto LAB_002a6e39;
    }
    if (*(char *)(lVar43 + 2 + lVar24 + lVar51) != '\0') {
      if (pcVar21[lVar11 - lVar33] == '\0') {
        uVar6 = TTA::Merge(*(uint *)((long)puVar10 + lVar28),*(uint *)(lVar12 + lVar43 * 4));
        uVar6 = TTA::Merge(uVar6,puVar10[lVar31]);
        *(uint *)(lVar30 + lVar48 + lVar15 + 8 + lVar43 * 4) = uVar6;
      }
      else {
        uVar6 = TTA::Merge(*(uint *)((long)puVar10 + lVar28),puVar10[lVar31]);
        *(uint *)(lVar30 + lVar48 + lVar15 + 8 + lVar43 * 4) = uVar6;
      }
      goto LAB_002a6e39;
    }
    uVar6 = puVar10[lVar31];
    uVar7 = *(uint *)((long)puVar53 + lVar28);
  }
  uVar6 = TTA::Merge(uVar6,uVar7);
  *(uint *)(lVar30 + lVar48 + lVar15 + 8 + lVar43 * 4) = uVar6;
  goto LAB_002a6e39;
LAB_002a51c6:
  local_138 = (ulong)(iVar41 + 2) + lVar12;
  iVar41 = (int)local_138;
  lVar30 = lVar11 + 0x300000000 >> 0x20;
  if (pcVar21[lVar30] != '\0') {
    if ((*(char *)(lVar12 + 2 + lVar33 * lVar46 + lVar31 + lVar51) == '\0') &&
       (pcVar21[lVar24 + 1] != '\0')) {
      if (*(char *)(lVar12 + 2 + lVar33 * lVar47 + lVar31 + lVar51) == '\0') {
        uVar6 = TTA::Merge(puVar10[lVar24],
                           *(uint *)(lVar27 * lVar47 + lVar31 * 4 + lVar15 + 8 + lVar12 * 4));
        *(uint *)(lVar43 + lVar12 * 4) = uVar6;
      }
      else {
        *(uint *)(lVar26 + lVar15 + 8 + lVar12 * 4) = puVar10[lVar24];
      }
    }
    else {
      *(undefined4 *)(lVar43 + lVar12 * 4) =
           *(undefined4 *)(lVar27 * lVar47 + lVar31 * 4 + lVar15 + 8 + lVar12 * 4);
    }
LAB_002aab14:
    iVar41 = (int)local_138;
    lVar50 = (long)iVar41;
    lVar36 = lVar50 << 0x20;
    lVar16 = lVar33 * lVar47 + lVar50;
    lVar45 = lVar51 + lVar16 + 2;
    lVar17 = lVar52 + lVar50;
    lVar18 = lVar33 * lVar46 + lVar50;
    lVar30 = lVar51 + lVar18;
    lVar28 = lVar30 + 2;
    lVar25 = lVar33 * lVar44 + lVar50;
    lVar12 = lVar27 * lVar47 + lVar50 * 4;
    lVar24 = lVar15 + lVar12;
    lVar22 = lVar24 + 8;
    lVar11 = lVar48 + lVar50 * 4;
    lVar31 = lVar15 + lVar11 + 8;
    lVar26 = 0;
    lVar43 = 0;
    do {
      uVar34 = lVar50 + lVar43 + 2;
      lVar37 = lVar36 >> 0x1e;
      if (lVar35 <= (long)uVar34) {
        iVar23 = (int)lVar43;
        uVar6 = iVar41 + iVar23 + 2;
        uVar34 = (ulong)uVar6;
        if (iVar39 < (int)uVar6) {
          if (*(char *)(lVar40 + uVar34) == '\0') {
            if (pcVar9[uVar34] == '\0') goto LAB_002ab6bf;
            uVar54 = (ulong)(iVar41 + iVar23 + 1);
            if (pcVar9[uVar54] == '\0') {
              cVar14 = *(char *)(lVar40 + uVar54);
              goto joined_r0x002ac213;
            }
          }
          else {
            uVar54 = (ulong)(iVar41 + iVar23 + 1);
            if (*(char *)(lVar40 + uVar54) == '\0') {
              if ((pcVar9[uVar54] != '\0') || (pcVar21[uVar34] == '\0')) goto LAB_002aad8e;
              goto LAB_002ad3d1;
            }
          }
          puVar53[uVar34] = *(uint *)((long)puVar53 + lVar37);
          goto LAB_002a4ee3;
        }
        if (*(char *)(lVar40 + uVar34) != '\0') {
          uVar54 = (ulong)(iVar41 + iVar23 + 1);
          lVar16 = lVar36 >> 0x20;
          if (*(char *)(lVar40 + uVar54) == '\0') {
            if (pcVar9[uVar54] != '\0') {
              if ((pcVar21[lVar16 + 3] == '\0') || (pcVar21[uVar34] != '\0')) goto LAB_002a9dbc;
              goto LAB_002a9d94;
            }
            if (pcVar21[lVar16 + 3] == '\0') {
              if (pcVar21[uVar34] != '\0') goto LAB_002ad3d1;
              goto LAB_002a9dbc;
            }
            if (pcVar21[uVar34] != '\0') goto LAB_002ad3d1;
            goto LAB_002a9d94;
          }
          if (pcVar21[lVar16 + 3] == '\0') goto LAB_002a9e34;
          if (pcVar21[uVar34] != '\0') goto LAB_002ad3d1;
          if (pcVar21[uVar34 - lVar33] != '\0') goto LAB_002a9dbc;
          goto LAB_002a9dca;
        }
        uVar54 = (ulong)(uint)(iVar41 + 3 + iVar23);
        cVar14 = *(char *)(lVar40 + uVar54);
        if (pcVar9[uVar34] == '\0') goto LAB_002abd0f;
        uVar19 = (ulong)(iVar41 + iVar23 + 1);
        if (cVar14 == '\0') {
          if (pcVar9[uVar19] != '\0') goto LAB_002ac238;
          cVar14 = *(char *)(lVar40 + uVar19);
joined_r0x002ac213:
          if (cVar14 != '\0') goto LAB_002ac238;
          goto LAB_002acf63;
        }
        if (*(char *)(lVar40 + uVar19) != '\0') {
          if (pcVar21[uVar54] == '\0') goto LAB_002ac238;
          if (pcVar21[uVar34] != '\0') goto LAB_002ad3d1;
          if (pcVar21[uVar34 - lVar33] != '\0') goto LAB_002aad8e;
          goto LAB_002a8e83;
        }
        cVar14 = pcVar21[uVar54];
        if (pcVar9[uVar19] == '\0') goto joined_r0x002ad3cb;
        if (cVar14 == '\0') {
          if (pcVar21[uVar34] != '\0') goto LAB_002aad92;
          goto LAB_002ac23c;
        }
        if (pcVar21[uVar34] != '\0') goto LAB_002aad92;
        cVar14 = pcVar21[uVar34 - lVar33];
        uVar6 = *(uint *)((long)puVar10 + lVar37);
        goto joined_r0x002ad2d2;
      }
      if (*(char *)(lVar51 + lVar17 + 2 + lVar43) == '\0') {
        uVar54 = (ulong)(iVar41 + 2) + lVar43;
        lVar30 = lVar36 + 0x300000000 >> 0x20;
        if (*(char *)(lVar43 + 2 + lVar25 + lVar51) == '\0') {
          if (*(char *)(lVar40 + lVar30) == '\0') {
            if (pcVar9[lVar30] != '\0') {
              uVar6 = TTA::NewLabel();
              *(uint *)(lVar11 + lVar15 + 8 + lVar43 * 4) = uVar6;
              uVar54 = uVar54 & 0xffffffff;
              goto LAB_002a5a15;
            }
            lVar26 = lVar26 + lVar11 + lVar15;
            goto LAB_002ac0db;
          }
          if (pcVar21[lVar30] != '\0') {
            *(undefined4 *)(lVar31 + lVar43 * 4) = *(undefined4 *)(lVar22 + lVar43 * 4);
            goto LAB_002a771f;
          }
          lVar26 = lVar36 + 0x400000000 >> 0x20;
          cVar14 = *(char *)(lVar43 + 2 + lVar18 + lVar51);
          if (pcVar21[lVar26] != '\0') {
            if (cVar14 == '\0') {
              uVar6 = puVar10[lVar26];
              goto LAB_002ad246;
            }
            uVar6 = *(uint *)(lVar12 + lVar15 + 8 + lVar43 * 4);
            if (pcVar21[lVar30 - lVar33] != '\0') goto LAB_002ac006;
            uVar6 = TTA::Merge(uVar6,puVar10[lVar26]);
            goto LAB_002ad1d9;
          }
          if (cVar14 != '\0') {
            uVar8 = *(undefined4 *)(lVar22 + lVar43 * 4);
            goto LAB_002ad21d;
          }
        }
        else {
          lVar26 = lVar36 + 0x100000000 >> 0x20;
          if (*(char *)(lVar40 + lVar30) == '\0') {
            if ((pcVar9[lVar26] == '\0') && (*(char *)(lVar40 + lVar26) == '\0')) {
              uVar6 = TTA::NewLabel();
            }
            else {
              uVar6 = *(uint *)((long)puVar53 + lVar37);
            }
            goto LAB_002ac03f;
          }
          if (*(char *)(lVar40 + lVar26) != '\0') {
            if (pcVar21[lVar30] != '\0') {
              if (*(char *)(lVar43 + 2 + lVar18 + lVar51) == '\0') {
                if (*(char *)(lVar43 + 2 + lVar16 + lVar51) != '\0') {
                  *(undefined4 *)(lVar11 + lVar15 + 8 + lVar43 * 4) =
                       *(undefined4 *)((long)puVar10 + lVar37);
                  goto LAB_002a771f;
                }
                uVar6 = TTA::Merge(*(uint *)(lVar22 + lVar43 * 4),*(uint *)((long)puVar53 + lVar37))
                ;
              }
              else {
                uVar6 = *(uint *)(lVar22 + lVar43 * 4);
              }
              *(uint *)(lVar31 + lVar43 * 4) = uVar6;
              goto LAB_002a771f;
            }
            lVar26 = lVar36 + 0x400000000 >> 0x20;
            if (pcVar21[lVar26] == '\0') {
              uVar6 = *(uint *)((long)puVar53 + lVar37);
              local_138 = uVar54 & 0xffffffff;
              goto LAB_002a86fa;
            }
            if (pcVar21[lVar30 - lVar33] == '\0') {
              uVar6 = TTA::Merge(puVar10[lVar26],*(uint *)((long)puVar53 + lVar37));
LAB_002ad0cf:
              *(uint *)(lVar11 + lVar15 + 8 + lVar43 * 4) = uVar6;
            }
            else {
              if (*(char *)(lVar43 + 2 + lVar18 + lVar51) == '\0') {
                if (*(char *)(lVar43 + 2 + lVar16 + lVar51) != '\0') {
                  uVar6 = *(uint *)((long)puVar10 + lVar37);
                  goto LAB_002ad0cf;
                }
                uVar6 = TTA::Merge(*(uint *)(lVar22 + lVar43 * 4),*(uint *)((long)puVar53 + lVar37))
                ;
              }
              else {
                uVar6 = *(uint *)(lVar22 + lVar43 * 4);
              }
              *(uint *)(lVar31 + lVar43 * 4) = uVar6;
            }
            goto LAB_002a6e39;
          }
          local_138 = uVar54;
          if (pcVar9[lVar26] != '\0') {
            if (pcVar21[lVar30] != '\0') {
              if (*(char *)(lVar43 + 2 + lVar18 + lVar51) == '\0') {
                if (*(char *)(lVar43 + 2 + lVar16 + lVar51) == '\0') {
                  uVar6 = TTA::Merge(*(uint *)((long)puVar10 + lVar37),
                                     *(uint *)(lVar22 + lVar43 * 4));
                  *(uint *)(lVar31 + lVar43 * 4) = uVar6;
                }
                else {
                  *(uint *)(lVar11 + lVar15 + 8 + lVar43 * 4) = *(uint *)((long)puVar10 + lVar37);
                }
              }
              else {
                *(undefined4 *)(lVar11 + lVar15 + 8 + lVar43 * 4) =
                     *(undefined4 *)((long)puVar10 + lVar37);
              }
              goto LAB_002a771f;
            }
            lVar26 = lVar36 + 0x400000000 >> 0x20;
            if (pcVar21[lVar26] == '\0') {
              if (*(char *)(lVar43 + 2 + lVar18 + lVar51) != '\0') {
                uVar8 = *(undefined4 *)((long)puVar10 + lVar37);
                goto LAB_002ad21d;
              }
              *(undefined4 *)(lVar31 + lVar43 * 4) = *(undefined4 *)((long)puVar53 + lVar37);
              goto LAB_002a6775;
            }
            cVar14 = *(char *)(lVar43 + 2 + lVar18 + lVar51);
            if (pcVar21[lVar30 - lVar33] != '\0') {
              if (cVar14 != '\0') goto LAB_002abf52;
              uVar6 = *(uint *)((long)puVar10 + lVar37);
              if (*(char *)(lVar43 + 2 + lVar16 + lVar51) != '\0') goto LAB_002acd10;
              uVar6 = TTA::Merge(uVar6,*(uint *)(lVar22 + lVar43 * 4));
              goto LAB_002ac69a;
            }
            if (cVar14 == '\0') {
              uVar6 = puVar10[lVar26];
              uVar7 = *(uint *)((long)puVar53 + lVar37);
            }
            else {
              uVar6 = *(uint *)((long)puVar10 + lVar37);
              uVar7 = puVar10[lVar26];
            }
            uVar6 = TTA::Merge(uVar6,uVar7);
            *(uint *)(lVar31 + lVar43 * 4) = uVar6;
            goto LAB_002a6e39;
          }
          if (pcVar21[lVar30] != '\0') {
            *(undefined4 *)(lVar31 + lVar43 * 4) = *(undefined4 *)(lVar22 + lVar43 * 4);
            goto LAB_002a771f;
          }
          lVar26 = lVar36 + 0x400000000 >> 0x20;
          cVar14 = *(char *)(lVar43 + 2 + lVar18 + lVar51);
          if (pcVar21[lVar26] != '\0') {
            if (cVar14 == '\0') {
              uVar6 = puVar10[lVar26];
              goto LAB_002a8d50;
            }
            uVar6 = *(uint *)(lVar12 + lVar15 + 8 + lVar43 * 4);
            if (pcVar21[lVar30 - lVar33] == '\0') {
              uVar6 = TTA::Merge(uVar6,puVar10[lVar26]);
              *(uint *)(lVar11 + lVar15 + 8 + lVar43 * 4) = uVar6;
            }
            else {
              *(uint *)(lVar11 + lVar15 + 8 + lVar43 * 4) = uVar6;
            }
            goto LAB_002a6e39;
          }
          if (cVar14 != '\0') {
            *(undefined4 *)(lVar31 + lVar43 * 4) = *(undefined4 *)(lVar22 + lVar43 * 4);
            goto LAB_002a7264;
          }
        }
        uVar6 = TTA::NewLabel();
        goto LAB_002ad6d5;
      }
      if (*(char *)(lVar51 + lVar17 + 1 + lVar43) == '\0') {
        cVar14 = *(char *)(lVar30 + 3 + lVar43);
        if (*(char *)(lVar51 + lVar25 + 1 + lVar43) == '\0') {
          if (cVar14 == '\0') {
            local_138 = (ulong)(iVar41 + 2) + lVar43;
            iVar41 = (int)local_138;
            if (*(char *)(lVar43 + 3 + lVar17 + lVar51) == '\0') {
              if (*(char *)(lVar43 + 2 + lVar18 + lVar51) == '\0') {
                *(undefined4 *)(lVar11 + lVar15 + 8 + lVar43 * 4) =
                     *(undefined4 *)((long)puVar10 + lVar37);
                goto LAB_002a9e42;
              }
              *(undefined4 *)(lVar31 + lVar43 * 4) = *(undefined4 *)(lVar22 + lVar43 * 4);
              goto LAB_002aa418;
            }
            lVar26 = lVar36 + 0x400000000 >> 0x20;
            cVar14 = *(char *)(lVar43 + 2 + lVar18 + lVar51);
            if (pcVar21[lVar26] == '\0') {
              if (cVar14 == '\0') {
                uVar8 = *(undefined4 *)((long)puVar10 + lVar37);
                goto LAB_002acc5f;
              }
              *(undefined4 *)(lVar31 + lVar43 * 4) = *(undefined4 *)(lVar22 + lVar43 * 4);
              goto LAB_002a7264;
            }
            cVar2 = *(char *)(lVar43 + 3 + lVar16 + lVar51);
            uVar54 = local_138;
            if (cVar14 != '\0') {
              uVar6 = *(uint *)(lVar12 + lVar15 + 8 + lVar43 * 4);
              if (cVar2 != '\0') goto LAB_002acd10;
              uVar6 = TTA::Merge(uVar6,puVar10[lVar26]);
              goto LAB_002ab504;
            }
            if (cVar2 == '\0') {
              uVar6 = TTA::Merge(*(uint *)((long)puVar10 + lVar37),puVar10[lVar26]);
              *(uint *)(lVar11 + lVar15 + 8 + lVar43 * 4) = uVar6;
            }
            else if (*(char *)(lVar43 + 2 + lVar16 + lVar51) == '\0') {
              uVar6 = TTA::Merge(*(uint *)((long)puVar10 + lVar37),*(uint *)(lVar22 + lVar43 * 4));
              *(uint *)(lVar31 + lVar43 * 4) = uVar6;
            }
            else {
              *(uint *)(lVar11 + lVar15 + 8 + lVar43 * 4) = *(uint *)((long)puVar10 + lVar37);
            }
            goto LAB_002a6e39;
          }
          if (*(char *)(lVar28 + lVar43) != '\0') goto LAB_002aac09;
        }
        else {
          if (cVar14 == '\0') {
            local_138 = (ulong)(iVar41 + 2) + lVar43;
            if (*(char *)(lVar43 + 3 + lVar17 + lVar51) == '\0') {
              uVar6 = *(uint *)((long)puVar10 + lVar37);
              iVar41 = (int)local_138;
              goto LAB_002ab0db;
            }
            lVar26 = lVar36 + 0x400000000 >> 0x20;
            if (pcVar21[lVar26] == '\0') {
              uVar6 = *(uint *)((long)puVar10 + lVar37);
              goto LAB_002ac09c;
            }
            uVar54 = local_138;
            if (*(char *)(lVar43 + 3 + lVar16 + lVar51) == '\0') {
              uVar6 = TTA::Merge(*(uint *)((long)puVar10 + lVar37),puVar10[lVar26]);
              *(uint *)(lVar11 + lVar15 + 8 + lVar43 * 4) = uVar6;
              goto LAB_002a6e39;
            }
            if (*(char *)(lVar43 + 2 + lVar18 + lVar51) != '\0') {
              uVar6 = *(uint *)((long)puVar10 + lVar37);
              goto LAB_002ab504;
            }
            uVar6 = *(uint *)((long)puVar10 + lVar37);
            if (*(char *)(lVar43 + 2 + lVar16 + lVar51) != '\0') goto LAB_002acd10;
            uVar6 = TTA::Merge(uVar6,*(uint *)(lVar22 + lVar43 * 4));
            *(uint *)(lVar31 + lVar43 * 4) = uVar6;
            goto LAB_002a6e39;
          }
          if (*(char *)(lVar28 + lVar43) != '\0') goto LAB_002aac3e;
        }
        uVar6 = *(uint *)(lVar24 + lVar43 * 4);
        if (*(char *)(lVar45 + lVar43) == '\0') {
          uVar6 = TTA::Merge(uVar6,*(uint *)(lVar22 + lVar43 * 4));
        }
      }
      else {
        if (*(char *)(lVar30 + 3 + lVar43) == '\0') goto LAB_002aae7f;
        if (*(char *)(lVar28 + lVar43) == '\0') {
          if (*(char *)(lVar45 + lVar43) == '\0') {
            uVar6 = TTA::Merge(*(uint *)(lVar22 + lVar43 * 4),
                               *(uint *)(lVar15 + lVar11 + lVar43 * 4));
          }
          else {
LAB_002aac3e:
            uVar6 = *(uint *)(lVar24 + lVar43 * 4);
          }
        }
        else {
LAB_002aac09:
          uVar6 = *(uint *)(lVar22 + lVar43 * 4);
        }
      }
      *(uint *)(lVar31 + lVar43 * 4) = uVar6;
      lVar36 = lVar36 + 0x200000000;
      lVar43 = lVar43 + 2;
      lVar26 = lVar26 + 8;
    } while( true );
  }
  if (*(char *)(lVar40 + lVar30) != '\0') {
    lVar11 = lVar11 + 0x400000000 >> 0x20;
    cVar14 = *(char *)(lVar12 + 2 + lVar33 * lVar46 + lVar31 + lVar51);
    if (pcVar21[lVar11] == '\0') {
      if (cVar14 != '\0') {
        *(undefined4 *)(lVar43 + lVar12 * 4) =
             *(undefined4 *)(lVar27 * lVar47 + lVar31 * 4 + lVar15 + 8 + lVar12 * 4);
        goto LAB_002a7264;
      }
      if (pcVar21[lVar24 + 1] == '\0') {
LAB_002a587c:
        uVar6 = TTA::NewLabel();
        *(uint *)(lVar26 + lVar15 + 8 + lVar12 * 4) = uVar6;
        local_138 = local_138 & 0xffffffff;
      }
      else {
        *(uint *)(lVar26 + lVar15 + 8 + lVar12 * 4) = puVar10[lVar24];
      }
      goto LAB_002a6775;
    }
    if (cVar14 == '\0') {
      uVar54 = local_138;
      if (pcVar21[lVar24 + 1] == '\0') {
        *(uint *)(lVar26 + lVar15 + 8 + lVar12 * 4) = puVar10[lVar11];
      }
      else if (pcVar21[lVar30 - lVar33] == '\0') {
        uVar6 = TTA::Merge(puVar10[lVar24],puVar10[lVar11]);
        *(uint *)(lVar26 + lVar15 + 8 + lVar12 * 4) = uVar6;
      }
      else if (*(char *)(lVar12 + 2 + lVar33 * lVar47 + lVar31 + lVar51) == '\0') {
        uVar6 = TTA::Merge(puVar10[lVar24],
                           *(uint *)(lVar27 * lVar47 + lVar31 * 4 + lVar15 + 8 + lVar12 * 4));
        *(uint *)(lVar43 + lVar12 * 4) = uVar6;
      }
      else {
        *(uint *)(lVar26 + lVar15 + 8 + lVar12 * 4) = puVar10[lVar24];
      }
    }
    else {
      uVar6 = *(uint *)(lVar27 * lVar47 + lVar31 * 4 + lVar15 + 8 + lVar12 * 4);
      if (pcVar21[lVar30 - lVar33] == '\0') {
        uVar7 = puVar10[lVar11];
LAB_002a5718:
        uVar6 = TTA::Merge(uVar6,uVar7);
        *(uint *)(lVar26 + lVar15 + 8 + lVar12 * 4) = uVar6;
        uVar54 = local_138;
      }
      else {
LAB_002a556a:
        *(uint *)(lVar26 + lVar15 + 8 + lVar12 * 4) = uVar6;
        uVar54 = local_138;
      }
    }
    goto LAB_002a6e39;
  }
  if (*(char *)(lVar12 + 2 + lVar33 * lVar46 + lVar31 + lVar51) != '\0') {
    *(undefined4 *)(lVar43 + lVar12 * 4) =
         *(undefined4 *)(lVar27 * lVar47 + lVar31 * 4 + lVar15 + 8 + lVar12 * 4);
    goto LAB_002aa418;
  }
  if (pcVar21[lVar24 + 1] == '\0') {
    uVar6 = TTA::NewLabel();
  }
  else {
    uVar6 = puVar10[lVar24];
  }
  *(uint *)(lVar26 + lVar15 + 8 + lVar12 * 4) = uVar6;
  goto LAB_002a9e42;
LAB_002aae7f:
  uVar54 = (ulong)(iVar41 + 2) + lVar43;
  if (*(char *)(lVar43 + 3 + lVar17 + lVar51) != '\0') {
    lVar26 = lVar36 + 0x400000000 >> 0x20;
    if (pcVar21[lVar26] == '\0') {
      uVar6 = *(uint *)((long)puVar53 + lVar37);
      local_138 = uVar54;
      goto LAB_002ac09c;
    }
    if (*(char *)(lVar43 + 3 + lVar16 + lVar51) == '\0') {
      uVar6 = TTA::Merge(puVar10[lVar26],*(uint *)((long)puVar53 + lVar37));
      goto LAB_002ac12e;
    }
    if (*(char *)(lVar43 + 2 + lVar18 + lVar51) != '\0') {
      *(undefined4 *)(lVar31 + lVar43 * 4) = *(undefined4 *)(lVar22 + lVar43 * 4);
      goto LAB_002a6e39;
    }
    if (*(char *)(lVar43 + 2 + lVar16 + lVar51) == '\0') {
      uVar6 = TTA::Merge(*(uint *)(lVar22 + lVar43 * 4),*(uint *)((long)puVar53 + lVar37));
      *(uint *)(lVar31 + lVar43 * 4) = uVar6;
      goto LAB_002a6e39;
    }
LAB_002abf52:
    uVar6 = *(uint *)((long)puVar10 + lVar37);
    goto LAB_002ac12e;
  }
  uVar6 = *(uint *)((long)puVar53 + lVar37);
  iVar41 = (int)uVar54;
LAB_002ab0db:
  puVar53[uVar34] = uVar6;
  lVar16 = (long)iVar41;
  uVar54 = lVar16 + 2;
  if ((int)uVar54 < iVar39) {
    local_138 = uVar54;
    if (*(char *)(lVar40 + uVar54) == '\0') goto LAB_002ab23e;
    if (pcVar9[lVar16 + 1] == '\0') {
      if (pcVar21[lVar16 + 3] == '\0') {
        if (*(char *)(lVar40 + 3 + lVar16) == '\0') {
          if (pcVar21[uVar54] != '\0') {
            puVar53[lVar16 + 2] = puVar10[lVar16 + 2];
            goto LAB_002aa418;
          }
          uVar6 = TTA::NewLabel();
          puVar53[lVar16 + 2] = uVar6;
          goto LAB_002ad553;
        }
        cVar14 = pcVar21[lVar16 + 2];
        if (pcVar21[lVar16 + 4] != '\0') goto joined_r0x002ac378;
        if (cVar14 == '\0') goto LAB_002ad414;
        puVar53[lVar16 + 2] = puVar10[lVar16 + 2];
        goto LAB_002a7264;
      }
      puVar53[lVar16 + 2] = puVar10[lVar16 + 2];
      goto LAB_002aab14;
    }
    if (pcVar21[lVar16 + 3] != '\0') {
      if (pcVar21[lVar16] == '\0') {
        uVar6 = TTA::Merge(puVar10[lVar16 + 2],puVar53[lVar16]);
        puVar53[lVar16 + 2] = uVar6;
      }
      else if (pcVar21[lVar16 + (1 - lVar33)] == '\0') {
        uVar6 = TTA::Merge(puVar10[lVar16],puVar10[lVar16 + 2]);
        puVar53[lVar16 + 2] = uVar6;
      }
      else if (pcVar21[uVar54] == '\0') {
        if (pcVar21[uVar54 - lVar33] == '\0') {
          uVar6 = TTA::Merge(puVar10[lVar16],puVar10[lVar16 + 2]);
          puVar53[lVar16 + 2] = uVar6;
        }
        else {
          puVar53[lVar16 + 2] = puVar10[lVar16];
        }
      }
      else {
        puVar53[lVar16 + 2] = puVar10[lVar16];
      }
      goto LAB_002aab14;
    }
    if (*(char *)(lVar40 + 3 + lVar16) != '\0') {
      if (pcVar21[lVar16 + 4] != '\0') {
        if (pcVar21[lVar16 + (3 - lVar33)] == '\0') goto LAB_002acde2;
        if (pcVar21[lVar16] == '\0') {
          uVar6 = puVar10[lVar16 + 2];
          goto LAB_002ad6ef;
        }
        if (pcVar21[lVar16 + (1 - lVar33)] == '\0') {
          uVar6 = puVar10[lVar16];
          goto LAB_002ad7e9;
        }
        if (pcVar21[uVar54] == '\0') {
          cVar14 = pcVar21[uVar54 - lVar33];
          uVar6 = puVar10[lVar16];
          goto joined_r0x002adc5e;
        }
        puVar53[lVar16 + 2] = puVar10[lVar16];
        goto LAB_002a6e39;
      }
      if (pcVar21[lVar16 + 2] == '\0') goto LAB_002ad51e;
      if (pcVar21[lVar16] == '\0') {
        uVar6 = puVar10[lVar16 + 2];
        uVar7 = puVar53[lVar16];
      }
      else {
        uVar6 = puVar10[lVar16];
        if (pcVar21[lVar16 + (1 - lVar33)] != '\0') {
          puVar53[lVar16 + 2] = uVar6;
          goto LAB_002a7264;
        }
        uVar7 = puVar10[lVar16 + 2];
      }
      uVar6 = TTA::Merge(uVar6,uVar7);
      puVar53[lVar16 + 2] = uVar6;
      goto LAB_002a7264;
    }
    if (pcVar21[lVar16 + 2] != '\0') {
      if (pcVar21[lVar16] == '\0') {
        uVar6 = puVar10[lVar16 + 2];
        uVar7 = puVar53[lVar16];
      }
      else {
        uVar6 = puVar10[lVar16];
        if (pcVar21[lVar16 + (1 - lVar33)] != '\0') {
          puVar53[lVar16 + 2] = uVar6;
          goto LAB_002aa418;
        }
        uVar7 = puVar10[lVar16 + 2];
      }
      uVar6 = TTA::Merge(uVar6,uVar7);
      puVar53[lVar16 + 2] = uVar6;
      goto LAB_002aa418;
    }
    puVar53[lVar16 + 2] = puVar53[lVar16];
LAB_002ad553:
    iVar41 = (int)uVar54;
    goto LAB_002a9e42;
  }
  uVar34 = uVar54 & 0xffffffff;
  if (iVar39 < (int)uVar54) {
    if (*(char *)(lVar40 + uVar34) == '\0') {
      if (pcVar9[uVar34] == '\0') goto LAB_002a9e2a;
LAB_002ac933:
      cVar2 = pcVar9[lVar16 + 1];
      goto joined_r0x002ac939;
    }
    cVar14 = pcVar21[uVar34];
    if (pcVar9[iVar41 + 1] == '\0') goto joined_r0x002abcaa;
    if (cVar14 == '\0') goto LAB_002a9e34;
    if (pcVar21[lVar16] == '\0') {
LAB_002ac309:
      uVar6 = puVar10[uVar34];
      goto LAB_002a9d8b;
    }
    cVar14 = pcVar21[(ulong)(iVar41 + 1) - lVar33];
  }
  else {
    if (*(char *)(lVar40 + uVar34) == '\0') {
      uVar54 = (ulong)(iVar41 + 3);
      if (pcVar9[uVar34] == '\0') {
        if (*(char *)(lVar40 + uVar54) == '\0') {
          cVar14 = pcVar9[uVar54];
          goto joined_r0x002acf5d;
        }
        if (pcVar21[uVar54] != '\0') goto LAB_002ad3d1;
        cVar14 = pcVar21[uVar34];
        goto joined_r0x002abcaa;
      }
      if (*(char *)(lVar40 + uVar54) == '\0') goto LAB_002ac933;
      uVar19 = (ulong)(iVar41 + 1);
      cVar14 = pcVar21[uVar54];
      if (pcVar9[uVar19] == '\0') goto joined_r0x002acf29;
      if (cVar14 != '\0') {
        if (pcVar21[lVar16] == '\0') {
          uVar6 = TTA::Merge(puVar10[uVar34],puVar53[lVar16]);
          puVar53[uVar34] = uVar6;
          goto LAB_002a4ee3;
        }
        if (pcVar21[uVar19 - lVar33] == '\0') {
          uVar6 = TTA::Merge(puVar10[lVar16],puVar10[uVar34]);
        }
        else {
          if (pcVar21[uVar34] == '\0') {
            uVar6 = puVar10[lVar16];
            if (pcVar21[uVar34 - lVar33] != '\0') {
              puVar53[uVar34] = uVar6;
              goto LAB_002a4ee3;
            }
            uVar7 = puVar10[uVar34];
            goto LAB_002a9a3b;
          }
          uVar6 = puVar10[lVar16];
        }
        puVar53[uVar34] = uVar6;
        goto LAB_002a4ee3;
      }
      if (pcVar21[uVar34] == '\0') {
        uVar6 = puVar53[lVar16];
        goto LAB_002ad3d9;
      }
      if (pcVar21[lVar16] == '\0') {
        uVar6 = puVar10[uVar34];
        uVar7 = puVar53[lVar16];
        goto LAB_002ad360;
      }
      cVar14 = pcVar21[uVar19 - lVar33];
      uVar6 = puVar10[lVar16];
      goto joined_r0x002ad357;
    }
    uVar54 = (ulong)(iVar41 + 1);
    cVar14 = pcVar21[lVar16 + 3];
    if (pcVar9[uVar54] == '\0') {
joined_r0x002acf29:
      if (cVar14 != '\0') goto LAB_002ad3d1;
      cVar14 = pcVar21[uVar34];
      goto joined_r0x002abcaa;
    }
    if (cVar14 != '\0') {
      if (pcVar21[lVar16] == '\0') {
        uVar6 = puVar10[uVar34];
        uVar7 = puVar53[lVar16];
      }
      else {
        if (pcVar21[uVar54 - lVar33] != '\0') {
          if (pcVar21[uVar34] == '\0') {
            cVar14 = pcVar21[uVar34 - lVar33];
            uVar6 = puVar10[lVar16];
            goto joined_r0x002ad2d2;
          }
          uVar6 = puVar10[lVar16];
          goto LAB_002acede;
        }
        uVar6 = puVar10[lVar16];
        uVar7 = puVar10[uVar34];
      }
      uVar6 = TTA::Merge(uVar6,uVar7);
LAB_002acede:
      puVar53[uVar34] = uVar6;
      goto LAB_002a4ee3;
    }
    if (pcVar21[uVar34] == '\0') goto LAB_002a9e34;
    if (pcVar21[lVar16] == '\0') goto LAB_002ac309;
    cVar14 = pcVar21[uVar54 - lVar33];
  }
  uVar6 = puVar10[lVar16];
joined_r0x002ad357:
  if (cVar14 != '\0') {
    puVar53[uVar34] = uVar6;
    goto LAB_002a4ee3;
  }
  uVar7 = puVar10[uVar34];
  goto LAB_002ad360;
LAB_002ab23e:
  cVar14 = *(char *)(lVar16 + 3 + lVar40);
  if (pcVar9[lVar16 + 2] == '\0') {
    if (cVar14 == '\0') {
      if (pcVar9[lVar16 + 3] != '\0') {
        uVar6 = TTA::NewLabel();
        puVar53[lVar16 + 2] = uVar6;
        goto LAB_002a5a15;
      }
      puVar13 = puVar53 + uVar54;
      goto LAB_002a50e1;
    }
    cVar14 = pcVar21[lVar16 + 3];
  }
  else {
    if (cVar14 == '\0') {
      if (pcVar9[lVar16 + 1] == '\0') {
        uVar6 = TTA::NewLabel();
        puVar53[lVar16 + 2] = uVar6;
      }
      else {
        puVar53[lVar16 + 2] = puVar53[lVar16];
      }
      goto LAB_002a79e2;
    }
    cVar14 = pcVar21[lVar16 + 3];
    if (pcVar9[lVar16 + 1] != '\0') {
      if (cVar14 != '\0') {
        if (pcVar21[lVar16] == '\0') {
          uVar6 = TTA::Merge(puVar10[lVar16 + 2],puVar53[lVar16]);
          puVar53[lVar16 + 2] = uVar6;
        }
        else if (pcVar21[lVar16 + (1 - lVar33)] == '\0') {
          uVar6 = TTA::Merge(puVar10[lVar16],puVar10[lVar16 + 2]);
          puVar53[lVar16 + 2] = uVar6;
        }
        else if (pcVar21[uVar54] == '\0') {
          if (pcVar21[uVar54 - lVar33] == '\0') {
            uVar6 = TTA::Merge(puVar10[lVar16],puVar10[lVar16 + 2]);
            puVar53[lVar16 + 2] = uVar6;
          }
          else {
            puVar53[lVar16 + 2] = puVar10[lVar16];
          }
        }
        else {
          puVar53[lVar16 + 2] = puVar10[lVar16];
        }
        goto LAB_002a771f;
      }
      if (pcVar21[lVar16 + 4] == '\0') {
        if (pcVar21[lVar16 + 2] == '\0') {
LAB_002ad51e:
          puVar53[lVar16 + 2] = puVar53[lVar16];
          goto LAB_002a6775;
        }
        if (pcVar21[lVar16] == '\0') {
          uVar6 = puVar10[lVar16 + 2];
          uVar7 = puVar53[lVar16];
        }
        else {
          uVar6 = puVar10[lVar16];
          if (pcVar21[lVar16 + (1 - lVar33)] != '\0') {
            puVar53[lVar16 + 2] = uVar6;
            goto LAB_002a7264;
          }
          uVar7 = puVar10[lVar16 + 2];
        }
        uVar6 = TTA::Merge(uVar6,uVar7);
        puVar53[lVar16 + 2] = uVar6;
        goto LAB_002a7264;
      }
      if (pcVar21[lVar16 + (3 - lVar33)] == '\0') {
LAB_002acde2:
        if (pcVar21[uVar54] == '\0') {
          uVar6 = puVar10[lVar16 + 4];
LAB_002ad6ef:
          uVar6 = TTA::Merge(uVar6,puVar53[lVar16]);
          puVar53[lVar16 + 2] = uVar6;
          goto LAB_002a6e39;
        }
        if (pcVar21[lVar16] != '\0') {
          if (pcVar21[lVar16 + (1 - lVar33)] == '\0') {
            uVar6 = TTA::Merge(puVar10[lVar16],puVar10[lVar16 + 2]);
            uVar6 = TTA::Merge(uVar6,puVar10[lVar16 + 4]);
            puVar53[lVar16 + 2] = uVar6;
          }
          else {
            uVar6 = TTA::Merge(puVar10[lVar16],puVar10[lVar16 + 4]);
            puVar53[lVar16 + 2] = uVar6;
          }
          goto LAB_002a6e39;
        }
        uVar6 = TTA::Merge(puVar10[lVar16 + 2],puVar10[lVar16 + 4]);
        uVar7 = puVar53[lVar16];
        goto LAB_002ad96b;
      }
      if (pcVar21[lVar16] == '\0') {
        uVar6 = TTA::Merge(puVar10[lVar16 + 2],puVar53[lVar16]);
        puVar53[lVar16 + 2] = uVar6;
        goto LAB_002a6e39;
      }
      if (pcVar21[lVar16 + (1 - lVar33)] == '\0') {
        uVar6 = TTA::Merge(puVar10[lVar16],puVar10[lVar16 + 2]);
        puVar53[lVar16 + 2] = uVar6;
        goto LAB_002a6e39;
      }
      if (pcVar21[uVar54] != '\0') {
        puVar53[lVar16 + 2] = puVar10[lVar16];
        goto LAB_002a6e39;
      }
      cVar14 = pcVar21[uVar54 - lVar33];
      uVar6 = puVar10[lVar16];
joined_r0x002adc5e:
      if (cVar14 != '\0') goto LAB_002abdf2;
LAB_002ad7e9:
      uVar7 = puVar10[lVar16 + 2];
      goto LAB_002ad96b;
    }
  }
  if (cVar14 != '\0') {
    puVar53[lVar16 + 2] = puVar10[lVar16 + 2];
    goto LAB_002a771f;
  }
  cVar14 = pcVar21[lVar16 + 2];
  if (pcVar21[lVar16 + 4] == '\0') {
    if (cVar14 != '\0') {
      puVar53[lVar16 + 2] = puVar10[lVar16 + 2];
      goto LAB_002a7264;
    }
LAB_002ad414:
    uVar6 = TTA::NewLabel();
    puVar53[lVar16 + 2] = uVar6;
    local_138 = uVar54 & 0xffffffff;
    goto LAB_002a6775;
  }
joined_r0x002ac378:
  if (cVar14 == '\0') {
    puVar53[lVar16 + 2] = puVar10[lVar16 + 4];
    goto LAB_002a6e39;
  }
  uVar6 = puVar10[lVar16 + 2];
  if (pcVar21[lVar16 + (3 - lVar33)] != '\0') {
LAB_002abdf2:
    puVar53[lVar16 + 2] = uVar6;
    goto LAB_002a6e39;
  }
  uVar7 = puVar10[lVar16 + 4];
LAB_002ad96b:
  uVar6 = TTA::Merge(uVar6,uVar7);
  puVar53[lVar16 + 2] = uVar6;
  goto LAB_002a6e39;
LAB_002ab6bf:
  puVar53[uVar34] = 0;
  goto LAB_002a4ee3;
LAB_002aad8e:
  lVar37 = lVar36 >> 0x1e;
LAB_002aad92:
  uVar6 = *(uint *)((long)puVar10 + lVar37);
  goto LAB_002ad3d9;
LAB_002ac238:
  lVar37 = lVar36 >> 0x1e;
LAB_002ac23c:
  uVar6 = *(uint *)((long)puVar53 + lVar37);
  goto LAB_002ad3d9;
LAB_002abd0f:
  if (cVar14 == '\0') {
    cVar14 = pcVar9[uVar54];
joined_r0x002acf5d:
    if (cVar14 == '\0') {
LAB_002a9e2a:
      puVar53[uVar34] = 0;
      goto LAB_002a4ee3;
    }
LAB_002acf63:
    uVar6 = TTA::NewLabel();
    goto LAB_002ad3d9;
  }
  if (pcVar21[uVar54] == '\0') {
    cVar14 = pcVar21[uVar34];
    goto joined_r0x002abcaa;
  }
  goto LAB_002ad3d1;
joined_r0x002ad3cb:
  if (cVar14 == '\0') {
    cVar14 = pcVar21[uVar34];
joined_r0x002abcaa:
    if (cVar14 == '\0') goto LAB_002acf63;
  }
LAB_002ad3d1:
  uVar6 = puVar10[uVar34];
  goto LAB_002ad3d9;
LAB_002a9dca:
  uVar6 = puVar10[uVar34];
LAB_002a9dd2:
  uVar7 = puVar53[lVar16];
LAB_002a9ddc:
  uVar6 = TTA::Merge(uVar6,uVar7);
LAB_002ad3d9:
  puVar53[uVar34] = uVar6;
  goto LAB_002a4ee3;
LAB_002a9dbc:
  uVar6 = puVar10[lVar16];
  goto LAB_002ad3d9;
LAB_002ae4a1:
  uVar54 = (ulong)(iVar41 + iVar23 + 2);
  puVar32 = (undefined4 *)((lVar24 >> 0x1e) + lVar46);
  uVar34 = lVar16 + lVar43 + 2;
LAB_002ae9c7:
  *(undefined4 *)(lVar46 + uVar34 * 4) = *puVar32;
  iVar41 = (int)uVar54;
  lVar12 = (long)iVar41;
  lVar30 = lVar12 << 0x20;
  lVar48 = lVar40 + lVar12 * 4;
  lVar36 = 0;
LAB_002ae9f6:
  uVar34 = lVar12 + lVar36 + 2;
  lVar43 = lVar30 >> 0x20;
  if ((long)uVar34 < lVar35) {
    if (*(char *)(lVar15 + lVar12 + -1 + lVar36) == '\0') {
      uVar54 = (ulong)(iVar41 + 2) + lVar36;
      iVar41 = (int)uVar54;
      lVar43 = lVar30 + 0x300000000 >> 0x20;
      uVar34 = lVar12 + 2 + lVar36;
      if (*(char *)(lVar44 + lVar43) == '\0') goto LAB_002ade90;
      if (*(char *)(lVar31 + lVar43) != '\0') goto LAB_002ae6b2;
      lVar30 = lVar30 + 0x400000000 >> 0x20;
      if (*(char *)(lVar31 + lVar30) == '\0') goto LAB_002ae175;
LAB_002aef9a:
      *(undefined4 *)(lVar48 + lVar36 * 4) = *(undefined4 *)(lVar11 + lVar30 * 4);
LAB_002af030:
      uVar54 = uVar54 & 0xffffffff;
    }
    else {
      lVar24 = lVar30 >> 0x1e;
      if (*(char *)(lVar27 + lVar12 + -1 + lVar36) != '\0') {
        uVar54 = (ulong)(iVar41 + 2) + lVar36;
        if (*(char *)(lVar47 + -1 + lVar12 + lVar36) != '\0') {
          if (*(char *)(lVar31 + lVar43) != '\0') {
            uVar6 = *(uint *)(lVar11 + lVar43 * 4);
            if (*(char *)(lVar26 + lVar43) != '\0') goto LAB_002aeaf2;
            uVar6 = TTA::Merge(uVar6,*(uint *)(lVar51 + lVar12 * 4 + lVar36 * 4));
            goto LAB_002aeaf2;
          }
          uVar6 = TTA::Merge(*(uint *)(lVar51 + lVar12 * 4 + lVar36 * 4),
                             *(uint *)(lVar46 + lVar43 * 4));
          goto LAB_002aeaf2;
        }
        uVar6 = *(uint *)(lVar51 + lVar12 * 4 + lVar36 * 4);
        uVar7 = *(uint *)(lVar46 + lVar24);
LAB_002aeeb9:
        uVar6 = TTA::Merge(uVar6,uVar7);
LAB_002aeaf2:
        *(uint *)(lVar46 + uVar34 * 4) = uVar6;
        iVar41 = (int)uVar54;
        lVar36 = (long)iVar41;
        lVar16 = lVar36 << 0x20;
        lVar48 = lVar51 + lVar36 * 4;
        lVar24 = lVar36 * 4 + lVar46;
        lVar30 = lVar47 + lVar36;
        lVar12 = lVar33 + lVar36;
        lVar17 = 0;
        lVar43 = 0;
LAB_002aeb33:
        uVar34 = lVar36 + lVar43 + 2;
        if ((long)uVar34 < lVar35) {
          if (*(char *)(lVar15 + lVar36 + -1 + lVar43) == '\0') {
            uVar54 = (ulong)(iVar41 + 2) + lVar43;
            iVar41 = (int)uVar54;
            lVar30 = lVar16 + 0x300000000 >> 0x20;
            uVar34 = lVar36 + 2 + lVar43;
            if (*(char *)(lVar44 + lVar30) == '\0') goto LAB_002ade90;
            if (*(char *)(lVar31 + lVar30) != '\0') goto LAB_002ae6b2;
            lVar36 = lVar16 + 0x400000000 >> 0x20;
            if (*(char *)(lVar31 + lVar36) == '\0') {
              if (*(char *)(lVar43 + lVar12) == '\0') goto LAB_002ae175;
              goto LAB_002ae523;
            }
            if (*(char *)(lVar43 + lVar12) == '\0') {
              uVar8 = *(undefined4 *)(lVar11 + lVar36 * 4);
              goto LAB_002af02c;
            }
            cVar14 = *(char *)(lVar52 + lVar30);
            uVar6 = *(uint *)(lVar48 + lVar43 * 4);
            goto joined_r0x002aee36;
          }
          cVar14 = *(char *)(lVar12 + 1 + lVar43);
          if (*(char *)(lVar15 + lVar36 + -2 + lVar43) != '\0') {
            if (cVar14 == '\0') {
              uVar54 = (ulong)(iVar41 + 2) + lVar43;
              if (*(char *)(lVar15 + lVar36 + lVar43) == '\0') {
                uVar6 = *(uint *)(lVar24 + lVar43 * 4);
                goto LAB_002aee67;
              }
              lVar36 = lVar16 + 0x400000000 >> 0x20;
              if (*(char *)(lVar31 + lVar36) == '\0') {
                puVar32 = (undefined4 *)(lVar24 + lVar17);
                goto LAB_002ae9c7;
              }
              if (*(char *)(lVar43 + lVar30) != '\0') {
                if (*(char *)(lVar43 + lVar12) == '\0') {
                  if (*(char *)(lVar43 + -1 + lVar30) == '\0') {
                    uVar6 = *(uint *)(lVar48 + lVar43 * 4);
                    goto LAB_002aef1e;
                  }
                  uVar8 = *(undefined4 *)(lVar48 + -8 + lVar43 * 4);
                }
                else {
                  uVar8 = *(undefined4 *)(lVar48 + lVar43 * 4);
                }
LAB_002af02c:
                *(undefined4 *)(lVar24 + 8 + lVar43 * 4) = uVar8;
                goto LAB_002af030;
              }
              uVar6 = *(uint *)(lVar11 + lVar36 * 4);
LAB_002aef1e:
              uVar6 = TTA::Merge(uVar6,*(uint *)(lVar24 + lVar43 * 4));
              *(uint *)(lVar24 + 8 + lVar43 * 4) = uVar6;
              goto LAB_002ae344;
            }
            if (*(char *)(lVar12 + lVar43) != '\0') goto LAB_002aeb88;
            if (*(char *)(lVar30 + -1 + lVar43) == '\0') {
              uVar6 = TTA::Merge(*(uint *)(lVar48 + lVar43 * 4),*(uint *)(lVar24 + lVar43 * 4));
            }
            else {
              uVar6 = *(uint *)(lVar48 + -8 + lVar43 * 4);
            }
LAB_002aeb8b:
            *(uint *)(lVar24 + 8 + lVar43 * 4) = uVar6;
            lVar16 = lVar16 + 0x200000000;
            lVar43 = lVar43 + 2;
            lVar17 = lVar17 + 8;
            goto LAB_002aeb33;
          }
          if (cVar14 != '\0') {
            if (*(char *)(lVar12 + lVar43) == '\0') {
              uVar6 = *(uint *)(lVar48 + -8 + lVar43 * 4);
              if (*(char *)(lVar30 + -1 + lVar43) == '\0') {
                uVar6 = TTA::Merge(uVar6,*(uint *)(lVar48 + lVar43 * 4));
              }
            }
            else {
LAB_002aeb88:
              uVar6 = *(uint *)(lVar48 + lVar43 * 4);
            }
            goto LAB_002aeb8b;
          }
          uVar54 = (ulong)(iVar41 + 2) + lVar43;
          uVar34 = lVar36 + 2 + lVar43;
          if (*(char *)(lVar15 + lVar36 + lVar43) == '\0') {
            if (*(char *)(lVar43 + lVar12) == '\0') {
              uVar6 = *(uint *)(lVar48 + -8 + lVar43 * 4);
            }
            else {
              uVar6 = *(uint *)(lVar48 + lVar43 * 4);
            }
            goto LAB_002aee67;
          }
          lVar36 = lVar16 + 0x400000000 >> 0x20;
          if (*(char *)(lVar31 + lVar36) == '\0') {
            if (*(char *)(lVar43 + lVar12) == '\0') {
              uVar6 = *(uint *)(lVar48 + -8 + lVar43 * 4);
              goto LAB_002ae194;
            }
LAB_002ae523:
            *(undefined4 *)(lVar46 + uVar34 * 4) = *(undefined4 *)(lVar11 + uVar34 * 4);
            lVar48 = (long)(int)uVar54;
            uVar34 = lVar48 + 2;
            if (iVar39 <= (int)uVar34) {
              if (iVar39 < (int)uVar34) goto LAB_002af296;
              if (*(char *)(lVar44 + uVar34) == '\0') {
                if (*(char *)(lVar48 + 3 + lVar44) == '\0') goto LAB_002af75b;
                cVar14 = *(char *)(lVar31 + 3 + lVar48);
                goto joined_r0x002af55f;
              }
              if (*(char *)(lVar31 + 3 + lVar48) == '\0') {
                uVar6 = *(uint *)(lVar46 + lVar48 * 4);
                goto LAB_002af754;
              }
              if (*(char *)(lVar52 + uVar34) == '\0') {
                uVar6 = *(uint *)(lVar11 + 8 + lVar48 * 4);
                uVar7 = *(uint *)(lVar46 + lVar48 * 4);
              }
              else {
                uVar6 = *(uint *)(lVar11 + lVar48 * 4);
                if (*(char *)(lVar52 + 1 + lVar48) != '\0') {
                  *(uint *)(lVar46 + 8 + lVar48 * 4) = uVar6;
                  goto LAB_002af766;
                }
                uVar7 = *(uint *)(lVar11 + 8 + lVar48 * 4);
              }
              uVar6 = TTA::Merge(uVar6,uVar7);
              *(uint *)(lVar46 + 8 + lVar48 * 4) = uVar6;
              goto LAB_002af766;
            }
            if (*(char *)(lVar44 + 2 + lVar48) == '\0') {
              if (*(char *)(lVar44 + 3 + lVar48) == '\0') goto LAB_002ade8d;
              if (*(char *)(lVar31 + 3 + lVar48) != '\0') goto LAB_002ae5a3;
              if (*(char *)(lVar48 + 4 + lVar31) == '\0') {
LAB_002ae642:
                uVar6 = TTA::NewLabel();
                uVar54 = uVar34 & 0xffffffff;
LAB_002ae194:
                *(uint *)(lVar46 + uVar34 * 4) = uVar6;
                iVar41 = (int)uVar54;
                lVar16 = (long)iVar41;
                lVar30 = lVar16 << 0x20;
                lVar48 = lVar40 + lVar16 * 4;
                lVar43 = 0;
                while( true ) {
                  uVar34 = lVar16 + lVar43 + 2;
                  if (lVar35 <= (long)uVar34) {
                    uVar34 = (ulong)(iVar41 + 2) + lVar43;
                    if (iVar39 < (int)uVar34) {
                      uVar34 = uVar34 & 0xffffffff;
                      goto LAB_002af296;
                    }
                    lVar38 = lVar30 + 0x200000000 >> 0x20;
                    if (*(char *)(lVar44 + lVar38) != '\0') {
                      lVar30 = lVar30 >> 0x20;
                      if (*(char *)(lVar31 + 3 + lVar30) == '\0') {
                        uVar8 = *(undefined4 *)(lVar46 + lVar30 * 4);
                        goto LAB_002af66e;
                      }
                      uVar6 = *(uint *)(lVar11 + lVar38 * 4);
                      uVar7 = *(uint *)(lVar46 + lVar30 * 4);
                      goto LAB_002af439;
                    }
                    lVar35 = lVar30 + 0x300000000 >> 0x20;
                    if (*(char *)(lVar44 + lVar35) == '\0') goto LAB_002af5f1;
                    if (*(char *)(lVar31 + lVar35) == '\0') goto LAB_002af6d6;
                    uVar8 = *(undefined4 *)(lVar11 + lVar38 * 4);
                    goto LAB_002af66e;
                  }
                  if (*(char *)(lVar15 + lVar16 + -1 + lVar43) != '\0') {
                    uVar54 = (ulong)(iVar41 + 2) + lVar43;
                    lVar12 = lVar30 + 0x300000000 >> 0x20;
                    lVar36 = lVar30 >> 0x1e;
                    if (*(char *)(lVar31 + lVar12) != '\0') {
                      uVar6 = *(uint *)(lVar51 + lVar16 * 4 + lVar43 * 4);
                      uVar7 = *(uint *)(lVar46 + lVar36);
                      goto LAB_002aeeb9;
                    }
                    if (*(char *)(lVar44 + lVar12) == '\0') {
                      uVar6 = *(uint *)(lVar46 + lVar36);
                      goto LAB_002aee67;
                    }
                    lVar30 = lVar30 + 0x400000000 >> 0x20;
                    if (*(char *)(lVar31 + lVar30) == '\0') {
                      puVar32 = (undefined4 *)(lVar36 + lVar46);
                      goto LAB_002ae9c7;
                    }
                    if (*(char *)(lVar52 + lVar12) == '\0') {
                      uVar6 = *(uint *)(lVar11 + lVar30 * 4);
                    }
                    else {
                      uVar6 = *(uint *)(lVar51 + lVar16 * 4 + lVar43 * 4);
                    }
                    uVar6 = TTA::Merge(uVar6,*(uint *)(lVar46 + lVar36));
                    *(uint *)(lVar48 + lVar43 * 4) = uVar6;
                    goto LAB_002ae344;
                  }
                  iVar23 = (int)lVar43;
                  if (*(char *)(lVar15 + lVar16 + lVar43) == '\0') {
                    iVar41 = iVar41 + iVar23;
                    goto LAB_002ae4cd;
                  }
                  if (*(char *)(lVar27 + lVar16 + -1 + lVar43) != '\0') break;
                  if (*(char *)(lVar27 + lVar16 + lVar43) != '\0') {
                    *(undefined4 *)(lVar48 + lVar43 * 4) =
                         *(undefined4 *)(lVar51 + lVar16 * 4 + 8 + lVar43 * 4);
                    uVar54 = (ulong)(iVar41 + iVar23 + 2);
                    goto LAB_002ae344;
                  }
                  uVar6 = TTA::NewLabel();
                  *(uint *)(lVar48 + lVar43 * 4) = uVar6;
                  lVar30 = lVar30 + 0x200000000;
                  lVar43 = lVar43 + 2;
                }
                iVar41 = iVar41 + iVar23;
LAB_002ae4e2:
                uVar54 = (ulong)(iVar41 + 2);
                uVar34 = lVar16 + lVar43 + 2;
LAB_002ae6b2:
                *(undefined4 *)(lVar46 + uVar34 * 4) = *(undefined4 *)(lVar11 + uVar34 * 4);
                iVar41 = (int)uVar54;
                lVar36 = (long)iVar41;
                lVar24 = lVar36 << 0x20;
                lVar48 = lVar33 + lVar36;
                lVar30 = lVar40 + lVar36 * 4;
                lVar12 = lVar51 + lVar36 * 4;
                lVar43 = 0;
                do {
                  if (lVar35 <= lVar36 + 2 + lVar43) {
                    uVar34 = (ulong)(iVar41 + 2) + lVar43;
                    if (iVar39 < (int)uVar34) {
                      uVar34 = uVar34 & 0xffffffff;
                      goto LAB_002af296;
                    }
                    lVar38 = lVar24 + 0x200000000 >> 0x20;
                    if (*(char *)(lVar44 + lVar38) == '\0') {
                      lVar35 = lVar24 + 0x300000000 >> 0x20;
                      if (*(char *)(lVar44 + lVar35) == '\0') {
                        *(undefined4 *)(lVar46 + lVar38 * 4) = 0;
                        goto LAB_002af766;
                      }
                      if (*(char *)(lVar31 + lVar35) == '\0') {
                        if (*(char *)(lVar31 + lVar38) == '\0') goto LAB_002af6d6;
                        uVar8 = *(undefined4 *)(lVar11 + lVar38 * 4);
                        goto LAB_002af66e;
                      }
                    }
                    else {
                      lVar24 = lVar24 >> 0x20;
                      if (*(char *)(lVar31 + 3 + lVar24) == '\0') {
                        uVar8 = *(undefined4 *)(lVar46 + lVar24 * 4);
                        goto LAB_002af607;
                      }
                      if (*(char *)(lVar31 + lVar38) == '\0') {
                        if (*(char *)(lVar52 + lVar38) == '\0') {
                          uVar6 = *(uint *)(lVar11 + lVar38 * 4);
                          uVar7 = *(uint *)(lVar46 + lVar24 * 4);
                          goto LAB_002af439;
                        }
                        uVar8 = *(undefined4 *)(lVar11 + lVar24 * 4);
                        goto LAB_002af607;
                      }
                    }
                    uVar8 = *(undefined4 *)(lVar11 + lVar38 * 4);
                    goto LAB_002af607;
                  }
                  if (*(char *)(lVar15 + lVar36 + -1 + lVar43) != '\0') {
                    uVar54 = (ulong)(iVar41 + 2) + lVar43;
                    lVar16 = lVar24 + 0x300000000 >> 0x20;
                    uVar34 = lVar36 + 2 + lVar43;
                    lVar17 = lVar24 >> 0x1e;
                    if (*(char *)(lVar31 + lVar16) != '\0') {
                      if (*(char *)(lVar43 + lVar48) != '\0') {
                        uVar6 = *(uint *)(lVar12 + lVar43 * 4);
                        goto LAB_002aeaf2;
                      }
                      if (*(char *)(lVar43 + -1 + lVar36 + lVar47) == '\0') {
                        uVar6 = *(uint *)(lVar12 + lVar43 * 4);
                        uVar7 = *(uint *)(lVar46 + lVar17);
                        goto LAB_002ae911;
                      }
                      uVar6 = *(uint *)(lVar11 + lVar17);
                      goto LAB_002aeaf2;
                    }
                    if (*(char *)(lVar44 + lVar16) == '\0') {
                      uVar6 = *(uint *)(lVar46 + lVar17);
                      goto LAB_002aee67;
                    }
                    lVar24 = lVar24 + 0x400000000 >> 0x20;
                    if (*(char *)(lVar31 + lVar24) == '\0') {
                      puVar32 = (undefined4 *)(lVar17 + lVar46);
                      goto LAB_002ae9c7;
                    }
                    if (*(char *)(lVar52 + lVar16) == '\0') {
                      uVar6 = *(uint *)(lVar11 + lVar24 * 4);
                      uVar7 = *(uint *)(lVar46 + lVar17);
LAB_002ae949:
                      uVar6 = TTA::Merge(uVar6,uVar7);
                      *(uint *)(lVar30 + lVar43 * 4) = uVar6;
                      goto LAB_002ae344;
                    }
                    if (*(char *)(lVar43 + lVar48) != '\0') {
                      uVar8 = *(undefined4 *)(lVar12 + lVar43 * 4);
                      goto LAB_002ae888;
                    }
                    if (*(char *)(lVar43 + -1 + lVar36 + lVar47) == '\0') {
                      uVar6 = TTA::Merge(*(uint *)(lVar12 + lVar43 * 4),*(uint *)(lVar46 + lVar17));
                      *(uint *)(lVar30 + lVar43 * 4) = uVar6;
                      goto LAB_002ae344;
                    }
                    *(undefined4 *)(lVar30 + lVar43 * 4) = *(undefined4 *)(lVar11 + lVar17);
                    goto LAB_002af030;
                  }
                  if (*(char *)(lVar15 + lVar36 + lVar43) == '\0') goto LAB_002ae765;
                  if (*(char *)(lVar48 + 1 + lVar43) == '\0') {
                    uVar54 = (ulong)(iVar41 + 2) + lVar43;
                    lVar48 = lVar24 + 0x400000000 >> 0x20;
                    cVar14 = *(char *)(lVar33 + lVar36 + lVar43);
                    if (*(char *)(lVar31 + lVar48) == '\0') {
                      uVar34 = lVar36 + lVar43 + 2;
                      if (cVar14 != '\0') goto LAB_002ae523;
                      uVar6 = TTA::NewLabel();
                      goto LAB_002ae194;
                    }
                    if (cVar14 == '\0') {
                      uVar8 = *(undefined4 *)(lVar11 + lVar48 * 4);
LAB_002ae888:
                      *(undefined4 *)(lVar30 + lVar43 * 4) = uVar8;
                    }
                    else {
                      uVar6 = *(uint *)(lVar12 + lVar43 * 4);
                      if (*(char *)(lVar43 + lVar36 + lVar47) == '\0') {
                        uVar7 = *(uint *)(lVar11 + lVar48 * 4);
                        goto LAB_002ae949;
                      }
                      *(uint *)(lVar30 + lVar43 * 4) = uVar6;
                    }
                    goto LAB_002aee40;
                  }
                  *(undefined4 *)(lVar30 + lVar43 * 4) = *(undefined4 *)(lVar12 + lVar43 * 4);
                  lVar24 = lVar24 + 0x200000000;
                  lVar43 = lVar43 + 2;
                } while( true );
              }
LAB_002ae629:
              uVar6 = *(uint *)(lVar11 + 0x10 + lVar48 * 4);
LAB_002ae685:
              *(uint *)(lVar46 + 8 + lVar48 * 4) = uVar6;
              uVar54 = uVar34;
            }
            else {
              if (*(char *)(lVar31 + 3 + lVar48) != '\0') {
                if (*(char *)(lVar52 + uVar34) == '\0') {
                  uVar6 = TTA::Merge(*(uint *)(lVar11 + 8 + lVar48 * 4),
                                     *(uint *)(lVar46 + lVar48 * 4));
                  uVar54 = uVar34 & 0xffffffff;
                }
                else {
                  uVar6 = *(uint *)(lVar11 + lVar48 * 4);
                  if (*(char *)(lVar26 + lVar48) == '\0') {
                    uVar6 = TTA::Merge(uVar6,*(uint *)(lVar11 + 8 + lVar48 * 4));
                  }
                  uVar54 = uVar34 & 0xffffffff;
                }
                goto LAB_002aeaf2;
              }
              if (*(char *)(lVar44 + 3 + lVar48) == '\0') {
                uVar6 = *(uint *)(lVar46 + lVar48 * 4);
                goto LAB_002ae619;
              }
              if (*(char *)(lVar48 + 4 + lVar31) == '\0') {
                puVar32 = (undefined4 *)(lVar48 * 4 + lVar46);
                uVar54 = uVar34 & 0xffffffff;
                goto LAB_002ae9c7;
              }
              if (*(char *)(lVar52 + 3 + lVar48) == '\0') {
                uVar6 = TTA::Merge(*(uint *)(lVar11 + 0x10 + lVar48 * 4),
                                   *(uint *)(lVar46 + lVar48 * 4));
                goto LAB_002ae685;
              }
              uVar54 = uVar34;
              if (*(char *)(lVar52 + uVar34) == '\0') {
                uVar6 = *(uint *)(lVar11 + 8 + lVar48 * 4);
                uVar7 = *(uint *)(lVar46 + lVar48 * 4);
              }
              else {
                uVar6 = *(uint *)(lVar11 + lVar48 * 4);
                if (*(char *)(lVar26 + lVar48) != '\0') {
                  *(uint *)(lVar46 + 8 + lVar48 * 4) = uVar6;
                  goto LAB_002ae344;
                }
                uVar7 = *(uint *)(lVar11 + 8 + lVar48 * 4);
              }
              uVar6 = TTA::Merge(uVar6,uVar7);
              *(uint *)(lVar46 + 8 + lVar48 * 4) = uVar6;
            }
            goto LAB_002ae344;
          }
          cVar14 = *(char *)(lVar43 + lVar30);
          if (*(char *)(lVar43 + lVar12) == '\0') {
            if (cVar14 == '\0') {
              uVar6 = *(uint *)(lVar48 + -8 + lVar43 * 4);
              uVar7 = *(uint *)(lVar11 + lVar36 * 4);
            }
            else {
              uVar6 = *(uint *)(lVar48 + -8 + lVar43 * 4);
              if (*(char *)(lVar43 + -1 + lVar30) != '\0') {
                *(uint *)(lVar24 + 8 + lVar43 * 4) = uVar6;
                goto LAB_002af04c;
              }
              uVar7 = *(uint *)(lVar48 + lVar43 * 4);
            }
            uVar6 = TTA::Merge(uVar6,uVar7);
            *(uint *)(lVar24 + 8 + lVar43 * 4) = uVar6;
          }
          else {
            uVar6 = *(uint *)(lVar48 + lVar43 * 4);
joined_r0x002aee36:
            if (cVar14 == '\0') {
              uVar6 = TTA::Merge(uVar6,*(uint *)(lVar11 + lVar36 * 4));
              *(uint *)(lVar24 + 8 + lVar43 * 4) = uVar6;
            }
            else {
              *(uint *)(lVar24 + 8 + lVar43 * 4) = uVar6;
LAB_002aee40:
              uVar54 = uVar54 & 0xffffffff;
            }
          }
          goto LAB_002ae344;
        }
        lVar38 = lVar16 + 0x200000000 >> 0x20;
        lVar35 = lVar16 >> 0x20;
        if (iVar39 < iVar41 + (int)lVar43 + 2) {
          if (*(char *)(lVar44 + lVar38) == '\0') goto LAB_002af538;
          if (*(char *)(lVar44 + 1 + lVar35) == '\0') {
            if (*(char *)(lVar31 + lVar38) != '\0') goto LAB_002af52f;
            uVar8 = *(undefined4 *)(lVar11 + lVar35 * 4);
          }
          else {
            uVar8 = *(undefined4 *)(lVar46 + lVar35 * 4);
          }
          goto LAB_002af607;
        }
        if (*(char *)(lVar44 + lVar38) == '\0') {
          lVar35 = lVar16 + 0x300000000 >> 0x20;
          if (*(char *)(lVar44 + lVar35) == '\0') goto LAB_002af5f1;
          if ((*(char *)(lVar31 + lVar35) == '\0') && (*(char *)(lVar31 + lVar38) == '\0'))
          goto LAB_002af6d6;
        }
        else {
          cVar14 = *(char *)(lVar31 + 3 + lVar35);
          if (*(char *)(lVar44 + 1 + lVar35) != '\0') {
            if (cVar14 != '\0') {
              if (*(char *)(lVar31 + lVar38) != '\0') goto LAB_002af66a;
              if (*(char *)(lVar52 + lVar38) != '\0') goto LAB_002af677;
              uVar6 = *(uint *)(lVar11 + lVar38 * 4);
              uVar7 = *(uint *)(lVar46 + lVar35 * 4);
LAB_002af439:
              uVar6 = TTA::Merge(uVar6,uVar7);
              goto LAB_002af6de;
            }
            uVar8 = *(undefined4 *)(lVar46 + lVar35 * 4);
            goto LAB_002af66e;
          }
          if (cVar14 == '\0') {
            if (*(char *)(lVar31 + lVar38) != '\0') goto LAB_002af66a;
LAB_002af677:
            uVar8 = *(undefined4 *)(lVar11 + lVar35 * 4);
LAB_002af66e:
            *(undefined4 *)(lVar46 + lVar38 * 4) = uVar8;
            goto LAB_002af766;
          }
          if (*(char *)(lVar31 + lVar38) == '\0') {
            uVar6 = *(uint *)(lVar11 + lVar35 * 4);
            if (*(char *)(lVar52 + lVar38) == '\0') {
              uVar6 = TTA::Merge(uVar6,*(uint *)(lVar11 + lVar38 * 4));
              *(uint *)(lVar46 + lVar38 * 4) = uVar6;
            }
            else {
              *(uint *)(lVar46 + lVar38 * 4) = uVar6;
            }
            goto LAB_002af766;
          }
        }
LAB_002af66a:
        uVar8 = *(undefined4 *)(lVar11 + lVar38 * 4);
        goto LAB_002af66e;
      }
      if (*(char *)(lVar15 + lVar12 + lVar36) == '\0') {
        uVar54 = (ulong)(iVar41 + (int)lVar36 + 2);
        uVar6 = *(uint *)(lVar46 + lVar24);
        uVar34 = lVar12 + lVar36 + 2;
        goto LAB_002aee67;
      }
      if (*(char *)(lVar27 + lVar12 + lVar36) == '\0') {
        *(undefined4 *)(lVar48 + lVar36 * 4) = *(undefined4 *)(lVar48 + -8 + lVar36 * 4);
        lVar30 = lVar30 + 0x200000000;
        lVar36 = lVar36 + 2;
        goto LAB_002ae9f6;
      }
      uVar54 = (ulong)(iVar41 + 2) + lVar36;
      if (*(char *)(lVar36 + lVar47 + lVar12) == '\0') {
        uVar6 = TTA::Merge(*(uint *)(lVar51 + lVar12 * 4 + 8 + lVar36 * 4),
                           *(uint *)(lVar46 + lVar24));
        *(uint *)(lVar48 + lVar36 * 4) = uVar6;
        goto LAB_002ae344;
      }
      if (*(char *)(lVar36 + -1 + lVar47 + lVar12) == '\0') {
        uVar6 = TTA::Merge(*(uint *)(lVar51 + lVar12 * 4 + lVar36 * 4),*(uint *)(lVar46 + lVar24));
        *(uint *)(lVar48 + lVar36 * 4) = uVar6;
        goto LAB_002ae344;
      }
      if (*(char *)(lVar31 + lVar43) == '\0') {
        uVar6 = *(uint *)(lVar51 + lVar12 * 4 + lVar36 * 4);
        uVar7 = *(uint *)(lVar46 + lVar43 * 4);
        goto LAB_002af07d;
      }
      uVar6 = *(uint *)(lVar11 + lVar43 * 4);
      if (*(char *)(lVar26 + lVar43) == '\0') goto LAB_002ae0d0;
LAB_002aedf5:
      *(uint *)(lVar48 + lVar36 * 4) = uVar6;
LAB_002af04c:
      uVar54 = uVar54 & 0xffffffff;
    }
    goto LAB_002ae344;
  }
  uVar34 = (ulong)(iVar41 + 2) + lVar36;
  if (iVar39 < (int)uVar34) {
    uVar34 = uVar34 & 0xffffffff;
    goto LAB_002af296;
  }
  lVar38 = lVar30 + 0x200000000 >> 0x20;
  if (*(char *)(lVar44 + lVar38) == '\0') {
    lVar35 = lVar30 + 0x300000000 >> 0x20;
    if (*(char *)(lVar44 + lVar35) == '\0') goto LAB_002af5ba;
    cVar14 = *(char *)(lVar31 + lVar35);
joined_r0x002af4da:
    if (cVar14 == '\0') {
LAB_002af610:
      uVar6 = TTA::NewLabel();
LAB_002af6b1:
      *(uint *)(lVar46 + lVar38 * 4) = uVar6;
      goto LAB_002af766;
    }
LAB_002af5ab:
    uVar8 = *(undefined4 *)(lVar11 + lVar38 * 4);
LAB_002af5b0:
    *(undefined4 *)(lVar46 + lVar38 * 4) = uVar8;
  }
  else {
    if (*(char *)(lVar31 + 3 + lVar43) == '\0') {
      uVar8 = *(undefined4 *)(lVar46 + lVar43 * 4);
      goto LAB_002af5b0;
    }
    if (*(char *)(lVar52 + lVar38) == '\0') {
      uVar6 = TTA::Merge(*(uint *)(lVar11 + lVar38 * 4),*(uint *)(lVar46 + lVar43 * 4));
      goto LAB_002af6b1;
    }
    if (*(char *)(lVar31 + lVar43) == '\0') {
      uVar6 = *(uint *)(lVar11 + lVar38 * 4);
      uVar7 = *(uint *)(lVar46 + lVar43 * 4);
      goto LAB_002af6fa;
    }
    cVar14 = *(char *)(lVar52 + 1 + lVar43);
LAB_002af3e5:
    uVar6 = *(uint *)(lVar11 + lVar43 * 4);
    if (cVar14 == '\0') {
      uVar7 = *(uint *)(lVar11 + lVar38 * 4);
LAB_002af6fa:
      uVar6 = TTA::Merge(uVar6,uVar7);
      *(uint *)(lVar46 + lVar38 * 4) = uVar6;
    }
    else {
      *(uint *)(lVar46 + lVar38 * 4) = uVar6;
    }
  }
  goto LAB_002af766;
LAB_002ae765:
  iVar41 = iVar41 + (int)lVar43 + 2;
  uVar34 = lVar36 + lVar43 + 2;
LAB_002ade90:
  *(undefined4 *)(lVar46 + uVar34 * 4) = 0;
  lVar12 = (long)iVar41;
  lVar30 = lVar12 << 0x20;
  lVar48 = lVar40 + lVar12 * 4;
  lVar36 = 0;
  do {
    lVar43 = lVar30 >> 0x20;
    if (lVar35 <= lVar12 + 2 + lVar36) {
      lVar38 = lVar30 + 0x200000000 >> 0x20;
      if (iVar39 < iVar41 + (int)lVar36 + 2) {
        if (*(char *)(lVar44 + lVar38) == '\0') goto LAB_002af5ba;
        cVar14 = *(char *)(lVar31 + lVar38);
      }
      else {
        if (*(char *)(lVar44 + lVar38) == '\0') {
          lVar35 = lVar30 + 0x300000000 >> 0x20;
          if (*(char *)(lVar44 + lVar35) == '\0') goto LAB_002af5ba;
          if (*(char *)(lVar31 + lVar35) != '\0') goto LAB_002af5ab;
          cVar14 = *(char *)(lVar31 + lVar38);
          goto joined_r0x002af4da;
        }
        cVar14 = *(char *)(lVar31 + lVar38);
        if (*(char *)(lVar31 + 3 + lVar43) != '\0') {
          if ((cVar14 != '\0') || (*(char *)(lVar31 + 1 + lVar43) == '\0')) goto LAB_002af5ab;
          cVar14 = *(char *)(lVar52 + lVar38);
          goto LAB_002af3e5;
        }
      }
      if (cVar14 != '\0') goto LAB_002af5ab;
      if (*(char *)(lVar31 + 1 + lVar43) == '\0') goto LAB_002af610;
      uVar8 = *(undefined4 *)(lVar11 + lVar43 * 4);
      goto LAB_002af5b0;
    }
    if (*(char *)(lVar15 + lVar12 + -1 + lVar36) != '\0') {
      uVar54 = (ulong)(iVar41 + 2) + lVar36;
      lVar24 = lVar30 + 0x300000000 >> 0x20;
      uVar34 = lVar12 + 2 + lVar36;
      if (*(char *)(lVar31 + lVar24) != '\0') {
        if ((*(char *)(lVar36 + lVar33 + lVar12) == '\0') && (*(char *)(lVar38 + lVar43) != '\0')) {
          uVar6 = *(uint *)(lVar11 + lVar43 * 4);
          if (*(char *)(lVar36 + -1 + lVar47 + lVar12) == '\0') {
            uVar7 = *(uint *)(lVar51 + lVar12 * 4 + lVar36 * 4);
LAB_002ae911:
            uVar6 = TTA::Merge(uVar6,uVar7);
          }
        }
        else {
          uVar6 = *(uint *)(lVar51 + lVar12 * 4 + lVar36 * 4);
        }
        goto LAB_002aeaf2;
      }
      if (*(char *)(lVar44 + lVar24) == '\0') {
        if (*(char *)(lVar36 + lVar33 + lVar12) == '\0') {
          if (*(char *)(lVar38 + lVar43) == '\0') {
            uVar6 = TTA::NewLabel();
          }
          else {
            uVar6 = *(uint *)(lVar11 + lVar43 * 4);
          }
        }
        else {
          uVar6 = *(uint *)(lVar51 + lVar12 * 4 + lVar36 * 4);
        }
        goto LAB_002aee67;
      }
      lVar30 = lVar30 + 0x400000000 >> 0x20;
      cVar14 = *(char *)(lVar36 + lVar33 + lVar12);
      if (*(char *)(lVar31 + lVar30) == '\0') {
        if (cVar14 != '\0') goto LAB_002ae523;
        if (*(char *)(lVar38 + lVar43) == '\0') goto LAB_002ae175;
        uVar6 = *(uint *)(lVar11 + lVar43 * 4);
        goto LAB_002ae194;
      }
      if (cVar14 != '\0') {
        uVar6 = *(uint *)(lVar51 + lVar12 * 4 + lVar36 * 4);
        if (*(char *)(lVar52 + lVar24) != '\0') goto LAB_002ae005;
        uVar7 = *(uint *)(lVar11 + lVar30 * 4);
        goto LAB_002ae0e5;
      }
      if (*(char *)(lVar38 + lVar43) == '\0') {
        *(undefined4 *)(lVar48 + lVar36 * 4) = *(undefined4 *)(lVar11 + lVar30 * 4);
        goto LAB_002aee40;
      }
      if (*(char *)(lVar52 + lVar24) == '\0') {
        uVar6 = *(uint *)(lVar11 + lVar43 * 4);
        uVar7 = *(uint *)(lVar11 + lVar30 * 4);
        goto LAB_002af07d;
      }
      uVar6 = *(uint *)(lVar11 + lVar43 * 4);
      if (*(char *)(lVar36 + -1 + lVar47 + lVar12) != '\0') goto LAB_002aedf5;
      goto LAB_002ae0d0;
    }
    if (*(char *)(lVar15 + lVar12 + lVar36) != '\0') break;
    *(undefined4 *)(lVar48 + lVar36 * 4) = 0;
    lVar30 = lVar30 + 0x200000000;
    lVar36 = lVar36 + 2;
  } while( true );
  uVar54 = (ulong)(iVar41 + 2) + lVar36;
  uVar34 = lVar12 + 2 + lVar36;
  if (*(char *)(lVar33 + 1 + lVar12 + lVar36) == '\0') goto LAB_002adfb9;
  goto LAB_002ae6b2;
LAB_002adfb9:
  lVar30 = lVar30 + 0x400000000 >> 0x20;
  cVar14 = *(char *)(lVar36 + lVar33 + lVar12);
  if (*(char *)(lVar31 + lVar30) != '\0') {
    if (cVar14 == '\0') goto LAB_002aef9a;
    uVar6 = *(uint *)(lVar51 + lVar12 * 4 + lVar36 * 4);
    if (*(char *)(lVar36 + lVar47 + lVar12) != '\0') {
LAB_002ae005:
      *(uint *)(lVar48 + lVar36 * 4) = uVar6;
      goto LAB_002aee40;
    }
    uVar7 = *(uint *)(lVar11 + lVar30 * 4);
LAB_002ae0e5:
    uVar6 = TTA::Merge(uVar6,uVar7);
    *(uint *)(lVar48 + lVar36 * 4) = uVar6;
    goto LAB_002ae344;
  }
  if (cVar14 != '\0') goto LAB_002ae523;
LAB_002ae175:
  uVar6 = TTA::NewLabel();
  goto LAB_002ae194;
LAB_002af5f1:
  *(undefined4 *)(lVar46 + lVar38 * 4) = 0;
  goto LAB_002af766;
LAB_002af6d6:
  uVar6 = TTA::NewLabel();
LAB_002af6de:
  *(uint *)(lVar46 + lVar38 * 4) = uVar6;
  goto LAB_002af766;
LAB_002ae0d0:
  uVar7 = *(uint *)(lVar51 + lVar12 * 4 + lVar36 * 4);
LAB_002af07d:
  uVar6 = TTA::Merge(uVar6,uVar7);
  *(uint *)(lVar48 + lVar36 * 4) = uVar6;
  goto LAB_002ae344;
LAB_002af5ba:
  *(undefined4 *)(lVar46 + lVar38 * 4) = 0;
  goto LAB_002af766;
LAB_002af296:
  lVar38 = (long)(int)uVar34;
  if (*(char *)(lVar44 + lVar38) == '\0') {
    *(undefined4 *)(lVar46 + lVar38 * 4) = 0;
  }
  else {
    *(undefined4 *)(lVar46 + lVar38 * 4) = *(undefined4 *)(lVar46 + -8 + lVar38 * 4);
  }
  goto LAB_002af766;
LAB_002af538:
  *(undefined4 *)(lVar46 + lVar38 * 4) = 0;
  goto LAB_002af766;
LAB_002a48e5:
  uVar54 = (ulong)(iVar41 + iVar23 + 2);
  uVar6 = *(uint *)(lVar27 + lVar48 * 4);
  uVar34 = lVar15 + lVar48 + 2;
  goto LAB_002a4756;
code_r0x002a458d:
  uVar6 = TTA::NewLabel();
  *(uint *)(lVar35 + 8 + lVar46 * 4) = uVar6;
  if (cVar14 != '\0') {
LAB_002a45d9:
    lVar44 = lVar46 + 4;
    lVar46 = lVar46 << 0x20;
    lVar47 = lVar46 + 0x400000000;
    do {
      lVar46 = lVar46 + 0x200000000;
      if ((long)(uVar42 - 2) <= lVar44) {
        lVar47 = lVar47 >> 0x20;
        if (iVar39 < (int)lVar44) {
          if (*(char *)(lVar38 + lVar47) == '\0') {
LAB_002a4b8d:
            *(undefined4 *)(lVar35 + lVar47 * 4) = 0;
            goto LAB_002af766;
          }
          uVar6 = *(uint *)(lVar35 + (lVar46 >> 0x1e));
        }
        else if (*(char *)(lVar38 + lVar47) == '\0') {
          if (*(char *)(lVar38 + 3 + (lVar46 >> 0x20)) == '\0') goto LAB_002a4b8d;
          uVar6 = TTA::NewLabel();
        }
        else {
          uVar6 = *(uint *)(lVar35 + (lVar46 >> 0x20) * 4);
        }
        *(uint *)(lVar35 + lVar47 * 4) = uVar6;
        goto LAB_002af766;
      }
      cVar14 = *(char *)(lVar38 + 1 + lVar44);
      if (*(char *)(lVar38 + lVar44) == '\0') {
        if (cVar14 == '\0') {
          uVar8 = 0;
          goto LAB_002a464d;
        }
        uVar6 = TTA::NewLabel();
      }
      else {
        if (cVar14 == '\0') goto LAB_002a463b;
        uVar6 = *(uint *)(lVar35 + -8 + lVar44 * 4);
      }
      *(uint *)(lVar35 + lVar44 * 4) = uVar6;
      lVar44 = lVar44 + 2;
      lVar47 = lVar47 + 0x200000000;
    } while( true );
  }
  goto LAB_002a4570;
LAB_002a463b:
  uVar8 = *(undefined4 *)(lVar35 + -8 + lVar44 * 4);
LAB_002a464d:
  *(undefined4 *)(lVar35 + lVar44 * 4) = uVar8;
  goto LAB_002a4570;
}

Assistant:

void PerformLabeling()
    {
        const int h = img_.rows;
        const int w = img_.cols;

        int e_rows = h & 0xfffffffe;
        bool o_rows = h % 2 == 1;
        int e_cols = w & 0xfffffffe;
        bool o_cols = w % 2 == 1;

        img_labels_ = cv::Mat1i(img_.size()); // Memory allocation for the output image

        LabelsSolver::Alloc(UPPER_BOUND_8_CONNECTIVITY); // Memory allocation of the labels solver
        LabelsSolver::Setup(); // Labels solver initialization

                               // We work with 2x2 blocks
                               // +-+-+-+
                               // |P|Q|R|
                               // +-+-+-+
                               // |S|X|
                               // +-+-+

                               // The pixels are named as follows
                               // +---+---+---+
                               // |a b|c d|e f|
                               // |g h|i j|k l|
                               // +---+---+---+
                               // |m n|o p|
                               // |q r|s t|
                               // +---+---+

                               // Pixels a, f, l, q are not needed, since we need to understand the
                               // the connectivity between these blocks and those pixels only matter
                               // when considering the outer connectivities

                               // A bunch of defines used to check if the pixels are foreground,
                               // without going outside the image limits.

                               // First scan

        // Define Conditions and Actions
        {
#define CONDITION_B img_row_prev_prev[c-1]>0
#define CONDITION_C img_row_prev_prev[c]>0
#define CONDITION_D img_row_prev_prev[c+1]>0
#define CONDITION_E img_row_prev_prev[c+2]>0

#define CONDITION_G img_row_prev[c-2]>0
#define CONDITION_H img_row_prev[c-1]>0
#define CONDITION_I img_row_prev[c]>0
#define CONDITION_J img_row_prev[c+1]>0
#define CONDITION_K img_row_prev[c+2]>0

#define CONDITION_M img_row[c-2]>0
#define CONDITION_N img_row[c-1]>0
#define CONDITION_O img_row[c]>0
#define CONDITION_P img_row[c+1]>0

#define CONDITION_R img_row_fol[c-1]>0
#define CONDITION_S img_row_fol[c]>0
#define CONDITION_T img_row_fol[c+1]>0

            // Action 1: No action
#define ACTION_1 img_labels_row[c] = 0; 
                               // Action 2: New label (the block has foreground pixels and is not connected to anything else)
#define ACTION_2 img_labels_row[c] = LabelsSolver::NewLabel(); 
                               //Action 3: Assign label of block P
#define ACTION_3 img_labels_row[c] = img_labels_row_prev_prev[c - 2];
                               // Action 4: Assign label of block Q 
#define ACTION_4 img_labels_row[c] = img_labels_row_prev_prev[c];
                               // Action 5: Assign label of block R
#define ACTION_5 img_labels_row[c] = img_labels_row_prev_prev[c + 2];
                               // Action 6: Assign label of block S
#define ACTION_6 img_labels_row[c] = img_labels_row[c - 2]; 
                               // Action 7: Merge labels of block P and Q
#define ACTION_7 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c]);
                               //Action 8: Merge labels of block P and R
#define ACTION_8 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c + 2]);
                               // Action 9 Merge labels of block P and S
#define ACTION_9 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row[c - 2]);
                               // Action 10 Merge labels of block Q and R
#define ACTION_10 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row_prev_prev[c + 2]);
                               // Action 11: Merge labels of block Q and S
#define ACTION_11 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row[c - 2]);
                               // Action 12: Merge labels of block R and S
#define ACTION_12 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c + 2], img_labels_row[c - 2]);
                               // Action 13: Merge labels of block P, Q and R
#define ACTION_13 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c]), img_labels_row_prev_prev[c + 2]);
                               // Action 14: Merge labels of block P, Q and S
#define ACTION_14 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c]), img_labels_row[c - 2]);
                               //Action 15: Merge labels of block P, R and S
#define ACTION_15 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c + 2]), img_labels_row[c - 2]);
                               //Action 16: labels of block Q, R and S
#define ACTION_16 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row_prev_prev[c + 2]), img_labels_row[c - 2]);
        }

        if (h == 1) {
            // Single line
            int r = 0;
            const unsigned char* const img_row = img_.ptr<unsigned char>(0);
            unsigned* const img_labels_row = img_labels_.ptr<unsigned>(0);
            int c = -2;
#include "labeling_tagliatelle_2021_sl_forest.inc.h"
        }
        else {
            // More than one line

            // First couple of lines
            {
                int r = 0;
                const unsigned char* const img_row = img_.ptr<unsigned char>(0);
                const unsigned char* const img_row_fol = (unsigned char*)(((char*)img_row) + img_.step.p[0]);
                unsigned* const img_labels_row = img_labels_.ptr<unsigned>(0);
                int c = -2;

#include "labeling_tagliatelle_2021_fl_forest.inc.h"
            }

            // Every other line but the last one if image has an odd number of rows
            for (int r = 2; r < e_rows; r += 2) {
                // Get rows pointer
                const unsigned char* const img_row = img_.ptr<unsigned char>(r);
                const unsigned char* const img_row_prev = (unsigned char*)(((char*)img_row) - img_.step.p[0]);
                const unsigned char* const img_row_prev_prev = (unsigned char*)(((char*)img_row_prev) - img_.step.p[0]);
                const unsigned char* const img_row_fol = (unsigned char*)(((char*)img_row) + img_.step.p[0]);
                unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
                unsigned* const img_labels_row_prev_prev = (unsigned*)(((char*)img_labels_row) - img_labels_.step.p[0] - img_labels_.step.p[0]);

                int c = -2;
                goto cl_tree_0;

#include "labeling_tagliatelle_2021_cl_forest.inc.h"
            }

            // Last line (in case the rows are odd)
            if (o_rows)
            {
                int r = h - 1;
                const unsigned char* const img_row = img_.ptr<unsigned char>(r);
                const unsigned char* const img_row_prev = (unsigned char*)(((char*)img_row) - img_.step.p[0]);
                const unsigned char* const img_row_prev_prev = (unsigned char*)(((char*)img_row_prev) - img_.step.p[0]);
                unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
                unsigned* const img_labels_row_prev_prev = (unsigned*)(((char*)img_labels_row) - img_labels_.step.p[0] - img_labels_.step.p[0]);
                int c = -2;
#include "labeling_tagliatelle_2021_ll_forest.inc.h"
            }
        }


        // Undef Conditions and Actions
        {
#undef ACTION_1
#undef ACTION_2
#undef ACTION_3
#undef ACTION_4
#undef ACTION_5
#undef ACTION_6
#undef ACTION_7
#undef ACTION_8
#undef ACTION_9
#undef ACTION_10
#undef ACTION_11
#undef ACTION_12
#undef ACTION_13
#undef ACTION_14
#undef ACTION_15
#undef ACTION_16


#undef CONDITION_B
#undef CONDITION_C
#undef CONDITION_D
#undef CONDITION_E

#undef CONDITION_G
#undef CONDITION_H
#undef CONDITION_I
#undef CONDITION_J
#undef CONDITION_K

#undef CONDITION_M
#undef CONDITION_N
#undef CONDITION_O
#undef CONDITION_P

#undef CONDITION_R
#undef CONDITION_S
#undef CONDITION_T
        }

        // Second scan
        n_labels_ = LabelsSolver::Flatten();

        int r = 0;
        for (; r < e_rows; r += 2) {
            // Get rows pointer
            const unsigned char* const img_row = img_.ptr<unsigned char>(r);
            const unsigned char* const img_row_fol = (unsigned char*)(((char*)img_row) + img_.step.p[0]);

            unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
            unsigned* const img_labels_row_fol = (unsigned*)(((char*)img_labels_row) + img_labels_.step.p[0]);
            int c = 0;
            for (; c < e_cols; c += 2) {
                int iLabel = img_labels_row[c];
                if (iLabel > 0) {
                    iLabel = LabelsSolver::GetLabel(iLabel);
                    if (img_row[c] > 0)
                        img_labels_row[c] = iLabel;
                    else
                        img_labels_row[c] = 0;
                    if (img_row[c + 1] > 0)
                        img_labels_row[c + 1] = iLabel;
                    else
                        img_labels_row[c + 1] = 0;
                    if (img_row_fol[c] > 0)
                        img_labels_row_fol[c] = iLabel;
                    else
                        img_labels_row_fol[c] = 0;
                    if (img_row_fol[c + 1] > 0)
                        img_labels_row_fol[c + 1] = iLabel;
                    else
                        img_labels_row_fol[c + 1] = 0;
                }
                else {
                    img_labels_row[c] = 0;
                    img_labels_row[c + 1] = 0;
                    img_labels_row_fol[c] = 0;
                    img_labels_row_fol[c + 1] = 0;
                }
            }
            // Last column if the number of columns is odd
            if (o_cols) {
                int iLabel = img_labels_row[c];
                if (iLabel > 0) {
                    iLabel = LabelsSolver::GetLabel(iLabel);
                    if (img_row[c] > 0)
                        img_labels_row[c] = iLabel;
                    else
                        img_labels_row[c] = 0;
                    if (img_row_fol[c] > 0)
                        img_labels_row_fol[c] = iLabel;
                    else
                        img_labels_row_fol[c] = 0;
                }
                else {
                    img_labels_row[c] = 0;
                    img_labels_row_fol[c] = 0;
                }
            }
        }
        // Last row if the number of rows is odd
        if (o_rows) {
            // Get rows pointer
            const unsigned char* const img_row = img_.ptr<unsigned char>(r);
            unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
            int c = 0;
            for (; c < e_cols; c += 2) {
                int iLabel = img_labels_row[c];
                if (iLabel > 0) {
                    iLabel = LabelsSolver::GetLabel(iLabel);
                    if (img_row[c] > 0)
                        img_labels_row[c] = iLabel;
                    else
                        img_labels_row[c] = 0;
                    if (img_row[c + 1] > 0)
                        img_labels_row[c + 1] = iLabel;
                    else
                        img_labels_row[c + 1] = 0;
                }
                else {
                    img_labels_row[c] = 0;
                    img_labels_row[c + 1] = 0;
                }
            }
            // Last column if the number of columns is odd
            if (o_cols) {
                int iLabel = img_labels_row[c];
                if (iLabel > 0) {
                    iLabel = LabelsSolver::GetLabel(iLabel);
                    if (img_row[c] > 0)
                        img_labels_row[c] = iLabel;
                    else
                        img_labels_row[c] = 0;
                }
                else {
                    img_labels_row[c] = 0;
                }
            }
        }

        LabelsSolver::Dealloc();

    }